

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [16];
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  uint uVar17;
  uint uVar18;
  undefined4 uVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [24];
  uint uVar125;
  uint uVar126;
  uint uVar127;
  ulong uVar128;
  long lVar129;
  ulong uVar130;
  ulong uVar131;
  long lVar132;
  Primitive *pPVar133;
  LinearSpace3fa *pLVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar153;
  float fVar155;
  float fVar159;
  float fVar161;
  float fVar163;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar157;
  float fVar164;
  float fVar166;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar154;
  float fVar156;
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar165;
  float fVar167;
  float fVar168;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar169;
  float fVar170;
  float fVar187;
  float fVar189;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar192;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar190;
  float fVar193;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar188;
  float fVar191;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  float fVar194;
  undefined1 auVar196 [16];
  float fVar195;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar208;
  float fVar210;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar204 [32];
  float fVar212;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar209;
  float fVar211;
  float fVar213;
  undefined1 auVar207 [32];
  float fVar217;
  float fVar234;
  float fVar235;
  float fVar237;
  float fVar238;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar226 [32];
  undefined1 auVar220 [16];
  undefined1 auVar227 [32];
  float fVar236;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar239;
  float fVar240;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar254;
  float fVar256;
  undefined1 auVar247 [32];
  float fVar258;
  undefined1 auVar248 [32];
  float fVar255;
  float fVar257;
  float fVar259;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  float fVar260;
  float fVar267;
  float fVar268;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar264 [32];
  float fVar269;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar273;
  float fVar274;
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar275 [32];
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar305;
  undefined1 auVar298 [32];
  undefined1 auVar299 [64];
  float fVar313;
  undefined1 auVar306 [16];
  float fVar310;
  float fVar312;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar318;
  float fVar325;
  float fVar326;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  float fVar327;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [64];
  float fVar334;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar343 [16];
  float in_register_0000151c;
  undefined1 auVar344 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [64];
  float fVar351;
  undefined1 auVar352 [16];
  float fVar356;
  float fVar357;
  undefined1 auVar353 [32];
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar361;
  float fVar364;
  float fVar365;
  float fVar366;
  float in_register_0000159c;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar367;
  float fVar370;
  float fVar371;
  float fVar372;
  float in_register_000015dc;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [8];
  float fStack_868;
  undefined1 local_830 [16];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  undefined1 local_7d0 [8];
  undefined8 uStack_7c8;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 (*local_6f8) [16];
  size_t local_6f0;
  RayHitK<4> *local_6e8;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 auStack_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [2] [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar309 [32];
  undefined1 auVar311 [12];
  undefined1 auVar345 [32];
  
  PVar16 = prim[1];
  uVar128 = (ulong)(byte)PVar16;
  fVar194 = *(float *)(prim + uVar128 * 0x19 + 0x12);
  auVar222 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar222 = vinsertps_avx(auVar222,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar200 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar200 = vinsertps_avx(auVar200,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar222 = vsubps_avx(auVar222,*(undefined1 (*) [16])(prim + uVar128 * 0x19 + 6));
  auVar171._0_4_ = fVar194 * auVar222._0_4_;
  auVar171._4_4_ = fVar194 * auVar222._4_4_;
  auVar171._8_4_ = fVar194 * auVar222._8_4_;
  auVar171._12_4_ = fVar194 * auVar222._12_4_;
  auVar261._0_4_ = fVar194 * auVar200._0_4_;
  auVar261._4_4_ = fVar194 * auVar200._4_4_;
  auVar261._8_4_ = fVar194 * auVar200._8_4_;
  auVar261._12_4_ = fVar194 * auVar200._12_4_;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 4 + 10)));
  auVar146._16_16_ = auVar200;
  auVar146._0_16_ = auVar222;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 5 + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 5 + 10)));
  auVar204._16_16_ = auVar200;
  auVar204._0_16_ = auVar222;
  auVar233 = vcvtdq2ps_avx(auVar204);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 6 + 10)));
  auVar223._16_16_ = auVar200;
  auVar223._0_16_ = auVar222;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xb + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xb + 10)));
  auVar23 = vcvtdq2ps_avx(auVar223);
  auVar224._16_16_ = auVar200;
  auVar224._0_16_ = auVar222;
  auVar24 = vcvtdq2ps_avx(auVar224);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xc + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xc + 10)));
  auVar275._16_16_ = auVar200;
  auVar275._0_16_ = auVar222;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xd + 6)));
  auVar25 = vcvtdq2ps_avx(auVar275);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0xd + 10)));
  auVar290._16_16_ = auVar200;
  auVar290._0_16_ = auVar222;
  auVar26 = vcvtdq2ps_avx(auVar290);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x12 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x12 + 10)));
  auVar291._16_16_ = auVar200;
  auVar291._0_16_ = auVar222;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x13 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x13 + 10)));
  auVar27 = vcvtdq2ps_avx(auVar291);
  auVar319._16_16_ = auVar200;
  auVar319._0_16_ = auVar222;
  auVar28 = vcvtdq2ps_avx(auVar319);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x14 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar128 * 0x14 + 10)));
  auVar328._16_16_ = auVar200;
  auVar328._0_16_ = auVar222;
  auVar29 = vcvtdq2ps_avx(auVar328);
  auVar222 = vshufps_avx(auVar261,auVar261,0);
  auVar200 = vshufps_avx(auVar261,auVar261,0x55);
  auVar221 = vshufps_avx(auVar261,auVar261,0xaa);
  fVar194 = auVar221._0_4_;
  fVar208 = auVar221._4_4_;
  fVar210 = auVar221._8_4_;
  fVar212 = auVar221._12_4_;
  fVar214 = auVar200._0_4_;
  fVar215 = auVar200._4_4_;
  fVar216 = auVar200._8_4_;
  fVar260 = auVar200._12_4_;
  fVar267 = auVar222._0_4_;
  fVar268 = auVar222._4_4_;
  fVar269 = auVar222._8_4_;
  fVar270 = auVar222._12_4_;
  auVar344._0_4_ = fVar267 * auVar146._0_4_ + fVar214 * auVar233._0_4_ + fVar194 * auVar23._0_4_;
  auVar344._4_4_ = fVar268 * auVar146._4_4_ + fVar215 * auVar233._4_4_ + fVar208 * auVar23._4_4_;
  auVar344._8_4_ = fVar269 * auVar146._8_4_ + fVar216 * auVar233._8_4_ + fVar210 * auVar23._8_4_;
  auVar344._12_4_ = fVar270 * auVar146._12_4_ + fVar260 * auVar233._12_4_ + fVar212 * auVar23._12_4_
  ;
  auVar344._16_4_ = fVar267 * auVar146._16_4_ + fVar214 * auVar233._16_4_ + fVar194 * auVar23._16_4_
  ;
  auVar344._20_4_ = fVar268 * auVar146._20_4_ + fVar215 * auVar233._20_4_ + fVar208 * auVar23._20_4_
  ;
  auVar344._24_4_ = fVar269 * auVar146._24_4_ + fVar216 * auVar233._24_4_ + fVar210 * auVar23._24_4_
  ;
  auVar344._28_4_ = fVar260 + in_register_000015dc + in_register_0000151c;
  auVar335._0_4_ = fVar267 * auVar24._0_4_ + fVar214 * auVar25._0_4_ + auVar26._0_4_ * fVar194;
  auVar335._4_4_ = fVar268 * auVar24._4_4_ + fVar215 * auVar25._4_4_ + auVar26._4_4_ * fVar208;
  auVar335._8_4_ = fVar269 * auVar24._8_4_ + fVar216 * auVar25._8_4_ + auVar26._8_4_ * fVar210;
  auVar335._12_4_ = fVar270 * auVar24._12_4_ + fVar260 * auVar25._12_4_ + auVar26._12_4_ * fVar212;
  auVar335._16_4_ = fVar267 * auVar24._16_4_ + fVar214 * auVar25._16_4_ + auVar26._16_4_ * fVar194;
  auVar335._20_4_ = fVar268 * auVar24._20_4_ + fVar215 * auVar25._20_4_ + auVar26._20_4_ * fVar208;
  auVar335._24_4_ = fVar269 * auVar24._24_4_ + fVar216 * auVar25._24_4_ + auVar26._24_4_ * fVar210;
  auVar335._28_4_ = fVar260 + in_register_000015dc + in_register_0000159c;
  auVar264._0_4_ = fVar267 * auVar27._0_4_ + fVar214 * auVar28._0_4_ + auVar29._0_4_ * fVar194;
  auVar264._4_4_ = fVar268 * auVar27._4_4_ + fVar215 * auVar28._4_4_ + auVar29._4_4_ * fVar208;
  auVar264._8_4_ = fVar269 * auVar27._8_4_ + fVar216 * auVar28._8_4_ + auVar29._8_4_ * fVar210;
  auVar264._12_4_ = fVar270 * auVar27._12_4_ + fVar260 * auVar28._12_4_ + auVar29._12_4_ * fVar212;
  auVar264._16_4_ = fVar267 * auVar27._16_4_ + fVar214 * auVar28._16_4_ + auVar29._16_4_ * fVar194;
  auVar264._20_4_ = fVar268 * auVar27._20_4_ + fVar215 * auVar28._20_4_ + auVar29._20_4_ * fVar208;
  auVar264._24_4_ = fVar269 * auVar27._24_4_ + fVar216 * auVar28._24_4_ + auVar29._24_4_ * fVar210;
  auVar264._28_4_ = fVar270 + fVar260 + fVar212;
  auVar222 = vshufps_avx(auVar171,auVar171,0);
  auVar200 = vshufps_avx(auVar171,auVar171,0x55);
  auVar221 = vshufps_avx(auVar171,auVar171,0xaa);
  fVar208 = auVar221._0_4_;
  fVar210 = auVar221._4_4_;
  fVar212 = auVar221._8_4_;
  fVar214 = auVar221._12_4_;
  fVar268 = auVar200._0_4_;
  fVar269 = auVar200._4_4_;
  fVar270 = auVar200._8_4_;
  fVar271 = auVar200._12_4_;
  fVar215 = auVar222._0_4_;
  fVar216 = auVar222._4_4_;
  fVar260 = auVar222._8_4_;
  fVar267 = auVar222._12_4_;
  fVar194 = auVar146._28_4_;
  auVar175._0_4_ = fVar215 * auVar146._0_4_ + fVar268 * auVar233._0_4_ + fVar208 * auVar23._0_4_;
  auVar175._4_4_ = fVar216 * auVar146._4_4_ + fVar269 * auVar233._4_4_ + fVar210 * auVar23._4_4_;
  auVar175._8_4_ = fVar260 * auVar146._8_4_ + fVar270 * auVar233._8_4_ + fVar212 * auVar23._8_4_;
  auVar175._12_4_ = fVar267 * auVar146._12_4_ + fVar271 * auVar233._12_4_ + fVar214 * auVar23._12_4_
  ;
  auVar175._16_4_ = fVar215 * auVar146._16_4_ + fVar268 * auVar233._16_4_ + fVar208 * auVar23._16_4_
  ;
  auVar175._20_4_ = fVar216 * auVar146._20_4_ + fVar269 * auVar233._20_4_ + fVar210 * auVar23._20_4_
  ;
  auVar175._24_4_ = fVar260 * auVar146._24_4_ + fVar270 * auVar233._24_4_ + fVar212 * auVar23._24_4_
  ;
  auVar175._28_4_ = fVar194 + auVar233._28_4_ + auVar23._28_4_;
  auVar247._0_4_ = fVar215 * auVar24._0_4_ + auVar26._0_4_ * fVar208 + fVar268 * auVar25._0_4_;
  auVar247._4_4_ = fVar216 * auVar24._4_4_ + auVar26._4_4_ * fVar210 + fVar269 * auVar25._4_4_;
  auVar247._8_4_ = fVar260 * auVar24._8_4_ + auVar26._8_4_ * fVar212 + fVar270 * auVar25._8_4_;
  auVar247._12_4_ = fVar267 * auVar24._12_4_ + auVar26._12_4_ * fVar214 + fVar271 * auVar25._12_4_;
  auVar247._16_4_ = fVar215 * auVar24._16_4_ + auVar26._16_4_ * fVar208 + fVar268 * auVar25._16_4_;
  auVar247._20_4_ = fVar216 * auVar24._20_4_ + auVar26._20_4_ * fVar210 + fVar269 * auVar25._20_4_;
  auVar247._24_4_ = fVar260 * auVar24._24_4_ + auVar26._24_4_ * fVar212 + fVar270 * auVar25._24_4_;
  auVar247._28_4_ = fVar194 + auVar26._28_4_ + auVar23._28_4_;
  auVar225._0_4_ = fVar215 * auVar27._0_4_ + fVar268 * auVar28._0_4_ + auVar29._0_4_ * fVar208;
  auVar225._4_4_ = fVar216 * auVar27._4_4_ + fVar269 * auVar28._4_4_ + auVar29._4_4_ * fVar210;
  auVar225._8_4_ = fVar260 * auVar27._8_4_ + fVar270 * auVar28._8_4_ + auVar29._8_4_ * fVar212;
  auVar225._12_4_ = fVar267 * auVar27._12_4_ + fVar271 * auVar28._12_4_ + auVar29._12_4_ * fVar214;
  auVar225._16_4_ = fVar215 * auVar27._16_4_ + fVar268 * auVar28._16_4_ + auVar29._16_4_ * fVar208;
  auVar225._20_4_ = fVar216 * auVar27._20_4_ + fVar269 * auVar28._20_4_ + auVar29._20_4_ * fVar210;
  auVar225._24_4_ = fVar260 * auVar27._24_4_ + fVar270 * auVar28._24_4_ + auVar29._24_4_ * fVar212;
  auVar225._28_4_ = fVar194 + auVar25._28_4_ + fVar214;
  auVar292._8_4_ = 0x7fffffff;
  auVar292._0_8_ = 0x7fffffff7fffffff;
  auVar292._12_4_ = 0x7fffffff;
  auVar292._16_4_ = 0x7fffffff;
  auVar292._20_4_ = 0x7fffffff;
  auVar292._24_4_ = 0x7fffffff;
  auVar292._28_4_ = 0x7fffffff;
  auVar139._8_4_ = 0x219392ef;
  auVar139._0_8_ = 0x219392ef219392ef;
  auVar139._12_4_ = 0x219392ef;
  auVar139._16_4_ = 0x219392ef;
  auVar139._20_4_ = 0x219392ef;
  auVar139._24_4_ = 0x219392ef;
  auVar139._28_4_ = 0x219392ef;
  auVar146 = vandps_avx(auVar344,auVar292);
  auVar146 = vcmpps_avx(auVar146,auVar139,1);
  auVar233 = vblendvps_avx(auVar344,auVar139,auVar146);
  auVar146 = vandps_avx(auVar335,auVar292);
  auVar146 = vcmpps_avx(auVar146,auVar139,1);
  auVar23 = vblendvps_avx(auVar335,auVar139,auVar146);
  auVar146 = vandps_avx(auVar264,auVar292);
  auVar146 = vcmpps_avx(auVar146,auVar139,1);
  auVar146 = vblendvps_avx(auVar264,auVar139,auVar146);
  auVar24 = vrcpps_avx(auVar233);
  fVar194 = auVar24._0_4_;
  fVar208 = auVar24._4_4_;
  auVar25._4_4_ = auVar233._4_4_ * fVar208;
  auVar25._0_4_ = auVar233._0_4_ * fVar194;
  fVar210 = auVar24._8_4_;
  auVar25._8_4_ = auVar233._8_4_ * fVar210;
  fVar212 = auVar24._12_4_;
  auVar25._12_4_ = auVar233._12_4_ * fVar212;
  fVar214 = auVar24._16_4_;
  auVar25._16_4_ = auVar233._16_4_ * fVar214;
  fVar215 = auVar24._20_4_;
  auVar25._20_4_ = auVar233._20_4_ * fVar215;
  fVar216 = auVar24._24_4_;
  auVar25._24_4_ = auVar233._24_4_ * fVar216;
  auVar25._28_4_ = auVar233._28_4_;
  auVar293._8_4_ = 0x3f800000;
  auVar293._0_8_ = 0x3f8000003f800000;
  auVar293._12_4_ = 0x3f800000;
  auVar293._16_4_ = 0x3f800000;
  auVar293._20_4_ = 0x3f800000;
  auVar293._24_4_ = 0x3f800000;
  auVar293._28_4_ = 0x3f800000;
  auVar233 = vsubps_avx(auVar293,auVar25);
  fVar194 = fVar194 + fVar194 * auVar233._0_4_;
  fVar208 = fVar208 + fVar208 * auVar233._4_4_;
  fVar210 = fVar210 + fVar210 * auVar233._8_4_;
  fVar212 = fVar212 + fVar212 * auVar233._12_4_;
  fVar214 = fVar214 + fVar214 * auVar233._16_4_;
  fVar215 = fVar215 + fVar215 * auVar233._20_4_;
  fVar216 = fVar216 + fVar216 * auVar233._24_4_;
  auVar233 = vrcpps_avx(auVar23);
  fVar260 = auVar233._0_4_;
  fVar267 = auVar233._4_4_;
  auVar24._4_4_ = fVar267 * auVar23._4_4_;
  auVar24._0_4_ = fVar260 * auVar23._0_4_;
  fVar268 = auVar233._8_4_;
  auVar24._8_4_ = fVar268 * auVar23._8_4_;
  fVar269 = auVar233._12_4_;
  auVar24._12_4_ = fVar269 * auVar23._12_4_;
  fVar270 = auVar233._16_4_;
  auVar24._16_4_ = fVar270 * auVar23._16_4_;
  fVar271 = auVar233._20_4_;
  auVar24._20_4_ = fVar271 * auVar23._20_4_;
  fVar272 = auVar233._24_4_;
  auVar24._24_4_ = fVar272 * auVar23._24_4_;
  auVar24._28_4_ = auVar23._28_4_;
  auVar233 = vsubps_avx(auVar293,auVar24);
  fVar260 = fVar260 + fVar260 * auVar233._0_4_;
  fVar267 = fVar267 + fVar267 * auVar233._4_4_;
  fVar268 = fVar268 + fVar268 * auVar233._8_4_;
  fVar269 = fVar269 + fVar269 * auVar233._12_4_;
  fVar270 = fVar270 + fVar270 * auVar233._16_4_;
  fVar271 = fVar271 + fVar271 * auVar233._20_4_;
  fVar272 = fVar272 + fVar272 * auVar233._24_4_;
  auVar233 = vrcpps_avx(auVar146);
  fVar273 = auVar233._0_4_;
  fVar281 = auVar233._4_4_;
  auVar23._4_4_ = fVar281 * auVar146._4_4_;
  auVar23._0_4_ = fVar273 * auVar146._0_4_;
  fVar283 = auVar233._8_4_;
  auVar23._8_4_ = fVar283 * auVar146._8_4_;
  fVar285 = auVar233._12_4_;
  auVar23._12_4_ = fVar285 * auVar146._12_4_;
  fVar287 = auVar233._16_4_;
  auVar23._16_4_ = fVar287 * auVar146._16_4_;
  fVar288 = auVar233._20_4_;
  auVar23._20_4_ = fVar288 * auVar146._20_4_;
  fVar289 = auVar233._24_4_;
  auVar23._24_4_ = fVar289 * auVar146._24_4_;
  auVar23._28_4_ = auVar146._28_4_;
  auVar146 = vsubps_avx(auVar293,auVar23);
  fVar273 = fVar273 + fVar273 * auVar146._0_4_;
  fVar281 = fVar281 + fVar281 * auVar146._4_4_;
  fVar283 = fVar283 + fVar283 * auVar146._8_4_;
  fVar285 = fVar285 + fVar285 * auVar146._12_4_;
  fVar287 = fVar287 + fVar287 * auVar146._16_4_;
  fVar288 = fVar288 + fVar288 * auVar146._20_4_;
  fVar289 = fVar289 + fVar289 * auVar146._24_4_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar128 * 7 + 6);
  auVar222 = vpmovsxwd_avx(auVar222);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar128 * 7 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar200);
  auVar140._16_16_ = auVar200;
  auVar140._0_16_ = auVar222;
  auVar146 = vcvtdq2ps_avx(auVar140);
  auVar146 = vsubps_avx(auVar146,auVar175);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar128 * 9 + 6);
  auVar222 = vpmovsxwd_avx(auVar221);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar128 * 9 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar8);
  auVar137._0_4_ = fVar194 * auVar146._0_4_;
  auVar137._4_4_ = fVar208 * auVar146._4_4_;
  auVar137._8_4_ = fVar210 * auVar146._8_4_;
  auVar137._12_4_ = fVar212 * auVar146._12_4_;
  auVar26._16_4_ = fVar214 * auVar146._16_4_;
  auVar26._0_16_ = auVar137;
  auVar26._20_4_ = fVar215 * auVar146._20_4_;
  auVar26._24_4_ = fVar216 * auVar146._24_4_;
  auVar26._28_4_ = auVar146._28_4_;
  auVar294._16_16_ = auVar200;
  auVar294._0_16_ = auVar222;
  auVar146 = vcvtdq2ps_avx(auVar294);
  auVar146 = vsubps_avx(auVar146,auVar175);
  auVar172._0_4_ = fVar194 * auVar146._0_4_;
  auVar172._4_4_ = fVar208 * auVar146._4_4_;
  auVar172._8_4_ = fVar210 * auVar146._8_4_;
  auVar172._12_4_ = fVar212 * auVar146._12_4_;
  auVar27._16_4_ = fVar214 * auVar146._16_4_;
  auVar27._0_16_ = auVar172;
  auVar27._20_4_ = fVar215 * auVar146._20_4_;
  auVar27._24_4_ = fVar216 * auVar146._24_4_;
  auVar27._28_4_ = auVar146._28_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar128 * 0xe + 6);
  auVar222 = vpmovsxwd_avx(auVar9);
  auVar244._8_8_ = 0;
  auVar244._0_8_ = *(ulong *)(prim + uVar128 * 0xe + 0xe);
  auVar200 = vpmovsxwd_avx(auVar244);
  auVar205._16_16_ = auVar200;
  auVar205._0_16_ = auVar222;
  auVar146 = vcvtdq2ps_avx(auVar205);
  auVar146 = vsubps_avx(auVar146,auVar247);
  auVar196._0_4_ = fVar260 * auVar146._0_4_;
  auVar196._4_4_ = fVar267 * auVar146._4_4_;
  auVar196._8_4_ = fVar268 * auVar146._8_4_;
  auVar196._12_4_ = fVar269 * auVar146._12_4_;
  auVar28._16_4_ = fVar270 * auVar146._16_4_;
  auVar28._0_16_ = auVar196;
  auVar28._20_4_ = fVar271 * auVar146._20_4_;
  auVar28._24_4_ = fVar272 * auVar146._24_4_;
  auVar28._28_4_ = auVar146._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  auVar222 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar16 * 0x10 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar11);
  auVar295._16_16_ = auVar200;
  auVar295._0_16_ = auVar222;
  auVar146 = vcvtdq2ps_avx(auVar295);
  auVar146 = vsubps_avx(auVar146,auVar247);
  auVar241._0_4_ = fVar260 * auVar146._0_4_;
  auVar241._4_4_ = fVar267 * auVar146._4_4_;
  auVar241._8_4_ = fVar268 * auVar146._8_4_;
  auVar241._12_4_ = fVar269 * auVar146._12_4_;
  auVar29._16_4_ = fVar270 * auVar146._16_4_;
  auVar29._0_16_ = auVar241;
  auVar29._20_4_ = fVar271 * auVar146._20_4_;
  auVar29._24_4_ = fVar272 * auVar146._24_4_;
  auVar29._28_4_ = auVar146._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar128 * 0x15 + 6);
  auVar222 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar128 * 0x15 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar13);
  auVar265._16_16_ = auVar200;
  auVar265._0_16_ = auVar222;
  auVar146 = vcvtdq2ps_avx(auVar265);
  auVar146 = vsubps_avx(auVar146,auVar225);
  auVar262._0_4_ = fVar273 * auVar146._0_4_;
  auVar262._4_4_ = fVar281 * auVar146._4_4_;
  auVar262._8_4_ = fVar283 * auVar146._8_4_;
  auVar262._12_4_ = fVar285 * auVar146._12_4_;
  auVar30._16_4_ = fVar287 * auVar146._16_4_;
  auVar30._0_16_ = auVar262;
  auVar30._20_4_ = fVar288 * auVar146._20_4_;
  auVar30._24_4_ = fVar289 * auVar146._24_4_;
  auVar30._28_4_ = auVar146._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar128 * 0x17 + 6);
  auVar222 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar128 * 0x17 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar15);
  auVar296._16_16_ = auVar200;
  auVar296._0_16_ = auVar222;
  auVar146 = vcvtdq2ps_avx(auVar296);
  auVar146 = vsubps_avx(auVar146,auVar225);
  auVar218._0_4_ = fVar273 * auVar146._0_4_;
  auVar218._4_4_ = fVar281 * auVar146._4_4_;
  auVar218._8_4_ = fVar283 * auVar146._8_4_;
  auVar218._12_4_ = fVar285 * auVar146._12_4_;
  auVar233._16_4_ = fVar287 * auVar146._16_4_;
  auVar233._0_16_ = auVar218;
  auVar233._20_4_ = fVar288 * auVar146._20_4_;
  auVar233._24_4_ = fVar289 * auVar146._24_4_;
  auVar233._28_4_ = auVar146._28_4_;
  auVar222 = vpminsd_avx(auVar26._16_16_,auVar27._16_16_);
  auVar200 = vpminsd_avx(auVar137,auVar172);
  auVar329._16_16_ = auVar222;
  auVar329._0_16_ = auVar200;
  auVar222 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar200 = vpminsd_avx(auVar196,auVar241);
  auVar336._16_16_ = auVar222;
  auVar336._0_16_ = auVar200;
  auVar146 = vmaxps_avx(auVar329,auVar336);
  auVar221 = auVar233._16_16_;
  auVar333 = ZEXT1664(auVar221);
  auVar222 = vpminsd_avx(auVar30._16_16_,auVar221);
  auVar200 = vpminsd_avx(auVar262,auVar218);
  auVar353._16_16_ = auVar222;
  auVar353._0_16_ = auVar200;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar362._4_4_ = uVar7;
  auVar362._0_4_ = uVar7;
  auVar362._8_4_ = uVar7;
  auVar362._12_4_ = uVar7;
  auVar362._16_4_ = uVar7;
  auVar362._20_4_ = uVar7;
  auVar362._24_4_ = uVar7;
  auVar362._28_4_ = uVar7;
  auVar233 = vmaxps_avx(auVar353,auVar362);
  auVar146 = vmaxps_avx(auVar146,auVar233);
  local_80._4_4_ = auVar146._4_4_ * 0.99999964;
  local_80._0_4_ = auVar146._0_4_ * 0.99999964;
  local_80._8_4_ = auVar146._8_4_ * 0.99999964;
  local_80._12_4_ = auVar146._12_4_ * 0.99999964;
  local_80._16_4_ = auVar146._16_4_ * 0.99999964;
  local_80._20_4_ = auVar146._20_4_ * 0.99999964;
  local_80._24_4_ = auVar146._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar222 = vpmaxsd_avx(auVar26._16_16_,auVar27._16_16_);
  auVar200 = vpmaxsd_avx(auVar137,auVar172);
  auVar141._16_16_ = auVar222;
  auVar141._0_16_ = auVar200;
  auVar222 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar200 = vpmaxsd_avx(auVar196,auVar241);
  auVar176._16_16_ = auVar222;
  auVar176._0_16_ = auVar200;
  auVar146 = vminps_avx(auVar141,auVar176);
  auVar222 = vpmaxsd_avx(auVar30._16_16_,auVar221);
  auVar200 = vpmaxsd_avx(auVar262,auVar218);
  auVar177._16_16_ = auVar222;
  auVar177._0_16_ = auVar200;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar206._4_4_ = uVar7;
  auVar206._0_4_ = uVar7;
  auVar206._8_4_ = uVar7;
  auVar206._12_4_ = uVar7;
  auVar206._16_4_ = uVar7;
  auVar206._20_4_ = uVar7;
  auVar206._24_4_ = uVar7;
  auVar206._28_4_ = uVar7;
  auVar233 = vminps_avx(auVar177,auVar206);
  auVar146 = vminps_avx(auVar146,auVar233);
  auVar22._4_4_ = auVar146._4_4_ * 1.0000004;
  auVar22._0_4_ = auVar146._0_4_ * 1.0000004;
  auVar22._8_4_ = auVar146._8_4_ * 1.0000004;
  auVar22._12_4_ = auVar146._12_4_ * 1.0000004;
  auVar22._16_4_ = auVar146._16_4_ * 1.0000004;
  auVar22._20_4_ = auVar146._20_4_ * 1.0000004;
  auVar22._24_4_ = auVar146._24_4_ * 1.0000004;
  auVar22._28_4_ = auVar146._28_4_;
  auVar146 = vcmpps_avx(local_80,auVar22,2);
  auVar222 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar178._16_16_ = auVar222;
  auVar178._0_16_ = auVar222;
  auVar233 = vcvtdq2ps_avx(auVar178);
  auVar233 = vcmpps_avx(_DAT_01f7b060,auVar233,1);
  auVar146 = vandps_avx(auVar146,auVar233);
  uVar125 = vmovmskps_avx(auVar146);
  local_5a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_5a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_5a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_5a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_6f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pPVar133 = prim;
  pLVar134 = pre->ray_space + k;
  do {
    uVar131 = (ulong)uVar125;
    if (uVar131 == 0) {
      return;
    }
    auVar146 = auVar333._0_32_;
    lVar129 = 0;
    if (uVar131 != 0) {
      for (; (uVar125 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
      }
    }
    uVar131 = uVar131 - 1 & uVar131;
    uVar125 = *(uint *)(pPVar133 + lVar129 * 4 + 6);
    lVar129 = lVar129 * 0x40;
    lVar132 = 0;
    if (uVar131 != 0) {
      for (; (uVar131 >> lVar132 & 1) == 0; lVar132 = lVar132 + 1) {
      }
    }
    uVar17 = *(uint *)(pPVar133 + 2);
    pGVar20 = (context->scene->geometries).items[uVar17].ptr;
    local_780._0_8_ = pGVar20;
    auVar222 = *(undefined1 (*) [16])(prim + lVar129 + uVar128 * 0x19 + 0x16);
    if (((uVar131 != 0) && (uVar130 = uVar131 - 1 & uVar131, uVar130 != 0)) &&
       (lVar132 = 0, uVar130 != 0)) {
      for (; (uVar130 >> lVar132 & 1) == 0; lVar132 = lVar132 + 1) {
      }
    }
    _local_7c0 = *(undefined1 (*) [16])(prim + lVar129 + uVar128 * 0x19 + 0x26);
    _local_7d0 = *(undefined1 (*) [16])(prim + lVar129 + uVar128 * 0x19 + 0x36);
    _local_7e0 = *(undefined1 (*) [16])(prim + lVar129 + uVar128 * 0x19 + 0x46);
    uVar18 = (uint)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar200 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar9 = vinsertps_avx(auVar200,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar8 = vsubps_avx(auVar222,auVar9);
    auVar200 = vshufps_avx(auVar8,auVar8,0);
    auVar221 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    fVar194 = (pLVar134->vx).field_0.m128[0];
    fVar208 = (pLVar134->vx).field_0.m128[1];
    fVar210 = (pLVar134->vx).field_0.m128[2];
    fVar212 = (pLVar134->vx).field_0.m128[3];
    fVar214 = (pLVar134->vy).field_0.m128[0];
    fVar215 = (pLVar134->vy).field_0.m128[1];
    fVar216 = (pLVar134->vy).field_0.m128[2];
    fVar260 = (pLVar134->vy).field_0.m128[3];
    fVar267 = (pLVar134->vz).field_0.m128[0];
    fVar268 = (pLVar134->vz).field_0.m128[1];
    fVar269 = (pLVar134->vz).field_0.m128[2];
    fVar270 = (pLVar134->vz).field_0.m128[3];
    auVar242._0_4_ = auVar200._0_4_ * fVar194 + auVar221._0_4_ * fVar214 + fVar267 * auVar8._0_4_;
    auVar242._4_4_ = auVar200._4_4_ * fVar208 + auVar221._4_4_ * fVar215 + fVar268 * auVar8._4_4_;
    auVar242._8_4_ = auVar200._8_4_ * fVar210 + auVar221._8_4_ * fVar216 + fVar269 * auVar8._8_4_;
    auVar242._12_4_ =
         auVar200._12_4_ * fVar212 + auVar221._12_4_ * fVar260 + fVar270 * auVar8._12_4_;
    auVar200 = vblendps_avx(auVar242,auVar222,8);
    auVar244 = vsubps_avx(_local_7c0,auVar9);
    auVar221 = vshufps_avx(auVar244,auVar244,0);
    auVar8 = vshufps_avx(auVar244,auVar244,0x55);
    auVar244 = vshufps_avx(auVar244,auVar244,0xaa);
    auVar352._0_4_ = auVar221._0_4_ * fVar194 + auVar8._0_4_ * fVar214 + fVar267 * auVar244._0_4_;
    auVar352._4_4_ = auVar221._4_4_ * fVar208 + auVar8._4_4_ * fVar215 + fVar268 * auVar244._4_4_;
    auVar352._8_4_ = auVar221._8_4_ * fVar210 + auVar8._8_4_ * fVar216 + fVar269 * auVar244._8_4_;
    auVar352._12_4_ =
         auVar221._12_4_ * fVar212 + auVar8._12_4_ * fVar260 + fVar270 * auVar244._12_4_;
    auVar221 = vblendps_avx(auVar352,_local_7c0,8);
    auVar10 = vsubps_avx(_local_7d0,auVar9);
    auVar8 = vshufps_avx(auVar10,auVar10,0);
    auVar244 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar243._0_4_ = auVar8._0_4_ * fVar194 + auVar244._0_4_ * fVar214 + auVar10._0_4_ * fVar267;
    auVar243._4_4_ = auVar8._4_4_ * fVar208 + auVar244._4_4_ * fVar215 + auVar10._4_4_ * fVar268;
    auVar243._8_4_ = auVar8._8_4_ * fVar210 + auVar244._8_4_ * fVar216 + auVar10._8_4_ * fVar269;
    auVar243._12_4_ = auVar8._12_4_ * fVar212 + auVar244._12_4_ * fVar260 + auVar10._12_4_ * fVar270
    ;
    auVar8 = vblendps_avx(auVar243,_local_7d0,8);
    auVar10 = vsubps_avx(_local_7e0,auVar9);
    auVar9 = vshufps_avx(auVar10,auVar10,0);
    auVar244 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar263._0_4_ = auVar9._0_4_ * fVar194 + auVar244._0_4_ * fVar214 + fVar267 * auVar10._0_4_;
    auVar263._4_4_ = auVar9._4_4_ * fVar208 + auVar244._4_4_ * fVar215 + fVar268 * auVar10._4_4_;
    auVar263._8_4_ = auVar9._8_4_ * fVar210 + auVar244._8_4_ * fVar216 + fVar269 * auVar10._8_4_;
    auVar263._12_4_ = auVar9._12_4_ * fVar212 + auVar244._12_4_ * fVar260 + fVar270 * auVar10._12_4_
    ;
    auVar9 = vblendps_avx(auVar263,_local_7e0,8);
    auVar219._8_4_ = 0x7fffffff;
    auVar219._0_8_ = 0x7fffffff7fffffff;
    auVar219._12_4_ = 0x7fffffff;
    auVar200 = vandps_avx(auVar200,auVar219);
    auVar221 = vandps_avx(auVar221,auVar219);
    auVar244 = vmaxps_avx(auVar200,auVar221);
    auVar200 = vandps_avx(auVar8,auVar219);
    auVar221 = vandps_avx(auVar9,auVar219);
    auVar200 = vmaxps_avx(auVar200,auVar221);
    auVar200 = vmaxps_avx(auVar244,auVar200);
    auVar221 = vmovshdup_avx(auVar200);
    auVar221 = vmaxss_avx(auVar221,auVar200);
    auVar200 = vshufpd_avx(auVar200,auVar200,1);
    auVar200 = vmaxss_avx(auVar200,auVar221);
    lVar129 = (long)(int)uVar18 * 0x44;
    fVar194 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar129 + 0x908);
    fVar208 = *(float *)(bezier_basis0 + lVar129 + 0x90c);
    fVar210 = *(float *)(bezier_basis0 + lVar129 + 0x910);
    fVar212 = *(float *)(bezier_basis0 + lVar129 + 0x914);
    fVar214 = *(float *)(bezier_basis0 + lVar129 + 0x918);
    fVar215 = *(float *)(bezier_basis0 + lVar129 + 0x91c);
    fVar216 = *(float *)(bezier_basis0 + lVar129 + 0x920);
    auVar121 = *(undefined1 (*) [28])(bezier_basis0 + lVar129 + 0x908);
    auVar221 = vshufps_avx(auVar243,auVar243,0);
    register0x00001250 = auVar221;
    _local_620 = auVar221;
    auVar8 = vshufps_avx(auVar243,auVar243,0x55);
    register0x00001390 = auVar8;
    _local_820 = auVar8;
    fVar260 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar129 + 0xd8c);
    fVar267 = *(float *)(bezier_basis0 + lVar129 + 0xd90);
    fVar268 = *(float *)(bezier_basis0 + lVar129 + 0xd94);
    fVar269 = *(float *)(bezier_basis0 + lVar129 + 0xd98);
    fVar270 = *(float *)(bezier_basis0 + lVar129 + 0xd9c);
    fVar271 = *(float *)(bezier_basis0 + lVar129 + 0xda0);
    fVar272 = *(float *)(bezier_basis0 + lVar129 + 0xda4);
    auVar120 = *(undefined1 (*) [28])(bezier_basis0 + lVar129 + 0xd8c);
    auVar9 = vshufps_avx(auVar263,auVar263,0);
    register0x000014d0 = auVar9;
    _local_460 = auVar9;
    auVar244 = vshufps_avx(auVar263,auVar263,0x55);
    register0x00001350 = auVar244;
    _local_720 = auVar244;
    fVar334 = auVar9._0_4_;
    fVar340 = auVar9._4_4_;
    fVar341 = auVar9._8_4_;
    fVar342 = auVar9._12_4_;
    fVar169 = auVar221._0_4_;
    fVar187 = auVar221._4_4_;
    fVar305 = auVar221._8_4_;
    fVar190 = auVar221._12_4_;
    fVar188 = auVar244._0_4_;
    fVar189 = auVar244._4_4_;
    fVar191 = auVar244._8_4_;
    fVar192 = auVar244._12_4_;
    fVar274 = auVar8._0_4_;
    fVar282 = auVar8._4_4_;
    fVar284 = auVar8._8_4_;
    fVar286 = auVar8._12_4_;
    auVar221 = vshufps_avx(_local_7d0,_local_7d0,0xff);
    register0x00001350 = auVar221;
    _local_120 = auVar221;
    auVar8 = vshufps_avx(_local_7e0,_local_7e0,0xff);
    register0x000013d0 = auVar8;
    _local_140 = auVar8;
    fVar259 = auVar8._0_4_;
    fVar300 = auVar8._4_4_;
    fVar301 = auVar8._8_4_;
    fVar302 = auVar8._12_4_;
    fVar240 = auVar221._0_4_;
    fVar255 = auVar221._4_4_;
    fVar257 = auVar221._8_4_;
    auVar8 = vshufps_avx(auVar352,auVar352,0);
    register0x00001550 = auVar8;
    _local_660 = auVar8;
    fVar273 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar129 + 0x484);
    fVar281 = *(float *)(bezier_basis0 + lVar129 + 0x488);
    fVar283 = *(float *)(bezier_basis0 + lVar129 + 0x48c);
    fVar285 = *(float *)(bezier_basis0 + lVar129 + 0x490);
    fVar287 = *(float *)(bezier_basis0 + lVar129 + 0x494);
    fVar288 = *(float *)(bezier_basis0 + lVar129 + 0x498);
    fVar289 = *(float *)(bezier_basis0 + lVar129 + 0x49c);
    auVar122 = *(undefined1 (*) [28])(bezier_basis0 + lVar129 + 0x484);
    fVar351 = auVar8._0_4_;
    fVar356 = auVar8._4_4_;
    fVar357 = auVar8._8_4_;
    fVar359 = auVar8._12_4_;
    auVar8 = vshufps_avx(auVar352,auVar352,0x55);
    register0x000015d0 = auVar8;
    _local_740 = auVar8;
    fVar367 = auVar8._0_4_;
    fVar370 = auVar8._4_4_;
    fVar371 = auVar8._8_4_;
    fVar372 = auVar8._12_4_;
    auVar8 = vshufps_avx(_local_7c0,_local_7c0,0xff);
    register0x00001590 = auVar8;
    _local_a0 = auVar8;
    fVar358 = auVar8._0_4_;
    fVar360 = auVar8._4_4_;
    fVar361 = auVar8._8_4_;
    fVar364 = auVar8._12_4_;
    auVar8 = vshufps_avx(auVar242,auVar242,0);
    register0x00001310 = auVar8;
    _local_300 = auVar8;
    fVar310 = *(float *)(bezier_basis0 + lVar129);
    fVar312 = *(float *)(bezier_basis0 + lVar129 + 4);
    fVar236 = *(float *)(bezier_basis0 + lVar129 + 8);
    fVar303 = *(float *)(bezier_basis0 + lVar129 + 0xc);
    fVar313 = *(float *)(bezier_basis0 + lVar129 + 0x10);
    fVar314 = *(float *)(bezier_basis0 + lVar129 + 0x14);
    fVar162 = *(float *)(bezier_basis0 + lVar129 + 0x18);
    fVar239 = auVar8._0_4_;
    fVar254 = auVar8._4_4_;
    fVar256 = auVar8._8_4_;
    fVar258 = auVar8._12_4_;
    auVar343._0_4_ = fVar239 * fVar310 + fVar351 * fVar273 + fVar169 * fVar194 + fVar334 * fVar260;
    auVar343._4_4_ = fVar254 * fVar312 + fVar356 * fVar281 + fVar187 * fVar208 + fVar340 * fVar267;
    auVar343._8_4_ = fVar256 * fVar236 + fVar357 * fVar283 + fVar305 * fVar210 + fVar341 * fVar268;
    auVar343._12_4_ = fVar258 * fVar303 + fVar359 * fVar285 + fVar190 * fVar212 + fVar342 * fVar269;
    auVar345._16_4_ = fVar239 * fVar313 + fVar351 * fVar287 + fVar169 * fVar214 + fVar334 * fVar270;
    auVar345._0_16_ = auVar343;
    auVar345._20_4_ = fVar254 * fVar314 + fVar356 * fVar288 + fVar187 * fVar215 + fVar340 * fVar271;
    auVar345._24_4_ = fVar256 * fVar162 + fVar357 * fVar289 + fVar305 * fVar216 + fVar341 * fVar272;
    auVar345._28_4_ = fVar190 + 0.0 + 0.0 + 0.0;
    auVar8 = vshufps_avx(auVar242,auVar242,0x55);
    fVar195 = auVar8._0_4_;
    fVar209 = auVar8._4_4_;
    fVar211 = auVar8._8_4_;
    fVar213 = auVar8._12_4_;
    auVar307._0_4_ = fVar195 * fVar310 + fVar367 * fVar273 + fVar274 * fVar194 + fVar188 * fVar260;
    auVar307._4_4_ = fVar209 * fVar312 + fVar370 * fVar281 + fVar282 * fVar208 + fVar189 * fVar267;
    auVar307._8_4_ = fVar211 * fVar236 + fVar371 * fVar283 + fVar284 * fVar210 + fVar191 * fVar268;
    auVar307._12_4_ = fVar213 * fVar303 + fVar372 * fVar285 + fVar286 * fVar212 + fVar192 * fVar269;
    auVar307._16_4_ = fVar195 * fVar313 + fVar367 * fVar287 + fVar274 * fVar214 + fVar188 * fVar270;
    auVar307._20_4_ = fVar209 * fVar314 + fVar370 * fVar288 + fVar282 * fVar215 + fVar189 * fVar271;
    auVar307._24_4_ = fVar211 * fVar162 + fVar371 * fVar289 + fVar284 * fVar216 + fVar191 * fVar272;
    auVar307._28_4_ = fVar190 + 0.0 + 0.0 + 0.0;
    auVar8 = vpermilps_avx(auVar222,0xff);
    register0x00001450 = auVar8;
    _local_c0 = auVar8;
    fVar318 = auVar8._0_4_;
    fVar325 = auVar8._4_4_;
    fVar326 = auVar8._8_4_;
    fVar135 = fVar358 * fVar273 + fVar240 * fVar194 + fVar259 * fVar260 + fVar318 * fVar310;
    fVar153 = fVar360 * fVar281 + fVar255 * fVar208 + fVar300 * fVar267 + fVar325 * fVar312;
    fVar155 = fVar361 * fVar283 + fVar257 * fVar210 + fVar301 * fVar268 + fVar326 * fVar236;
    fVar157 = fVar364 * fVar285 + auVar221._12_4_ * fVar212 + fVar302 * fVar269 +
              auVar8._12_4_ * fVar303;
    fVar159 = fVar358 * fVar287 + fVar240 * fVar214 + fVar259 * fVar270 + fVar318 * fVar313;
    fVar161 = fVar360 * fVar288 + fVar255 * fVar215 + fVar300 * fVar271 + fVar325 * fVar314;
    fVar163 = fVar361 * fVar289 + fVar257 * fVar216 + fVar301 * fVar272 + fVar326 * fVar162;
    fVar166 = *(float *)(bezier_basis0 + lVar129 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar273 = *(float *)(bezier_basis1 + lVar129 + 0x908);
    fVar281 = *(float *)(bezier_basis1 + lVar129 + 0x90c);
    fVar283 = *(float *)(bezier_basis1 + lVar129 + 0x910);
    fVar285 = *(float *)(bezier_basis1 + lVar129 + 0x914);
    fVar287 = *(float *)(bezier_basis1 + lVar129 + 0x918);
    fVar288 = *(float *)(bezier_basis1 + lVar129 + 0x91c);
    fVar289 = *(float *)(bezier_basis1 + lVar129 + 0x920);
    fVar165 = *(float *)(bezier_basis1 + lVar129 + 0xd8c);
    fVar315 = *(float *)(bezier_basis1 + lVar129 + 0xd90);
    fVar316 = *(float *)(bezier_basis1 + lVar129 + 0xd94);
    fVar237 = *(float *)(bezier_basis1 + lVar129 + 0xd98);
    fVar304 = *(float *)(bezier_basis1 + lVar129 + 0xd9c);
    fVar317 = *(float *)(bezier_basis1 + lVar129 + 0xda0);
    fVar327 = *(float *)(bezier_basis1 + lVar129 + 0xda4);
    fVar238 = *(float *)(bezier_basis1 + lVar129 + 0x484);
    fVar193 = *(float *)(bezier_basis1 + lVar129 + 0x488);
    fVar136 = *(float *)(bezier_basis1 + lVar129 + 0x48c);
    fVar154 = *(float *)(bezier_basis1 + lVar129 + 0x490);
    fVar156 = *(float *)(bezier_basis1 + lVar129 + 0x494);
    fVar158 = *(float *)(bezier_basis1 + lVar129 + 0x498);
    fVar160 = *(float *)(bezier_basis1 + lVar129 + 0x49c);
    fVar167 = *(float *)(bezier_basis1 + lVar129);
    fVar164 = *(float *)(bezier_basis1 + lVar129 + 4);
    fVar217 = *(float *)(bezier_basis1 + lVar129 + 8);
    fVar234 = *(float *)(bezier_basis1 + lVar129 + 0xc);
    fVar235 = *(float *)(bezier_basis1 + lVar129 + 0x10);
    fVar168 = *(float *)(bezier_basis1 + lVar129 + 0x14);
    fVar170 = *(float *)(bezier_basis1 + lVar129 + 0x18);
    auVar248._0_4_ = fVar239 * fVar167 + fVar351 * fVar238 + fVar273 * fVar169 + fVar334 * fVar165;
    auVar248._4_4_ = fVar254 * fVar164 + fVar356 * fVar193 + fVar281 * fVar187 + fVar340 * fVar315;
    auVar248._8_4_ = fVar256 * fVar217 + fVar357 * fVar136 + fVar283 * fVar305 + fVar341 * fVar316;
    auVar248._12_4_ = fVar258 * fVar234 + fVar359 * fVar154 + fVar285 * fVar190 + fVar342 * fVar237;
    auVar248._16_4_ = fVar239 * fVar235 + fVar351 * fVar156 + fVar287 * fVar169 + fVar334 * fVar304;
    auVar248._20_4_ = fVar254 * fVar168 + fVar356 * fVar158 + fVar288 * fVar187 + fVar340 * fVar317;
    auVar248._24_4_ = fVar256 * fVar170 + fVar357 * fVar160 + fVar289 * fVar305 + fVar341 * fVar327;
    auVar248._28_4_ = fVar364 + fVar359 + 0.0;
    auVar226._0_4_ = fVar195 * fVar167 + fVar367 * fVar238 + fVar273 * fVar274 + fVar165 * fVar188;
    auVar226._4_4_ = fVar209 * fVar164 + fVar370 * fVar193 + fVar281 * fVar282 + fVar315 * fVar189;
    auVar226._8_4_ = fVar211 * fVar217 + fVar371 * fVar136 + fVar283 * fVar284 + fVar316 * fVar191;
    auVar226._12_4_ = fVar213 * fVar234 + fVar372 * fVar154 + fVar285 * fVar286 + fVar237 * fVar192;
    auVar226._16_4_ = fVar195 * fVar235 + fVar367 * fVar156 + fVar287 * fVar274 + fVar304 * fVar188;
    auVar226._20_4_ = fVar209 * fVar168 + fVar370 * fVar158 + fVar288 * fVar282 + fVar317 * fVar189;
    auVar226._24_4_ = fVar211 * fVar170 + fVar371 * fVar160 + fVar289 * fVar284 + fVar327 * fVar191;
    auVar226._28_4_ = fVar213 + fVar359 + 0.0;
    local_6c0._0_4_ = fVar358 * fVar238 + fVar240 * fVar273 + fVar259 * fVar165 + fVar318 * fVar167;
    local_6c0._4_4_ = fVar360 * fVar193 + fVar255 * fVar281 + fVar300 * fVar315 + fVar325 * fVar164;
    local_6c0._8_4_ = fVar361 * fVar136 + fVar257 * fVar283 + fVar301 * fVar316 + fVar326 * fVar217;
    local_6c0._12_4_ =
         fVar364 * fVar154 + auVar221._12_4_ * fVar285 + fVar302 * fVar237 + auVar8._12_4_ * fVar234
    ;
    local_6c0._16_4_ = fVar358 * fVar156 + fVar240 * fVar287 + fVar259 * fVar304 + fVar318 * fVar235
    ;
    local_6c0._20_4_ = fVar360 * fVar158 + fVar255 * fVar288 + fVar300 * fVar317 + fVar325 * fVar168
    ;
    local_6c0._24_4_ = fVar361 * fVar160 + fVar257 * fVar289 + fVar301 * fVar327 + fVar326 * fVar170
    ;
    local_6c0._28_4_ = fVar359 + fVar302 + 0.0 + fVar213;
    auVar24 = vsubps_avx(auVar248,auVar345);
    auVar25 = vsubps_avx(auVar226,auVar307);
    fVar194 = auVar24._0_4_;
    fVar210 = auVar24._4_4_;
    auVar31._4_4_ = auVar307._4_4_ * fVar210;
    auVar31._0_4_ = auVar307._0_4_ * fVar194;
    fVar214 = auVar24._8_4_;
    auVar31._8_4_ = auVar307._8_4_ * fVar214;
    fVar216 = auVar24._12_4_;
    auVar31._12_4_ = auVar307._12_4_ * fVar216;
    fVar267 = auVar24._16_4_;
    auVar31._16_4_ = auVar307._16_4_ * fVar267;
    fVar269 = auVar24._20_4_;
    auVar31._20_4_ = auVar307._20_4_ * fVar269;
    fVar271 = auVar24._24_4_;
    auVar31._24_4_ = auVar307._24_4_ * fVar271;
    auVar31._28_4_ = fVar213;
    fVar208 = auVar25._0_4_;
    fVar212 = auVar25._4_4_;
    auVar32._4_4_ = auVar343._4_4_ * fVar212;
    auVar32._0_4_ = auVar343._0_4_ * fVar208;
    fVar215 = auVar25._8_4_;
    auVar32._8_4_ = auVar343._8_4_ * fVar215;
    fVar260 = auVar25._12_4_;
    auVar32._12_4_ = auVar343._12_4_ * fVar260;
    fVar268 = auVar25._16_4_;
    auVar32._16_4_ = auVar345._16_4_ * fVar268;
    fVar270 = auVar25._20_4_;
    auVar32._20_4_ = auVar345._20_4_ * fVar270;
    fVar272 = auVar25._24_4_;
    auVar32._24_4_ = auVar345._24_4_ * fVar272;
    auVar32._28_4_ = auVar226._28_4_;
    auVar23 = vsubps_avx(auVar31,auVar32);
    auVar115._4_4_ = fVar153;
    auVar115._0_4_ = fVar135;
    auVar115._8_4_ = fVar155;
    auVar115._12_4_ = fVar157;
    auVar115._16_4_ = fVar159;
    auVar115._20_4_ = fVar161;
    auVar115._24_4_ = fVar163;
    auVar115._28_4_ = fVar166;
    auVar233 = vmaxps_avx(auVar115,local_6c0);
    auVar33._4_4_ = auVar233._4_4_ * auVar233._4_4_ * (fVar210 * fVar210 + fVar212 * fVar212);
    auVar33._0_4_ = auVar233._0_4_ * auVar233._0_4_ * (fVar194 * fVar194 + fVar208 * fVar208);
    auVar33._8_4_ = auVar233._8_4_ * auVar233._8_4_ * (fVar214 * fVar214 + fVar215 * fVar215);
    auVar33._12_4_ = auVar233._12_4_ * auVar233._12_4_ * (fVar216 * fVar216 + fVar260 * fVar260);
    auVar33._16_4_ = auVar233._16_4_ * auVar233._16_4_ * (fVar267 * fVar267 + fVar268 * fVar268);
    auVar33._20_4_ = auVar233._20_4_ * auVar233._20_4_ * (fVar269 * fVar269 + fVar270 * fVar270);
    auVar33._24_4_ = auVar233._24_4_ * auVar233._24_4_ * (fVar271 * fVar271 + fVar272 * fVar272);
    auVar33._28_4_ = auVar248._28_4_ + auVar226._28_4_;
    auVar34._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar34._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar34._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar34._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar34._16_4_ = auVar23._16_4_ * auVar23._16_4_;
    auVar34._20_4_ = auVar23._20_4_ * auVar23._20_4_;
    auVar34._24_4_ = auVar23._24_4_ * auVar23._24_4_;
    auVar34._28_4_ = auVar23._28_4_;
    auVar233 = vcmpps_avx(auVar34,auVar33,2);
    auVar220._0_4_ = (float)(int)uVar18;
    auVar220._4_12_ = auVar343._4_12_;
    auVar244 = ZEXT416((uint)(auVar200._0_4_ * 4.7683716e-07));
    auVar200 = vshufps_avx(auVar220,auVar220,0);
    auVar227._16_16_ = auVar200;
    auVar227._0_16_ = auVar200;
    auVar23 = vcmpps_avx(_DAT_01f7b060,auVar227,1);
    auVar200 = vpermilps_avx(auVar242,0xaa);
    register0x00001450 = auVar200;
    _local_520 = auVar200;
    auVar221 = vpermilps_avx(auVar352,0xaa);
    register0x00001550 = auVar221;
    _local_2e0 = auVar221;
    auVar8 = vpermilps_avx(auVar243,0xaa);
    register0x00001590 = auVar8;
    _local_e0 = auVar8;
    auVar9 = vpermilps_avx(auVar263,0xaa);
    register0x00001310 = auVar9;
    _local_2c0 = auVar9;
    auVar253 = ZEXT3264(_local_2c0);
    auVar26 = auVar23 & auVar233;
    local_640._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
    _local_480 = ZEXT416(uVar17);
    local_4a0._0_16_ = ZEXT416(uVar125);
    local_8d0 = auVar222._0_4_;
    fStack_8cc = auVar222._4_4_;
    fStack_8c8 = auVar222._8_4_;
    fStack_8c4 = auVar222._12_4_;
    uVar126 = uVar18;
    fVar194 = fVar188;
    fVar208 = fVar189;
    fVar210 = fVar191;
    fVar212 = fVar192;
    fVar214 = fVar367;
    fVar215 = fVar370;
    fVar216 = fVar371;
    fVar260 = fVar372;
    local_560 = auVar220._0_4_;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0x7f,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar26 >> 0xbf,0) == '\0') &&
        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f]) {
      auVar333 = ZEXT3264(auVar146);
LAB_0098961c:
      auVar350 = ZEXT3264(_local_820);
      auVar324 = ZEXT3264(_local_660);
    }
    else {
      local_320 = vandps_avx(auVar233,auVar23);
      fVar300 = auVar200._0_4_;
      fVar301 = auVar200._4_4_;
      fVar302 = auVar200._8_4_;
      fVar318 = auVar200._12_4_;
      fVar325 = auVar221._0_4_;
      fVar326 = auVar221._4_4_;
      fVar358 = auVar221._8_4_;
      fVar360 = auVar221._12_4_;
      fVar361 = auVar8._0_4_;
      fVar364 = auVar8._4_4_;
      fVar365 = auVar8._8_4_;
      fVar366 = auVar8._12_4_;
      fVar240 = auVar9._0_4_;
      fVar255 = auVar9._4_4_;
      fVar257 = auVar9._8_4_;
      fVar259 = auVar9._12_4_;
      fVar267 = auVar23._28_4_ + *(float *)(bezier_basis1 + lVar129 + 0x924) + 0.0;
      local_340._0_4_ =
           fVar300 * fVar167 + fVar325 * fVar238 + fVar361 * fVar273 + fVar240 * fVar165;
      local_340._4_4_ =
           fVar301 * fVar164 + fVar326 * fVar193 + fVar364 * fVar281 + fVar255 * fVar315;
      fStack_338 = fVar302 * fVar217 + fVar358 * fVar136 + fVar365 * fVar283 + fVar257 * fVar316;
      fStack_334 = fVar318 * fVar234 + fVar360 * fVar154 + fVar366 * fVar285 + fVar259 * fVar237;
      fStack_330 = fVar300 * fVar235 + fVar325 * fVar156 + fVar361 * fVar287 + fVar240 * fVar304;
      fStack_32c = fVar301 * fVar168 + fVar326 * fVar158 + fVar364 * fVar288 + fVar255 * fVar317;
      fStack_328 = fVar302 * fVar170 + fVar358 * fVar160 + fVar365 * fVar289 + fVar257 * fVar327;
      fStack_324 = local_320._28_4_ + fVar267;
      local_6a0._0_4_ = auVar122._0_4_;
      local_6a0._4_4_ = auVar122._4_4_;
      fStack_698 = auVar122._8_4_;
      fStack_694 = auVar122._12_4_;
      fStack_690 = auVar122._16_4_;
      fStack_68c = auVar122._20_4_;
      fStack_688 = auVar122._24_4_;
      local_4e0._0_4_ = auVar121._0_4_;
      local_4e0._4_4_ = auVar121._4_4_;
      fStack_4d8 = auVar121._8_4_;
      fStack_4d4 = auVar121._12_4_;
      fStack_4d0 = auVar121._16_4_;
      fStack_4cc = auVar121._20_4_;
      fStack_4c8 = auVar121._24_4_;
      local_760._0_4_ = auVar120._0_4_;
      local_760._4_4_ = auVar120._4_4_;
      fStack_758 = auVar120._8_4_;
      fStack_754 = auVar120._12_4_;
      fStack_750 = auVar120._16_4_;
      fStack_74c = auVar120._20_4_;
      fStack_748 = auVar120._24_4_;
      local_4e0._0_4_ =
           fVar300 * fVar310 +
           fVar325 * (float)local_6a0._0_4_ +
           fVar361 * (float)local_4e0._0_4_ + fVar240 * (float)local_760._0_4_;
      local_4e0._4_4_ =
           fVar301 * fVar312 +
           fVar326 * (float)local_6a0._4_4_ +
           fVar364 * (float)local_4e0._4_4_ + fVar255 * (float)local_760._4_4_;
      fStack_4d8 = fVar302 * fVar236 +
                   fVar358 * fStack_698 + fVar365 * fStack_4d8 + fVar257 * fStack_758;
      fStack_4d4 = fVar318 * fVar303 +
                   fVar360 * fStack_694 + fVar366 * fStack_4d4 + fVar259 * fStack_754;
      fStack_4d0 = fVar300 * fVar313 +
                   fVar325 * fStack_690 + fVar361 * fStack_4d0 + fVar240 * fStack_750;
      fStack_4cc = fVar301 * fVar314 +
                   fVar326 * fStack_68c + fVar364 * fStack_4cc + fVar255 * fStack_74c;
      fStack_4c8 = fVar302 * fVar162 +
                   fVar358 * fStack_688 + fVar365 * fStack_4c8 + fVar257 * fStack_748;
      fStack_4c4 = fStack_324 + fVar267 + local_320._28_4_ + auVar23._28_4_;
      fVar267 = *(float *)(bezier_basis0 + lVar129 + 0x1210);
      fVar268 = *(float *)(bezier_basis0 + lVar129 + 0x1214);
      fVar269 = *(float *)(bezier_basis0 + lVar129 + 0x1218);
      fVar270 = *(float *)(bezier_basis0 + lVar129 + 0x121c);
      fVar271 = *(float *)(bezier_basis0 + lVar129 + 0x1220);
      fVar272 = *(float *)(bezier_basis0 + lVar129 + 0x1224);
      fVar273 = *(float *)(bezier_basis0 + lVar129 + 0x1228);
      fVar281 = *(float *)(bezier_basis0 + lVar129 + 0x1694);
      fVar283 = *(float *)(bezier_basis0 + lVar129 + 0x1698);
      fVar285 = *(float *)(bezier_basis0 + lVar129 + 0x169c);
      fVar287 = *(float *)(bezier_basis0 + lVar129 + 0x16a0);
      fVar288 = *(float *)(bezier_basis0 + lVar129 + 0x16a4);
      fVar289 = *(float *)(bezier_basis0 + lVar129 + 0x16a8);
      fVar310 = *(float *)(bezier_basis0 + lVar129 + 0x16ac);
      fVar312 = *(float *)(bezier_basis0 + lVar129 + 0x1b18);
      fVar236 = *(float *)(bezier_basis0 + lVar129 + 0x1b1c);
      fVar303 = *(float *)(bezier_basis0 + lVar129 + 0x1b20);
      fVar313 = *(float *)(bezier_basis0 + lVar129 + 0x1b24);
      fVar314 = *(float *)(bezier_basis0 + lVar129 + 0x1b28);
      fVar162 = *(float *)(bezier_basis0 + lVar129 + 0x1b2c);
      fVar165 = *(float *)(bezier_basis0 + lVar129 + 0x1b30);
      fVar315 = *(float *)(bezier_basis0 + lVar129 + 0x1f9c);
      fVar316 = *(float *)(bezier_basis0 + lVar129 + 0x1fa0);
      fVar237 = *(float *)(bezier_basis0 + lVar129 + 0x1fa4);
      fVar304 = *(float *)(bezier_basis0 + lVar129 + 0x1fa8);
      fVar317 = *(float *)(bezier_basis0 + lVar129 + 0x1fac);
      fVar327 = *(float *)(bezier_basis0 + lVar129 + 0x1fb0);
      fVar238 = *(float *)(bezier_basis0 + lVar129 + 0x1fb4);
      fVar193 = *(float *)(bezier_basis0 + lVar129 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar129 + 0x1fb8);
      fVar136 = *(float *)(bezier_basis0 + lVar129 + 0x16b0) + fVar193;
      local_600 = fVar239 * fVar267 + fVar351 * fVar281 + fVar169 * fVar312 + fVar334 * fVar315;
      fStack_5fc = fVar254 * fVar268 + fVar356 * fVar283 + fVar187 * fVar236 + fVar340 * fVar316;
      fStack_5f8 = fVar256 * fVar269 + fVar357 * fVar285 + fVar305 * fVar303 + fVar341 * fVar237;
      fStack_5f4 = fVar258 * fVar270 + fVar359 * fVar287 + fVar190 * fVar313 + fVar342 * fVar304;
      fStack_5f0 = fVar239 * fVar271 + fVar351 * fVar288 + fVar169 * fVar314 + fVar334 * fVar317;
      fStack_5ec = fVar254 * fVar272 + fVar356 * fVar289 + fVar187 * fVar162 + fVar340 * fVar327;
      fStack_5e8 = fVar256 * fVar273 + fVar357 * fVar310 + fVar305 * fVar165 + fVar341 * fVar238;
      fStack_5e4 = *(float *)(bezier_basis0 + lVar129 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar129 + 0x1fb8) +
                   fVar318 + *(float *)(bezier_basis1 + lVar129 + 0x4a0);
      auVar179._0_4_ = fVar274 * fVar312 + fVar188 * fVar315 + fVar367 * fVar281 + fVar195 * fVar267
      ;
      auVar179._4_4_ = fVar282 * fVar236 + fVar189 * fVar316 + fVar370 * fVar283 + fVar209 * fVar268
      ;
      auVar179._8_4_ = fVar284 * fVar303 + fVar191 * fVar237 + fVar371 * fVar285 + fVar211 * fVar269
      ;
      auVar179._12_4_ =
           fVar286 * fVar313 + fVar192 * fVar304 + fVar372 * fVar287 + fVar213 * fVar270;
      auVar179._16_4_ =
           fVar274 * fVar314 + fVar188 * fVar317 + fVar367 * fVar288 + fVar195 * fVar271;
      auVar179._20_4_ =
           fVar282 * fVar162 + fVar189 * fVar327 + fVar370 * fVar289 + fVar209 * fVar272;
      auVar179._24_4_ =
           fVar284 * fVar165 + fVar191 * fVar238 + fVar371 * fVar310 + fVar211 * fVar273;
      auVar179._28_4_ =
           fVar318 + *(float *)(bezier_basis1 + lVar129 + 0x1c) +
           fVar318 + *(float *)(bezier_basis1 + lVar129 + 0x4a0) + fVar193;
      local_360._4_4_ =
           fVar326 * fVar283 + fVar364 * fVar236 + fVar255 * fVar316 + fVar301 * fVar268;
      local_360._0_4_ =
           fVar325 * fVar281 + fVar361 * fVar312 + fVar240 * fVar315 + fVar300 * fVar267;
      fStack_358 = fVar358 * fVar285 + fVar365 * fVar303 + fVar257 * fVar237 + fVar302 * fVar269;
      fStack_354 = fVar360 * fVar287 + fVar366 * fVar313 + fVar259 * fVar304 + fVar318 * fVar270;
      fStack_350 = fVar325 * fVar288 + fVar361 * fVar314 + fVar240 * fVar317 + fVar300 * fVar271;
      fStack_34c = fVar326 * fVar289 + fVar364 * fVar162 + fVar255 * fVar327 + fVar301 * fVar272;
      fStack_348 = fVar358 * fVar310 + fVar365 * fVar165 + fVar257 * fVar238 + fVar302 * fVar273;
      fStack_344 = fVar136 + *(float *)(bezier_basis0 + lVar129 + 0x122c);
      fVar267 = *(float *)(bezier_basis1 + lVar129 + 0x1b18);
      fVar268 = *(float *)(bezier_basis1 + lVar129 + 0x1b1c);
      fVar269 = *(float *)(bezier_basis1 + lVar129 + 0x1b20);
      fVar270 = *(float *)(bezier_basis1 + lVar129 + 0x1b24);
      fVar271 = *(float *)(bezier_basis1 + lVar129 + 0x1b28);
      fVar272 = *(float *)(bezier_basis1 + lVar129 + 0x1b2c);
      fVar273 = *(float *)(bezier_basis1 + lVar129 + 0x1b30);
      fVar281 = *(float *)(bezier_basis1 + lVar129 + 0x1f9c);
      fVar283 = *(float *)(bezier_basis1 + lVar129 + 0x1fa0);
      fVar285 = *(float *)(bezier_basis1 + lVar129 + 0x1fa4);
      fVar287 = *(float *)(bezier_basis1 + lVar129 + 0x1fa8);
      fVar288 = *(float *)(bezier_basis1 + lVar129 + 0x1fac);
      fVar289 = *(float *)(bezier_basis1 + lVar129 + 0x1fb0);
      fVar310 = *(float *)(bezier_basis1 + lVar129 + 0x1fb4);
      fVar312 = *(float *)(bezier_basis1 + lVar129 + 0x1694);
      fVar236 = *(float *)(bezier_basis1 + lVar129 + 0x1698);
      fVar303 = *(float *)(bezier_basis1 + lVar129 + 0x169c);
      fVar313 = *(float *)(bezier_basis1 + lVar129 + 0x16a0);
      fVar314 = *(float *)(bezier_basis1 + lVar129 + 0x16a4);
      fVar162 = *(float *)(bezier_basis1 + lVar129 + 0x16a8);
      fVar165 = *(float *)(bezier_basis1 + lVar129 + 0x16ac);
      fVar315 = *(float *)(bezier_basis1 + lVar129 + 0x1210);
      fVar316 = *(float *)(bezier_basis1 + lVar129 + 0x1214);
      fVar237 = *(float *)(bezier_basis1 + lVar129 + 0x1218);
      fVar304 = *(float *)(bezier_basis1 + lVar129 + 0x121c);
      fVar317 = *(float *)(bezier_basis1 + lVar129 + 0x1220);
      fVar327 = *(float *)(bezier_basis1 + lVar129 + 0x1224);
      fVar238 = *(float *)(bezier_basis1 + lVar129 + 0x1228);
      auVar297._0_4_ = fVar239 * fVar315 + fVar351 * fVar312 + fVar169 * fVar267 + fVar334 * fVar281
      ;
      auVar297._4_4_ = fVar254 * fVar316 + fVar356 * fVar236 + fVar187 * fVar268 + fVar340 * fVar283
      ;
      auVar297._8_4_ = fVar256 * fVar237 + fVar357 * fVar303 + fVar305 * fVar269 + fVar341 * fVar285
      ;
      auVar297._12_4_ =
           fVar258 * fVar304 + fVar359 * fVar313 + fVar190 * fVar270 + fVar342 * fVar287;
      auVar297._16_4_ =
           fVar239 * fVar317 + fVar351 * fVar314 + fVar169 * fVar271 + fVar334 * fVar288;
      auVar297._20_4_ =
           fVar254 * fVar327 + fVar356 * fVar162 + fVar187 * fVar272 + fVar340 * fVar289;
      auVar297._24_4_ =
           fVar256 * fVar238 + fVar357 * fVar165 + fVar305 * fVar273 + fVar341 * fVar310;
      auVar297._28_4_ = fVar286 + fVar286 + fVar136 + fVar342;
      auVar320._0_4_ = fVar195 * fVar315 + fVar367 * fVar312 + fVar274 * fVar267 + fVar188 * fVar281
      ;
      auVar320._4_4_ = fVar209 * fVar316 + fVar370 * fVar236 + fVar282 * fVar268 + fVar189 * fVar283
      ;
      auVar320._8_4_ = fVar211 * fVar237 + fVar371 * fVar303 + fVar284 * fVar269 + fVar191 * fVar285
      ;
      auVar320._12_4_ =
           fVar213 * fVar304 + fVar372 * fVar313 + fVar286 * fVar270 + fVar192 * fVar287;
      auVar320._16_4_ =
           fVar195 * fVar317 + fVar367 * fVar314 + fVar274 * fVar271 + fVar188 * fVar288;
      auVar320._20_4_ =
           fVar209 * fVar327 + fVar370 * fVar162 + fVar282 * fVar272 + fVar189 * fVar289;
      auVar320._24_4_ =
           fVar211 * fVar238 + fVar371 * fVar165 + fVar284 * fVar273 + fVar191 * fVar310;
      auVar320._28_4_ = fVar286 + fVar286 + fVar286 + fVar136;
      auVar207._0_4_ = fVar300 * fVar315 + fVar325 * fVar312 + fVar361 * fVar267 + fVar240 * fVar281
      ;
      auVar207._4_4_ = fVar301 * fVar316 + fVar326 * fVar236 + fVar364 * fVar268 + fVar255 * fVar283
      ;
      auVar207._8_4_ = fVar302 * fVar237 + fVar358 * fVar303 + fVar365 * fVar269 + fVar257 * fVar285
      ;
      auVar207._12_4_ =
           fVar318 * fVar304 + fVar360 * fVar313 + fVar366 * fVar270 + fVar259 * fVar287;
      auVar207._16_4_ =
           fVar300 * fVar317 + fVar325 * fVar314 + fVar361 * fVar271 + fVar240 * fVar288;
      auVar207._20_4_ =
           fVar301 * fVar327 + fVar326 * fVar162 + fVar364 * fVar272 + fVar255 * fVar289;
      auVar207._24_4_ =
           fVar302 * fVar238 + fVar358 * fVar165 + fVar365 * fVar273 + fVar257 * fVar310;
      auVar207._28_4_ =
           *(float *)(bezier_basis1 + lVar129 + 0x122c) +
           *(float *)(bezier_basis1 + lVar129 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar129 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar129 + 0x1fb8);
      auVar249._8_4_ = 0x7fffffff;
      auVar249._0_8_ = 0x7fffffff7fffffff;
      auVar249._12_4_ = 0x7fffffff;
      auVar249._16_4_ = 0x7fffffff;
      auVar249._20_4_ = 0x7fffffff;
      auVar249._24_4_ = 0x7fffffff;
      auVar249._28_4_ = 0x7fffffff;
      auVar117._4_4_ = fStack_5fc;
      auVar117._0_4_ = local_600;
      auVar117._8_4_ = fStack_5f8;
      auVar117._12_4_ = fStack_5f4;
      auVar117._16_4_ = fStack_5f0;
      auVar117._20_4_ = fStack_5ec;
      auVar117._24_4_ = fStack_5e8;
      auVar117._28_4_ = fStack_5e4;
      auVar233 = vandps_avx(auVar117,auVar249);
      auVar23 = vandps_avx(auVar179,auVar249);
      auVar23 = vmaxps_avx(auVar233,auVar23);
      auVar233 = vandps_avx(auVar249,_local_360);
      auVar233 = vmaxps_avx(auVar23,auVar233);
      auVar222 = vpermilps_avx(auVar244,0);
      auVar276._16_16_ = auVar222;
      auVar276._0_16_ = auVar222;
      auVar233 = vcmpps_avx(auVar233,auVar276,1);
      auVar26 = vblendvps_avx(auVar117,auVar24,auVar233);
      auVar27 = vblendvps_avx(auVar179,auVar25,auVar233);
      auVar233 = vandps_avx(auVar297,auVar249);
      auVar23 = vandps_avx(auVar320,auVar249);
      auVar28 = vmaxps_avx(auVar233,auVar23);
      auVar233 = vandps_avx(auVar207,auVar249);
      auVar233 = vmaxps_avx(auVar28,auVar233);
      auVar28 = vcmpps_avx(auVar233,auVar276,1);
      auVar233 = vblendvps_avx(auVar297,auVar24,auVar28);
      auVar24 = vblendvps_avx(auVar320,auVar25,auVar28);
      fVar136 = auVar26._0_4_;
      fVar154 = auVar26._4_4_;
      fVar156 = auVar26._8_4_;
      fVar158 = auVar26._12_4_;
      fVar160 = auVar26._16_4_;
      fVar167 = auVar26._20_4_;
      fVar164 = auVar26._24_4_;
      fVar217 = auVar233._0_4_;
      fVar234 = auVar233._4_4_;
      fVar235 = auVar233._8_4_;
      fVar168 = auVar233._12_4_;
      fVar170 = auVar233._16_4_;
      fVar169 = auVar233._20_4_;
      fVar187 = auVar233._24_4_;
      fVar305 = -auVar233._28_4_;
      fVar267 = auVar27._0_4_;
      fVar271 = auVar27._4_4_;
      fVar283 = auVar27._8_4_;
      fVar289 = auVar27._12_4_;
      fVar303 = auVar27._16_4_;
      fVar165 = auVar27._20_4_;
      fVar304 = auVar27._24_4_;
      auVar142._0_4_ = fVar267 * fVar267 + fVar136 * fVar136;
      auVar142._4_4_ = fVar271 * fVar271 + fVar154 * fVar154;
      auVar142._8_4_ = fVar283 * fVar283 + fVar156 * fVar156;
      auVar142._12_4_ = fVar289 * fVar289 + fVar158 * fVar158;
      auVar142._16_4_ = fVar303 * fVar303 + fVar160 * fVar160;
      auVar142._20_4_ = fVar165 * fVar165 + fVar167 * fVar167;
      auVar142._24_4_ = fVar304 * fVar304 + fVar164 * fVar164;
      auVar142._28_4_ = auVar320._28_4_ + auVar26._28_4_;
      auVar25 = vrsqrtps_avx(auVar142);
      fVar268 = auVar25._0_4_;
      fVar269 = auVar25._4_4_;
      auVar35._4_4_ = fVar269 * 1.5;
      auVar35._0_4_ = fVar268 * 1.5;
      fVar270 = auVar25._8_4_;
      auVar35._8_4_ = fVar270 * 1.5;
      fVar272 = auVar25._12_4_;
      auVar35._12_4_ = fVar272 * 1.5;
      fVar273 = auVar25._16_4_;
      auVar35._16_4_ = fVar273 * 1.5;
      fVar281 = auVar25._20_4_;
      auVar35._20_4_ = fVar281 * 1.5;
      fVar285 = auVar25._24_4_;
      fVar193 = auVar23._28_4_;
      auVar35._24_4_ = fVar285 * 1.5;
      auVar35._28_4_ = fVar193;
      auVar36._4_4_ = fVar269 * fVar269 * fVar269 * auVar142._4_4_ * 0.5;
      auVar36._0_4_ = fVar268 * fVar268 * fVar268 * auVar142._0_4_ * 0.5;
      auVar36._8_4_ = fVar270 * fVar270 * fVar270 * auVar142._8_4_ * 0.5;
      auVar36._12_4_ = fVar272 * fVar272 * fVar272 * auVar142._12_4_ * 0.5;
      auVar36._16_4_ = fVar273 * fVar273 * fVar273 * auVar142._16_4_ * 0.5;
      auVar36._20_4_ = fVar281 * fVar281 * fVar281 * auVar142._20_4_ * 0.5;
      auVar36._24_4_ = fVar285 * fVar285 * fVar285 * auVar142._24_4_ * 0.5;
      auVar36._28_4_ = auVar142._28_4_;
      auVar23 = vsubps_avx(auVar35,auVar36);
      fVar268 = auVar23._0_4_;
      fVar272 = auVar23._4_4_;
      fVar285 = auVar23._8_4_;
      fVar310 = auVar23._12_4_;
      fVar313 = auVar23._16_4_;
      fVar315 = auVar23._20_4_;
      fVar317 = auVar23._24_4_;
      fVar269 = auVar24._0_4_;
      fVar273 = auVar24._4_4_;
      fVar287 = auVar24._8_4_;
      fVar312 = auVar24._12_4_;
      fVar314 = auVar24._16_4_;
      fVar316 = auVar24._20_4_;
      fVar327 = auVar24._24_4_;
      auVar143._0_4_ = fVar269 * fVar269 + fVar217 * fVar217;
      auVar143._4_4_ = fVar273 * fVar273 + fVar234 * fVar234;
      auVar143._8_4_ = fVar287 * fVar287 + fVar235 * fVar235;
      auVar143._12_4_ = fVar312 * fVar312 + fVar168 * fVar168;
      auVar143._16_4_ = fVar314 * fVar314 + fVar170 * fVar170;
      auVar143._20_4_ = fVar316 * fVar316 + fVar169 * fVar169;
      auVar143._24_4_ = fVar327 * fVar327 + fVar187 * fVar187;
      auVar143._28_4_ = auVar233._28_4_ + auVar23._28_4_;
      auVar233 = vrsqrtps_avx(auVar143);
      fVar270 = auVar233._0_4_;
      fVar281 = auVar233._4_4_;
      auVar37._4_4_ = fVar281 * 1.5;
      auVar37._0_4_ = fVar270 * 1.5;
      fVar288 = auVar233._8_4_;
      auVar37._8_4_ = fVar288 * 1.5;
      fVar236 = auVar233._12_4_;
      auVar37._12_4_ = fVar236 * 1.5;
      fVar162 = auVar233._16_4_;
      auVar37._16_4_ = fVar162 * 1.5;
      fVar237 = auVar233._20_4_;
      auVar37._20_4_ = fVar237 * 1.5;
      fVar238 = auVar233._24_4_;
      auVar37._24_4_ = fVar238 * 1.5;
      auVar37._28_4_ = fVar193;
      auVar38._4_4_ = fVar281 * fVar281 * fVar281 * auVar143._4_4_ * 0.5;
      auVar38._0_4_ = fVar270 * fVar270 * fVar270 * auVar143._0_4_ * 0.5;
      auVar38._8_4_ = fVar288 * fVar288 * fVar288 * auVar143._8_4_ * 0.5;
      auVar38._12_4_ = fVar236 * fVar236 * fVar236 * auVar143._12_4_ * 0.5;
      auVar38._16_4_ = fVar162 * fVar162 * fVar162 * auVar143._16_4_ * 0.5;
      auVar38._20_4_ = fVar237 * fVar237 * fVar237 * auVar143._20_4_ * 0.5;
      auVar38._24_4_ = fVar238 * fVar238 * fVar238 * auVar143._24_4_ * 0.5;
      auVar38._28_4_ = auVar143._28_4_;
      auVar233 = vsubps_avx(auVar37,auVar38);
      fVar270 = auVar233._0_4_;
      fVar281 = auVar233._4_4_;
      fVar288 = auVar233._8_4_;
      fVar236 = auVar233._12_4_;
      fVar162 = auVar233._16_4_;
      fVar237 = auVar233._20_4_;
      fVar238 = auVar233._24_4_;
      fVar267 = fVar135 * fVar267 * fVar268;
      fVar271 = fVar153 * fVar271 * fVar272;
      auVar39._4_4_ = fVar271;
      auVar39._0_4_ = fVar267;
      fVar283 = fVar155 * fVar283 * fVar285;
      auVar39._8_4_ = fVar283;
      fVar289 = fVar157 * fVar289 * fVar310;
      auVar39._12_4_ = fVar289;
      fVar303 = fVar159 * fVar303 * fVar313;
      auVar39._16_4_ = fVar303;
      fVar165 = fVar161 * fVar165 * fVar315;
      auVar39._20_4_ = fVar165;
      fVar304 = fVar163 * fVar304 * fVar317;
      auVar39._24_4_ = fVar304;
      auVar39._28_4_ = fVar305;
      local_760._4_4_ = auVar343._4_4_ + fVar271;
      local_760._0_4_ = auVar343._0_4_ + fVar267;
      fStack_758 = auVar343._8_4_ + fVar283;
      fStack_754 = auVar343._12_4_ + fVar289;
      fStack_750 = auVar345._16_4_ + fVar303;
      fStack_74c = auVar345._20_4_ + fVar165;
      fStack_748 = auVar345._24_4_ + fVar304;
      fStack_744 = auVar345._28_4_ + fVar305;
      fVar267 = fVar135 * fVar268 * -fVar136;
      fVar271 = fVar153 * fVar272 * -fVar154;
      auVar40._4_4_ = fVar271;
      auVar40._0_4_ = fVar267;
      fVar283 = fVar155 * fVar285 * -fVar156;
      auVar40._8_4_ = fVar283;
      fVar289 = fVar157 * fVar310 * -fVar158;
      auVar40._12_4_ = fVar289;
      fVar303 = fVar159 * fVar313 * -fVar160;
      auVar40._16_4_ = fVar303;
      fVar165 = fVar161 * fVar315 * -fVar167;
      auVar40._20_4_ = fVar165;
      fVar304 = fVar163 * fVar317 * -fVar164;
      auVar40._24_4_ = fVar304;
      auVar40._28_4_ = fVar193;
      local_6a0._4_4_ = fVar271 + auVar307._4_4_;
      local_6a0._0_4_ = fVar267 + auVar307._0_4_;
      fStack_698 = fVar283 + auVar307._8_4_;
      fStack_694 = fVar289 + auVar307._12_4_;
      fStack_690 = fVar303 + auVar307._16_4_;
      fStack_68c = fVar165 + auVar307._20_4_;
      fStack_688 = fVar304 + auVar307._24_4_;
      fStack_684 = fVar193 + auVar307._28_4_;
      fVar267 = fVar135 * fVar268 * 0.0;
      fVar268 = fVar153 * fVar272 * 0.0;
      auVar41._4_4_ = fVar268;
      auVar41._0_4_ = fVar267;
      fVar271 = fVar155 * fVar285 * 0.0;
      auVar41._8_4_ = fVar271;
      fVar272 = fVar157 * fVar310 * 0.0;
      auVar41._12_4_ = fVar272;
      fVar283 = fVar159 * fVar313 * 0.0;
      auVar41._16_4_ = fVar283;
      fVar285 = fVar161 * fVar315 * 0.0;
      auVar41._20_4_ = fVar285;
      fVar289 = fVar163 * fVar317 * 0.0;
      auVar41._24_4_ = fVar289;
      auVar41._28_4_ = fVar359;
      auVar277._0_4_ = (float)local_4e0._0_4_ + fVar267;
      auVar277._4_4_ = (float)local_4e0._4_4_ + fVar268;
      auVar277._8_4_ = fStack_4d8 + fVar271;
      auVar277._12_4_ = fStack_4d4 + fVar272;
      auVar277._16_4_ = fStack_4d0 + fVar283;
      auVar277._20_4_ = fStack_4cc + fVar285;
      auVar277._24_4_ = fStack_4c8 + fVar289;
      auVar277._28_4_ = fStack_4c4 + fVar359;
      fVar267 = (float)local_6c0._0_4_ * fVar269 * fVar270;
      fVar268 = local_6c0._4_4_ * fVar273 * fVar281;
      auVar42._4_4_ = fVar268;
      auVar42._0_4_ = fVar267;
      fVar269 = local_6c0._8_4_ * fVar287 * fVar288;
      auVar42._8_4_ = fVar269;
      fVar271 = local_6c0._12_4_ * fVar312 * fVar236;
      auVar42._12_4_ = fVar271;
      fVar272 = local_6c0._16_4_ * fVar314 * fVar162;
      auVar42._16_4_ = fVar272;
      fVar273 = local_6c0._20_4_ * fVar316 * fVar237;
      auVar42._20_4_ = fVar273;
      fVar283 = local_6c0._24_4_ * fVar327 * fVar238;
      auVar42._24_4_ = fVar283;
      auVar42._28_4_ = auVar24._28_4_;
      auVar28 = vsubps_avx(auVar345,auVar39);
      auVar321._0_4_ = auVar248._0_4_ + fVar267;
      auVar321._4_4_ = auVar248._4_4_ + fVar268;
      auVar321._8_4_ = auVar248._8_4_ + fVar269;
      auVar321._12_4_ = auVar248._12_4_ + fVar271;
      auVar321._16_4_ = auVar248._16_4_ + fVar272;
      auVar321._20_4_ = auVar248._20_4_ + fVar273;
      auVar321._24_4_ = auVar248._24_4_ + fVar283;
      auVar321._28_4_ = auVar248._28_4_ + auVar24._28_4_;
      fVar267 = (float)local_6c0._0_4_ * fVar270 * -fVar217;
      fVar268 = local_6c0._4_4_ * fVar281 * -fVar234;
      auVar43._4_4_ = fVar268;
      auVar43._0_4_ = fVar267;
      fVar269 = local_6c0._8_4_ * fVar288 * -fVar235;
      auVar43._8_4_ = fVar269;
      fVar271 = local_6c0._12_4_ * fVar236 * -fVar168;
      auVar43._12_4_ = fVar271;
      fVar272 = local_6c0._16_4_ * fVar162 * -fVar170;
      auVar43._16_4_ = fVar272;
      fVar273 = local_6c0._20_4_ * fVar237 * -fVar169;
      auVar43._20_4_ = fVar273;
      fVar283 = local_6c0._24_4_ * fVar238 * -fVar187;
      auVar43._24_4_ = fVar283;
      auVar43._28_4_ = fVar360;
      auVar29 = vsubps_avx(auVar307,auVar40);
      auVar330._0_4_ = fVar267 + auVar226._0_4_;
      auVar330._4_4_ = fVar268 + auVar226._4_4_;
      auVar330._8_4_ = fVar269 + auVar226._8_4_;
      auVar330._12_4_ = fVar271 + auVar226._12_4_;
      auVar330._16_4_ = fVar272 + auVar226._16_4_;
      auVar330._20_4_ = fVar273 + auVar226._20_4_;
      auVar330._24_4_ = fVar283 + auVar226._24_4_;
      auVar330._28_4_ = fVar360 + auVar226._28_4_;
      fVar267 = (float)local_6c0._0_4_ * fVar270 * 0.0;
      fVar268 = local_6c0._4_4_ * fVar281 * 0.0;
      auVar44._4_4_ = fVar268;
      auVar44._0_4_ = fVar267;
      fVar269 = local_6c0._8_4_ * fVar288 * 0.0;
      auVar44._8_4_ = fVar269;
      fVar270 = local_6c0._12_4_ * fVar236 * 0.0;
      auVar44._12_4_ = fVar270;
      fVar271 = local_6c0._16_4_ * fVar162 * 0.0;
      auVar44._16_4_ = fVar271;
      fVar272 = local_6c0._20_4_ * fVar237 * 0.0;
      auVar44._20_4_ = fVar272;
      fVar273 = local_6c0._24_4_ * fVar238 * 0.0;
      auVar44._24_4_ = fVar273;
      auVar44._28_4_ = 0x3f000000;
      auVar30 = vsubps_avx(_local_4e0,auVar41);
      auVar363._0_4_ = fVar267 + (float)local_340._0_4_;
      auVar363._4_4_ = fVar268 + (float)local_340._4_4_;
      auVar363._8_4_ = fVar269 + fStack_338;
      auVar363._12_4_ = fVar270 + fStack_334;
      auVar363._16_4_ = fVar271 + fStack_330;
      auVar363._20_4_ = fVar272 + fStack_32c;
      auVar363._24_4_ = fVar273 + fStack_328;
      auVar363._28_4_ = fStack_324 + 0.5;
      auVar233 = vsubps_avx(auVar248,auVar42);
      auVar23 = vsubps_avx(auVar226,auVar43);
      auVar139 = vsubps_avx(_local_340,auVar44);
      auVar24 = vsubps_avx(auVar330,auVar29);
      auVar25 = vsubps_avx(auVar363,auVar30);
      auVar45._4_4_ = auVar30._4_4_ * auVar24._4_4_;
      auVar45._0_4_ = auVar30._0_4_ * auVar24._0_4_;
      auVar45._8_4_ = auVar30._8_4_ * auVar24._8_4_;
      auVar45._12_4_ = auVar30._12_4_ * auVar24._12_4_;
      auVar45._16_4_ = auVar30._16_4_ * auVar24._16_4_;
      auVar45._20_4_ = auVar30._20_4_ * auVar24._20_4_;
      auVar45._24_4_ = auVar30._24_4_ * auVar24._24_4_;
      auVar45._28_4_ = fVar318;
      auVar46._4_4_ = auVar29._4_4_ * auVar25._4_4_;
      auVar46._0_4_ = auVar29._0_4_ * auVar25._0_4_;
      auVar46._8_4_ = auVar29._8_4_ * auVar25._8_4_;
      auVar46._12_4_ = auVar29._12_4_ * auVar25._12_4_;
      auVar46._16_4_ = auVar29._16_4_ * auVar25._16_4_;
      auVar46._20_4_ = auVar29._20_4_ * auVar25._20_4_;
      auVar46._24_4_ = auVar29._24_4_ * auVar25._24_4_;
      auVar46._28_4_ = fStack_324;
      auVar26 = vsubps_avx(auVar46,auVar45);
      auVar47._4_4_ = auVar28._4_4_ * auVar25._4_4_;
      auVar47._0_4_ = auVar28._0_4_ * auVar25._0_4_;
      auVar47._8_4_ = auVar28._8_4_ * auVar25._8_4_;
      auVar47._12_4_ = auVar28._12_4_ * auVar25._12_4_;
      auVar47._16_4_ = auVar28._16_4_ * auVar25._16_4_;
      auVar47._20_4_ = auVar28._20_4_ * auVar25._20_4_;
      auVar47._24_4_ = auVar28._24_4_ * auVar25._24_4_;
      auVar47._28_4_ = auVar25._28_4_;
      auVar27 = vsubps_avx(auVar321,auVar28);
      auVar48._4_4_ = auVar30._4_4_ * auVar27._4_4_;
      auVar48._0_4_ = auVar30._0_4_ * auVar27._0_4_;
      auVar48._8_4_ = auVar30._8_4_ * auVar27._8_4_;
      auVar48._12_4_ = auVar30._12_4_ * auVar27._12_4_;
      auVar48._16_4_ = auVar30._16_4_ * auVar27._16_4_;
      auVar48._20_4_ = auVar30._20_4_ * auVar27._20_4_;
      auVar48._24_4_ = auVar30._24_4_ * auVar27._24_4_;
      auVar48._28_4_ = auVar226._28_4_;
      auVar22 = vsubps_avx(auVar48,auVar47);
      auVar49._4_4_ = auVar27._4_4_ * auVar29._4_4_;
      auVar49._0_4_ = auVar27._0_4_ * auVar29._0_4_;
      auVar49._8_4_ = auVar27._8_4_ * auVar29._8_4_;
      auVar49._12_4_ = auVar27._12_4_ * auVar29._12_4_;
      auVar49._16_4_ = auVar27._16_4_ * auVar29._16_4_;
      auVar49._20_4_ = auVar27._20_4_ * auVar29._20_4_;
      auVar49._24_4_ = auVar27._24_4_ * auVar29._24_4_;
      auVar49._28_4_ = auVar25._28_4_;
      auVar50._4_4_ = auVar28._4_4_ * auVar24._4_4_;
      auVar50._0_4_ = auVar28._0_4_ * auVar24._0_4_;
      auVar50._8_4_ = auVar28._8_4_ * auVar24._8_4_;
      auVar50._12_4_ = auVar28._12_4_ * auVar24._12_4_;
      auVar50._16_4_ = auVar28._16_4_ * auVar24._16_4_;
      auVar50._20_4_ = auVar28._20_4_ * auVar24._20_4_;
      auVar50._24_4_ = auVar28._24_4_ * auVar24._24_4_;
      auVar50._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar50,auVar49);
      auVar144._0_4_ = auVar26._0_4_ * 0.0 + auVar24._0_4_ + auVar22._0_4_ * 0.0;
      auVar144._4_4_ = auVar26._4_4_ * 0.0 + auVar24._4_4_ + auVar22._4_4_ * 0.0;
      auVar144._8_4_ = auVar26._8_4_ * 0.0 + auVar24._8_4_ + auVar22._8_4_ * 0.0;
      auVar144._12_4_ = auVar26._12_4_ * 0.0 + auVar24._12_4_ + auVar22._12_4_ * 0.0;
      auVar144._16_4_ = auVar26._16_4_ * 0.0 + auVar24._16_4_ + auVar22._16_4_ * 0.0;
      auVar144._20_4_ = auVar26._20_4_ * 0.0 + auVar24._20_4_ + auVar22._20_4_ * 0.0;
      auVar144._24_4_ = auVar26._24_4_ * 0.0 + auVar24._24_4_ + auVar22._24_4_ * 0.0;
      auVar144._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar22._28_4_;
      auVar22 = vcmpps_avx(auVar144,ZEXT432(0) << 0x20,2);
      auVar233 = vblendvps_avx(auVar233,_local_760,auVar22);
      auVar23 = vblendvps_avx(auVar23,_local_6a0,auVar22);
      auVar24 = vblendvps_avx(auVar139,auVar277,auVar22);
      auVar25 = vblendvps_avx(auVar28,auVar321,auVar22);
      auVar26 = vblendvps_avx(auVar29,auVar330,auVar22);
      auVar27 = vblendvps_avx(auVar30,auVar363,auVar22);
      auVar28 = vblendvps_avx(auVar321,auVar28,auVar22);
      auVar29 = vblendvps_avx(auVar330,auVar29,auVar22);
      auVar222 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
      auStack_6d0 = auVar345._16_16_;
      auVar30 = vblendvps_avx(auVar363,auVar30,auVar22);
      auVar28 = vsubps_avx(auVar28,auVar233);
      auVar140 = vsubps_avx(auVar29,auVar23);
      auVar30 = vsubps_avx(auVar30,auVar24);
      auVar141 = vsubps_avx(auVar23,auVar26);
      fVar267 = auVar140._0_4_;
      fVar164 = auVar24._0_4_;
      fVar272 = auVar140._4_4_;
      fVar217 = auVar24._4_4_;
      auVar51._4_4_ = fVar217 * fVar272;
      auVar51._0_4_ = fVar164 * fVar267;
      fVar287 = auVar140._8_4_;
      fVar234 = auVar24._8_4_;
      auVar51._8_4_ = fVar234 * fVar287;
      fVar236 = auVar140._12_4_;
      fVar235 = auVar24._12_4_;
      auVar51._12_4_ = fVar235 * fVar236;
      fVar165 = auVar140._16_4_;
      fVar168 = auVar24._16_4_;
      auVar51._16_4_ = fVar168 * fVar165;
      fVar317 = auVar140._20_4_;
      fVar170 = auVar24._20_4_;
      auVar51._20_4_ = fVar170 * fVar317;
      fVar154 = auVar140._24_4_;
      fVar169 = auVar24._24_4_;
      auVar51._24_4_ = fVar169 * fVar154;
      auVar51._28_4_ = auVar29._28_4_;
      fVar268 = auVar23._0_4_;
      fVar240 = auVar30._0_4_;
      fVar273 = auVar23._4_4_;
      fVar255 = auVar30._4_4_;
      auVar52._4_4_ = fVar255 * fVar273;
      auVar52._0_4_ = fVar240 * fVar268;
      fVar288 = auVar23._8_4_;
      fVar257 = auVar30._8_4_;
      auVar52._8_4_ = fVar257 * fVar288;
      fVar303 = auVar23._12_4_;
      fVar274 = auVar30._12_4_;
      auVar52._12_4_ = fVar274 * fVar303;
      fVar315 = auVar23._16_4_;
      fVar282 = auVar30._16_4_;
      auVar52._16_4_ = fVar282 * fVar315;
      fVar327 = auVar23._20_4_;
      fVar284 = auVar30._20_4_;
      auVar52._20_4_ = fVar284 * fVar327;
      fVar156 = auVar23._24_4_;
      fVar286 = auVar30._24_4_;
      uVar7 = auVar139._28_4_;
      auVar52._24_4_ = fVar286 * fVar156;
      auVar52._28_4_ = uVar7;
      auVar29 = vsubps_avx(auVar52,auVar51);
      fVar269 = auVar233._0_4_;
      fVar281 = auVar233._4_4_;
      auVar53._4_4_ = fVar255 * fVar281;
      auVar53._0_4_ = fVar240 * fVar269;
      fVar289 = auVar233._8_4_;
      auVar53._8_4_ = fVar257 * fVar289;
      fVar313 = auVar233._12_4_;
      auVar53._12_4_ = fVar274 * fVar313;
      fVar316 = auVar233._16_4_;
      auVar53._16_4_ = fVar282 * fVar316;
      fVar238 = auVar233._20_4_;
      auVar53._20_4_ = fVar284 * fVar238;
      fVar158 = auVar233._24_4_;
      auVar53._24_4_ = fVar286 * fVar158;
      auVar53._28_4_ = uVar7;
      fVar270 = auVar28._0_4_;
      fVar283 = auVar28._4_4_;
      auVar54._4_4_ = fVar217 * fVar283;
      auVar54._0_4_ = fVar164 * fVar270;
      fVar310 = auVar28._8_4_;
      auVar54._8_4_ = fVar234 * fVar310;
      fVar314 = auVar28._12_4_;
      auVar54._12_4_ = fVar235 * fVar314;
      fVar237 = auVar28._16_4_;
      auVar54._16_4_ = fVar168 * fVar237;
      fVar193 = auVar28._20_4_;
      auVar54._20_4_ = fVar170 * fVar193;
      fVar160 = auVar28._24_4_;
      auVar54._24_4_ = fVar169 * fVar160;
      auVar54._28_4_ = auVar363._28_4_;
      auVar139 = vsubps_avx(auVar54,auVar53);
      auVar55._4_4_ = fVar273 * fVar283;
      auVar55._0_4_ = fVar268 * fVar270;
      auVar55._8_4_ = fVar288 * fVar310;
      auVar55._12_4_ = fVar303 * fVar314;
      auVar55._16_4_ = fVar315 * fVar237;
      auVar55._20_4_ = fVar327 * fVar193;
      auVar55._24_4_ = fVar156 * fVar160;
      auVar55._28_4_ = uVar7;
      auVar368._0_4_ = fVar269 * fVar267;
      auVar368._4_4_ = fVar281 * fVar272;
      auVar368._8_4_ = fVar289 * fVar287;
      auVar368._12_4_ = fVar313 * fVar236;
      auVar368._16_4_ = fVar316 * fVar165;
      auVar368._20_4_ = fVar238 * fVar317;
      auVar368._24_4_ = fVar158 * fVar154;
      auVar368._28_4_ = 0;
      auVar175 = vsubps_avx(auVar368,auVar55);
      auVar176 = vsubps_avx(auVar24,auVar27);
      fVar271 = auVar175._28_4_ + auVar139._28_4_;
      auVar180._0_4_ = auVar175._0_4_ + auVar139._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
      auVar180._4_4_ = auVar175._4_4_ + auVar139._4_4_ * 0.0 + auVar29._4_4_ * 0.0;
      auVar180._8_4_ = auVar175._8_4_ + auVar139._8_4_ * 0.0 + auVar29._8_4_ * 0.0;
      auVar180._12_4_ = auVar175._12_4_ + auVar139._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
      auVar180._16_4_ = auVar175._16_4_ + auVar139._16_4_ * 0.0 + auVar29._16_4_ * 0.0;
      auVar180._20_4_ = auVar175._20_4_ + auVar139._20_4_ * 0.0 + auVar29._20_4_ * 0.0;
      auVar180._24_4_ = auVar175._24_4_ + auVar139._24_4_ * 0.0 + auVar29._24_4_ * 0.0;
      auVar180._28_4_ = fVar271 + auVar29._28_4_;
      fVar187 = auVar141._0_4_;
      fVar305 = auVar141._4_4_;
      auVar56._4_4_ = fVar305 * auVar27._4_4_;
      auVar56._0_4_ = fVar187 * auVar27._0_4_;
      fVar190 = auVar141._8_4_;
      auVar56._8_4_ = fVar190 * auVar27._8_4_;
      fVar239 = auVar141._12_4_;
      auVar56._12_4_ = fVar239 * auVar27._12_4_;
      fVar254 = auVar141._16_4_;
      auVar56._16_4_ = fVar254 * auVar27._16_4_;
      fVar256 = auVar141._20_4_;
      auVar56._20_4_ = fVar256 * auVar27._20_4_;
      fVar258 = auVar141._24_4_;
      auVar56._24_4_ = fVar258 * auVar27._24_4_;
      auVar56._28_4_ = fVar271;
      fVar271 = auVar176._0_4_;
      fVar285 = auVar176._4_4_;
      auVar57._4_4_ = auVar26._4_4_ * fVar285;
      auVar57._0_4_ = auVar26._0_4_ * fVar271;
      fVar312 = auVar176._8_4_;
      auVar57._8_4_ = auVar26._8_4_ * fVar312;
      fVar162 = auVar176._12_4_;
      auVar57._12_4_ = auVar26._12_4_ * fVar162;
      fVar304 = auVar176._16_4_;
      auVar57._16_4_ = auVar26._16_4_ * fVar304;
      fVar136 = auVar176._20_4_;
      auVar57._20_4_ = auVar26._20_4_ * fVar136;
      fVar167 = auVar176._24_4_;
      auVar57._24_4_ = auVar26._24_4_ * fVar167;
      auVar57._28_4_ = auVar175._28_4_;
      auVar139 = vsubps_avx(auVar57,auVar56);
      auVar141 = vsubps_avx(auVar233,auVar25);
      fVar259 = auVar141._0_4_;
      fVar300 = auVar141._4_4_;
      auVar58._4_4_ = fVar300 * auVar27._4_4_;
      auVar58._0_4_ = fVar259 * auVar27._0_4_;
      fVar301 = auVar141._8_4_;
      auVar58._8_4_ = fVar301 * auVar27._8_4_;
      fVar302 = auVar141._12_4_;
      auVar58._12_4_ = fVar302 * auVar27._12_4_;
      fVar318 = auVar141._16_4_;
      auVar58._16_4_ = fVar318 * auVar27._16_4_;
      fVar325 = auVar141._20_4_;
      auVar58._20_4_ = fVar325 * auVar27._20_4_;
      fVar326 = auVar141._24_4_;
      auVar58._24_4_ = fVar326 * auVar27._24_4_;
      auVar58._28_4_ = auVar27._28_4_;
      auVar59._4_4_ = auVar25._4_4_ * fVar285;
      auVar59._0_4_ = auVar25._0_4_ * fVar271;
      auVar59._8_4_ = auVar25._8_4_ * fVar312;
      auVar59._12_4_ = auVar25._12_4_ * fVar162;
      auVar59._16_4_ = auVar25._16_4_ * fVar304;
      auVar59._20_4_ = auVar25._20_4_ * fVar136;
      auVar59._24_4_ = auVar25._24_4_ * fVar167;
      auVar59._28_4_ = auVar29._28_4_;
      auVar29 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = auVar26._4_4_ * fVar300;
      auVar60._0_4_ = auVar26._0_4_ * fVar259;
      auVar60._8_4_ = auVar26._8_4_ * fVar301;
      auVar60._12_4_ = auVar26._12_4_ * fVar302;
      auVar60._16_4_ = auVar26._16_4_ * fVar318;
      auVar60._20_4_ = auVar26._20_4_ * fVar325;
      auVar60._24_4_ = auVar26._24_4_ * fVar326;
      auVar60._28_4_ = auVar27._28_4_;
      auVar61._4_4_ = auVar25._4_4_ * fVar305;
      auVar61._0_4_ = auVar25._0_4_ * fVar187;
      auVar61._8_4_ = auVar25._8_4_ * fVar190;
      auVar61._12_4_ = auVar25._12_4_ * fVar239;
      auVar61._16_4_ = auVar25._16_4_ * fVar254;
      auVar61._20_4_ = auVar25._20_4_ * fVar256;
      auVar61._24_4_ = auVar25._24_4_ * fVar258;
      auVar61._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar61,auVar60);
      auVar250._0_4_ = auVar139._0_4_ * 0.0 + auVar25._0_4_ + auVar29._0_4_ * 0.0;
      auVar250._4_4_ = auVar139._4_4_ * 0.0 + auVar25._4_4_ + auVar29._4_4_ * 0.0;
      auVar250._8_4_ = auVar139._8_4_ * 0.0 + auVar25._8_4_ + auVar29._8_4_ * 0.0;
      auVar250._12_4_ = auVar139._12_4_ * 0.0 + auVar25._12_4_ + auVar29._12_4_ * 0.0;
      auVar250._16_4_ = auVar139._16_4_ * 0.0 + auVar25._16_4_ + auVar29._16_4_ * 0.0;
      auVar250._20_4_ = auVar139._20_4_ * 0.0 + auVar25._20_4_ + auVar29._20_4_ * 0.0;
      auVar250._24_4_ = auVar139._24_4_ * 0.0 + auVar25._24_4_ + auVar29._24_4_ * 0.0;
      auVar250._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar29._28_4_;
      auVar253 = ZEXT3264(auVar250);
      auVar25 = vmaxps_avx(auVar180,auVar250);
      auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
      auVar200 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
      auVar222 = vpand_avx(auVar200,auVar222);
      auVar200 = vpmovsxwd_avx(auVar222);
      auVar221 = vpunpckhwd_avx(auVar222,auVar222);
      auVar228._16_16_ = auVar221;
      auVar228._0_16_ = auVar200;
      if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar228 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar228 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar228 >> 0x7f,0) == '\0') &&
            (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar221 >> 0x3f,0) == '\0') &&
          (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar221[0xf]
         ) {
LAB_0098aae9:
        auVar186 = ZEXT3264(CONCAT824(local_5a0[1]._24_8_,
                                      CONCAT816(local_5a0[1]._16_8_,
                                                CONCAT88(local_5a0[1]._8_8_,local_5a0[1]._0_8_))));
        auVar333 = ZEXT3264(auVar146);
        auVar337._4_4_ = fVar153;
        auVar337._0_4_ = fVar135;
        auVar337._8_4_ = fVar155;
        auVar337._12_4_ = fVar157;
        auVar337._16_4_ = fVar159;
        auVar337._20_4_ = fVar161;
        auVar337._24_4_ = fVar163;
        auVar337._28_4_ = fVar166;
      }
      else {
        auVar62._4_4_ = fVar285 * fVar272;
        auVar62._0_4_ = fVar271 * fVar267;
        auVar62._8_4_ = fVar312 * fVar287;
        auVar62._12_4_ = fVar162 * fVar236;
        auVar62._16_4_ = fVar304 * fVar165;
        auVar62._20_4_ = fVar136 * fVar317;
        auVar62._24_4_ = fVar167 * fVar154;
        auVar62._28_4_ = auVar221._12_4_;
        auVar346._0_4_ = fVar187 * fVar240;
        auVar346._4_4_ = fVar305 * fVar255;
        auVar346._8_4_ = fVar190 * fVar257;
        auVar346._12_4_ = fVar239 * fVar274;
        auVar346._16_4_ = fVar254 * fVar282;
        auVar346._20_4_ = fVar256 * fVar284;
        auVar346._24_4_ = fVar258 * fVar286;
        auVar346._28_4_ = 0;
        auVar25 = vsubps_avx(auVar346,auVar62);
        auVar63._4_4_ = fVar300 * fVar255;
        auVar63._0_4_ = fVar259 * fVar240;
        auVar63._8_4_ = fVar301 * fVar257;
        auVar63._12_4_ = fVar302 * fVar274;
        auVar63._16_4_ = fVar318 * fVar282;
        auVar63._20_4_ = fVar325 * fVar284;
        auVar63._24_4_ = fVar326 * fVar286;
        auVar63._28_4_ = auVar30._28_4_;
        auVar64._4_4_ = fVar285 * fVar283;
        auVar64._0_4_ = fVar271 * fVar270;
        auVar64._8_4_ = fVar312 * fVar310;
        auVar64._12_4_ = fVar162 * fVar314;
        auVar64._16_4_ = fVar304 * fVar237;
        auVar64._20_4_ = fVar136 * fVar193;
        auVar64._24_4_ = fVar167 * fVar160;
        auVar64._28_4_ = auVar176._28_4_;
        auVar27 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = fVar305 * fVar283;
        auVar65._0_4_ = fVar187 * fVar270;
        auVar65._8_4_ = fVar190 * fVar310;
        auVar65._12_4_ = fVar239 * fVar314;
        auVar65._16_4_ = fVar254 * fVar237;
        auVar65._20_4_ = fVar256 * fVar193;
        auVar65._24_4_ = fVar258 * fVar160;
        auVar65._28_4_ = auVar180._28_4_;
        auVar66._4_4_ = fVar300 * fVar272;
        auVar66._0_4_ = fVar259 * fVar267;
        auVar66._8_4_ = fVar301 * fVar287;
        auVar66._12_4_ = fVar302 * fVar236;
        auVar66._16_4_ = fVar318 * fVar165;
        auVar66._20_4_ = fVar325 * fVar317;
        auVar66._24_4_ = fVar326 * fVar154;
        auVar66._28_4_ = auVar140._28_4_;
        auVar29 = vsubps_avx(auVar66,auVar65);
        auVar298._0_4_ = auVar25._0_4_ * 0.0 + auVar29._0_4_ + auVar27._0_4_ * 0.0;
        auVar298._4_4_ = auVar25._4_4_ * 0.0 + auVar29._4_4_ + auVar27._4_4_ * 0.0;
        auVar298._8_4_ = auVar25._8_4_ * 0.0 + auVar29._8_4_ + auVar27._8_4_ * 0.0;
        auVar298._12_4_ = auVar25._12_4_ * 0.0 + auVar29._12_4_ + auVar27._12_4_ * 0.0;
        auVar298._16_4_ = auVar25._16_4_ * 0.0 + auVar29._16_4_ + auVar27._16_4_ * 0.0;
        auVar298._20_4_ = auVar25._20_4_ * 0.0 + auVar29._20_4_ + auVar27._20_4_ * 0.0;
        auVar298._24_4_ = auVar25._24_4_ * 0.0 + auVar29._24_4_ + auVar27._24_4_ * 0.0;
        auVar298._28_4_ = auVar140._28_4_ + auVar29._28_4_ + auVar180._28_4_;
        auVar26 = vrcpps_avx(auVar298);
        fVar267 = auVar26._0_4_;
        fVar270 = auVar26._4_4_;
        auVar67._4_4_ = auVar298._4_4_ * fVar270;
        auVar67._0_4_ = auVar298._0_4_ * fVar267;
        fVar271 = auVar26._8_4_;
        auVar67._8_4_ = auVar298._8_4_ * fVar271;
        fVar272 = auVar26._12_4_;
        auVar67._12_4_ = auVar298._12_4_ * fVar272;
        fVar283 = auVar26._16_4_;
        auVar67._16_4_ = auVar298._16_4_ * fVar283;
        fVar285 = auVar26._20_4_;
        auVar67._20_4_ = auVar298._20_4_ * fVar285;
        fVar287 = auVar26._24_4_;
        auVar67._24_4_ = auVar298._24_4_ * fVar287;
        auVar67._28_4_ = auVar176._28_4_;
        auVar347._8_4_ = 0x3f800000;
        auVar347._0_8_ = 0x3f8000003f800000;
        auVar347._12_4_ = 0x3f800000;
        auVar347._16_4_ = 0x3f800000;
        auVar347._20_4_ = 0x3f800000;
        auVar347._24_4_ = 0x3f800000;
        auVar347._28_4_ = 0x3f800000;
        auVar30 = vsubps_avx(auVar347,auVar67);
        fVar267 = auVar30._0_4_ * fVar267 + fVar267;
        fVar270 = auVar30._4_4_ * fVar270 + fVar270;
        fVar271 = auVar30._8_4_ * fVar271 + fVar271;
        fVar272 = auVar30._12_4_ * fVar272 + fVar272;
        fVar283 = auVar30._16_4_ * fVar283 + fVar283;
        fVar285 = auVar30._20_4_ * fVar285 + fVar285;
        fVar287 = auVar30._24_4_ * fVar287 + fVar287;
        auVar68._4_4_ =
             (auVar25._4_4_ * fVar281 + auVar27._4_4_ * fVar273 + auVar29._4_4_ * fVar217) * fVar270
        ;
        auVar68._0_4_ =
             (auVar25._0_4_ * fVar269 + auVar27._0_4_ * fVar268 + auVar29._0_4_ * fVar164) * fVar267
        ;
        auVar68._8_4_ =
             (auVar25._8_4_ * fVar289 + auVar27._8_4_ * fVar288 + auVar29._8_4_ * fVar234) * fVar271
        ;
        auVar68._12_4_ =
             (auVar25._12_4_ * fVar313 + auVar27._12_4_ * fVar303 + auVar29._12_4_ * fVar235) *
             fVar272;
        auVar68._16_4_ =
             (auVar25._16_4_ * fVar316 + auVar27._16_4_ * fVar315 + auVar29._16_4_ * fVar168) *
             fVar283;
        auVar68._20_4_ =
             (auVar25._20_4_ * fVar238 + auVar27._20_4_ * fVar327 + auVar29._20_4_ * fVar170) *
             fVar285;
        auVar68._24_4_ =
             (auVar25._24_4_ * fVar158 + auVar27._24_4_ * fVar156 + auVar29._24_4_ * fVar169) *
             fVar287;
        auVar68._28_4_ = auVar28._28_4_ + auVar24._28_4_;
        auVar200 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
        auVar145._16_16_ = auVar200;
        auVar145._0_16_ = auVar200;
        auVar24 = vcmpps_avx(auVar145,auVar68,2);
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar229._4_4_ = uVar7;
        auVar229._0_4_ = uVar7;
        auVar229._8_4_ = uVar7;
        auVar229._12_4_ = uVar7;
        auVar229._16_4_ = uVar7;
        auVar229._20_4_ = uVar7;
        auVar229._24_4_ = uVar7;
        auVar229._28_4_ = uVar7;
        auVar25 = vcmpps_avx(auVar68,auVar229,2);
        auVar24 = vandps_avx(auVar25,auVar24);
        auVar200 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar222 = vpand_avx(auVar222,auVar200);
        auVar200 = vpmovsxwd_avx(auVar222);
        auVar221 = vpshufd_avx(auVar222,0xee);
        auVar221 = vpmovsxwd_avx(auVar221);
        auVar230._16_16_ = auVar221;
        auVar230._0_16_ = auVar200;
        if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar230 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar230 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar230 >> 0x7f,0) == '\0') &&
              (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar221 >> 0x3f,0) == '\0') &&
            (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar221[0xf]) goto LAB_0098aae9;
        auVar24 = vcmpps_avx(ZEXT832(0) << 0x20,auVar298,4);
        auVar200 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar222 = vpand_avx(auVar222,auVar200);
        auVar200 = vpmovsxwd_avx(auVar222);
        auVar222 = vpunpckhwd_avx(auVar222,auVar222);
        auVar278._16_16_ = auVar222;
        auVar278._0_16_ = auVar200;
        auVar186 = ZEXT3264(CONCAT824(local_5a0[1]._24_8_,
                                      CONCAT816(local_5a0[1]._16_8_,
                                                CONCAT88(local_5a0[1]._8_8_,local_5a0[1]._0_8_))));
        auVar333 = ZEXT3264(auVar146);
        auVar337._4_4_ = fVar153;
        auVar337._0_4_ = fVar135;
        auVar337._8_4_ = fVar155;
        auVar337._12_4_ = fVar157;
        auVar337._16_4_ = fVar159;
        auVar337._20_4_ = fVar161;
        auVar337._24_4_ = fVar163;
        auVar337._28_4_ = fVar166;
        if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar278 >> 0x7f,0) != '\0') ||
              (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar222 >> 0x3f,0) != '\0') ||
            (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar222[0xf] < '\0') {
          auVar69._4_4_ = auVar180._4_4_ * fVar270;
          auVar69._0_4_ = auVar180._0_4_ * fVar267;
          auVar69._8_4_ = auVar180._8_4_ * fVar271;
          auVar69._12_4_ = auVar180._12_4_ * fVar272;
          auVar69._16_4_ = auVar180._16_4_ * fVar283;
          auVar69._20_4_ = auVar180._20_4_ * fVar285;
          auVar69._24_4_ = auVar180._24_4_ * fVar287;
          auVar69._28_4_ = SUB84(local_5a0[1]._24_8_,4);
          auVar70._4_4_ = auVar250._4_4_ * fVar270;
          auVar70._0_4_ = auVar250._0_4_ * fVar267;
          auVar70._8_4_ = auVar250._8_4_ * fVar271;
          auVar70._12_4_ = auVar250._12_4_ * fVar272;
          auVar70._16_4_ = auVar250._16_4_ * fVar283;
          auVar70._20_4_ = auVar250._20_4_ * fVar285;
          auVar70._24_4_ = auVar250._24_4_ * fVar287;
          auVar70._28_4_ = auVar30._28_4_ + auVar26._28_4_;
          auVar251._8_4_ = 0x3f800000;
          auVar251._0_8_ = 0x3f8000003f800000;
          auVar251._12_4_ = 0x3f800000;
          auVar251._16_4_ = 0x3f800000;
          auVar251._20_4_ = 0x3f800000;
          auVar251._24_4_ = 0x3f800000;
          auVar251._28_4_ = 0x3f800000;
          auVar253 = ZEXT3264(auVar251);
          auVar146 = vsubps_avx(auVar251,auVar69);
          auVar146 = vblendvps_avx(auVar146,auVar69,auVar22);
          auVar333 = ZEXT3264(auVar146);
          auVar146 = vsubps_avx(auVar251,auVar70);
          _local_380 = vblendvps_avx(auVar146,auVar70,auVar22);
          auVar186 = ZEXT3264(auVar278);
          local_4c0 = auVar68;
        }
      }
      auVar350 = ZEXT3264(_local_820);
      auVar324 = ZEXT3264(_local_660);
      auVar146 = auVar186._0_32_;
      if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar146 >> 0x7f,0) == '\0') &&
            (auVar186 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar146 >> 0xbf,0) == '\0') &&
          (auVar186 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar186[0x1f]) goto LAB_0098961c;
      auVar24 = vsubps_avx(local_6c0,auVar337);
      fVar268 = auVar337._0_4_ + auVar333._0_4_ * auVar24._0_4_;
      fVar269 = auVar337._4_4_ + auVar333._4_4_ * auVar24._4_4_;
      fVar270 = auVar337._8_4_ + auVar333._8_4_ * auVar24._8_4_;
      fVar271 = auVar337._12_4_ + auVar333._12_4_ * auVar24._12_4_;
      fVar272 = auVar337._16_4_ + auVar333._16_4_ * auVar24._16_4_;
      fVar273 = auVar337._20_4_ + auVar333._20_4_ * auVar24._20_4_;
      fVar281 = auVar337._24_4_ + auVar333._24_4_ * auVar24._24_4_;
      fVar283 = auVar337._28_4_ + auVar24._28_4_;
      fVar267 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
      auVar71._4_4_ = (fVar269 + fVar269) * fVar267;
      auVar71._0_4_ = (fVar268 + fVar268) * fVar267;
      auVar71._8_4_ = (fVar270 + fVar270) * fVar267;
      auVar71._12_4_ = (fVar271 + fVar271) * fVar267;
      auVar71._16_4_ = (fVar272 + fVar272) * fVar267;
      auVar71._20_4_ = (fVar273 + fVar273) * fVar267;
      auVar71._24_4_ = (fVar281 + fVar281) * fVar267;
      auVar71._28_4_ = fVar283 + fVar283;
      auVar253 = ZEXT3264(local_4c0);
      auVar24 = vcmpps_avx(local_4c0,auVar71,6);
      auVar25 = auVar146 & auVar24;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
        local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
        uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
        uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
        uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
        uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
        uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
        uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
        local_800 = auVar333._0_32_;
        local_280 = local_800;
        auVar124 = _local_380;
        auVar25 = _local_380;
        local_260 = (float)local_380._0_4_;
        fStack_25c = (float)local_380._4_4_;
        fStack_258 = (float)uStack_378;
        fStack_254 = uStack_378._4_4_;
        fStack_250 = (float)uStack_370;
        fStack_24c = uStack_370._4_4_;
        fStack_248 = (float)uStack_368;
        fStack_244 = uStack_368._4_4_;
        local_240 = local_4c0;
        local_220 = 0;
        local_6c0._0_4_ = uVar18;
        local_21c = uVar18;
        local_210 = local_8d0;
        fStack_20c = fStack_8cc;
        fStack_208 = fStack_8c8;
        fStack_204 = fStack_8c4;
        local_200 = local_7c0;
        uStack_1f8 = uStack_7b8;
        local_1f0 = local_7d0;
        uStack_1e8 = uStack_7c8;
        local_1e0 = local_7e0;
        uStack_1d8 = uStack_7d8;
        _local_380 = auVar25;
        if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          local_5a0[0] = vandps_avx(auVar24,auVar146);
          auVar197._0_4_ = 1.0 / auVar220._0_4_;
          auVar197._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar222 = vshufps_avx(auVar197,auVar197,0);
          local_1a0[0] = auVar222._0_4_ * (auVar333._0_4_ + 0.0);
          local_1a0[1] = auVar222._4_4_ * (auVar333._4_4_ + 1.0);
          local_1a0[2] = auVar222._8_4_ * (auVar333._8_4_ + 2.0);
          local_1a0[3] = auVar222._12_4_ * (auVar333._12_4_ + 3.0);
          fStack_190 = auVar222._0_4_ * (auVar333._16_4_ + 4.0);
          fStack_18c = auVar222._4_4_ * (auVar333._20_4_ + 5.0);
          fStack_188 = auVar222._8_4_ * (auVar333._24_4_ + 6.0);
          fStack_184 = auVar333._28_4_ + 7.0;
          uStack_370 = auVar124._16_8_;
          uStack_368 = auVar25._24_8_;
          local_180 = local_380;
          uStack_178 = uStack_378;
          uStack_170 = uStack_370;
          uStack_168 = uStack_368;
          local_160 = local_4c0;
          auVar181._8_4_ = 0x7f800000;
          auVar181._0_8_ = 0x7f8000007f800000;
          auVar181._12_4_ = 0x7f800000;
          auVar181._16_4_ = 0x7f800000;
          auVar181._20_4_ = 0x7f800000;
          auVar181._24_4_ = 0x7f800000;
          auVar181._28_4_ = 0x7f800000;
          auVar146 = vblendvps_avx(auVar181,local_4c0,local_5a0[0]);
          auVar24 = vshufps_avx(auVar146,auVar146,0xb1);
          auVar24 = vminps_avx(auVar146,auVar24);
          auVar25 = vshufpd_avx(auVar24,auVar24,5);
          auVar24 = vminps_avx(auVar24,auVar25);
          auVar25 = vperm2f128_avx(auVar24,auVar24,1);
          auVar24 = vminps_avx(auVar24,auVar25);
          auVar24 = vcmpps_avx(auVar146,auVar24,0);
          auVar25 = local_5a0[0] & auVar24;
          auVar146 = local_5a0[0];
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            auVar146 = vandps_avx(auVar24,local_5a0[0]);
          }
          uVar127 = vmovmskps_avx(auVar146);
          uVar126 = 0;
          if (uVar127 != 0) {
            for (; (uVar127 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
            }
          }
          uVar130 = (ulong)uVar126;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar194 = local_1a0[uVar130];
            uVar7 = *(undefined4 *)((long)&local_180 + uVar130 * 4);
            fVar210 = 1.0 - fVar194;
            fVar208 = fVar194 * fVar210 + fVar194 * fVar210;
            auVar222 = ZEXT416((uint)(fVar194 * fVar194 * 3.0));
            auVar222 = vshufps_avx(auVar222,auVar222,0);
            auVar200 = ZEXT416((uint)((fVar208 - fVar194 * fVar194) * 3.0));
            auVar200 = vshufps_avx(auVar200,auVar200,0);
            auVar221 = ZEXT416((uint)((fVar210 * fVar210 - fVar208) * 3.0));
            auVar221 = vshufps_avx(auVar221,auVar221,0);
            fVar208 = auVar221._0_4_ * (float)local_7c0._0_4_;
            fVar212 = auVar221._4_4_ * (float)local_7c0._4_4_;
            fVar267 = auVar221._8_4_ * (float)uStack_7b8;
            fVar268 = auVar221._12_4_ * uStack_7b8._4_4_;
            auVar253 = ZEXT1664(CONCAT412(fVar268,CONCAT48(fVar267,CONCAT44(fVar212,fVar208))));
            auVar221 = ZEXT416((uint)(fVar210 * fVar210 * -3.0));
            auVar221 = vshufps_avx(auVar221,auVar221,0);
            auVar198._0_4_ =
                 local_8d0 * auVar221._0_4_ +
                 fVar208 + auVar222._0_4_ * (float)local_7e0._0_4_ +
                           auVar200._0_4_ * (float)local_7d0._0_4_;
            auVar198._4_4_ =
                 fStack_8cc * auVar221._4_4_ +
                 fVar212 + auVar222._4_4_ * (float)local_7e0._4_4_ +
                           auVar200._4_4_ * (float)local_7d0._4_4_;
            auVar198._8_4_ =
                 fStack_8c8 * auVar221._8_4_ +
                 fVar267 + auVar222._8_4_ * (float)uStack_7d8 + auVar200._8_4_ * (float)uStack_7c8;
            auVar198._12_4_ =
                 fStack_8c4 * auVar221._12_4_ +
                 fVar268 + auVar222._12_4_ * uStack_7d8._4_4_ + auVar200._12_4_ * uStack_7c8._4_4_;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar130 * 4);
            *(float *)(ray + k * 4 + 0xc0) = auVar198._0_4_;
            uVar19 = vextractps_avx(auVar198,1);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar19;
            uVar19 = vextractps_avx(auVar198,2);
            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
            *(float *)(ray + k * 4 + 0xf0) = fVar194;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(uint *)(ray + k * 4 + 0x110) = uVar125;
            *(uint *)(ray + k * 4 + 0x120) = uVar17;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            local_680 = vpermilps_avx(_local_480,0);
            auStack_670 = auVar233._16_16_;
            local_5c0._0_16_ = vpermilps_avx(ZEXT416(uVar125),0);
            local_5c0._16_16_ = auVar23._16_16_;
            _auStack_5d0 = auVar248._16_16_;
            _local_5e0 = *local_6f8;
            local_6e0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            local_6f0 = k;
            local_6e8 = ray;
            fStack_55c = auVar343._4_4_;
            fStack_558 = auVar343._8_4_;
            fStack_554 = auVar343._12_4_;
            while( true ) {
              local_400 = local_1a0[uVar130];
              local_3f0 = *(undefined4 *)((long)&local_180 + uVar130 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar130 * 4);
              fVar208 = 1.0 - local_400;
              fVar194 = local_400 * fVar208 + local_400 * fVar208;
              auVar222 = ZEXT416((uint)(local_400 * local_400 * 3.0));
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              auVar200 = ZEXT416((uint)((fVar194 - local_400 * local_400) * 3.0));
              auVar200 = vshufps_avx(auVar200,auVar200,0);
              auVar246._0_4_ =
                   auVar222._0_4_ * (float)local_7e0._0_4_ + auVar200._0_4_ * (float)local_7d0._0_4_
              ;
              auVar246._4_4_ =
                   auVar222._4_4_ * (float)local_7e0._4_4_ + auVar200._4_4_ * (float)local_7d0._4_4_
              ;
              auVar246._8_4_ =
                   auVar222._8_4_ * (float)uStack_7d8 + auVar200._8_4_ * (float)uStack_7c8;
              auVar246._12_4_ =
                   auVar222._12_4_ * uStack_7d8._4_4_ + auVar200._12_4_ * uStack_7c8._4_4_;
              auVar253 = ZEXT1664(auVar246);
              auVar222 = ZEXT416((uint)((fVar208 * fVar208 - fVar194) * 3.0));
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              local_7b0.context = context->user;
              auVar200 = ZEXT416((uint)(fVar208 * fVar208 * -3.0));
              auVar200 = vshufps_avx(auVar200,auVar200,0);
              auVar203._0_4_ =
                   local_8d0 * auVar200._0_4_ +
                   auVar222._0_4_ * (float)local_7c0._0_4_ + auVar246._0_4_;
              auVar203._4_4_ =
                   fStack_8cc * auVar200._4_4_ +
                   auVar222._4_4_ * (float)local_7c0._4_4_ + auVar246._4_4_;
              auVar203._8_4_ =
                   fStack_8c8 * auVar200._8_4_ + auVar222._8_4_ * (float)uStack_7b8 + auVar246._8_4_
              ;
              auVar203._12_4_ =
                   fStack_8c4 * auVar200._12_4_ +
                   auVar222._12_4_ * uStack_7b8._4_4_ + auVar246._12_4_;
              auVar222 = vshufps_avx(auVar203,auVar203,0);
              local_430[0] = (RTCHitN)auVar222[0];
              local_430[1] = (RTCHitN)auVar222[1];
              local_430[2] = (RTCHitN)auVar222[2];
              local_430[3] = (RTCHitN)auVar222[3];
              local_430[4] = (RTCHitN)auVar222[4];
              local_430[5] = (RTCHitN)auVar222[5];
              local_430[6] = (RTCHitN)auVar222[6];
              local_430[7] = (RTCHitN)auVar222[7];
              local_430[8] = (RTCHitN)auVar222[8];
              local_430[9] = (RTCHitN)auVar222[9];
              local_430[10] = (RTCHitN)auVar222[10];
              local_430[0xb] = (RTCHitN)auVar222[0xb];
              local_430[0xc] = (RTCHitN)auVar222[0xc];
              local_430[0xd] = (RTCHitN)auVar222[0xd];
              local_430[0xe] = (RTCHitN)auVar222[0xe];
              local_430[0xf] = (RTCHitN)auVar222[0xf];
              auVar222 = vshufps_avx(auVar203,auVar203,0x55);
              local_420 = auVar222;
              local_410 = vshufps_avx(auVar203,auVar203,0xaa);
              fStack_3fc = local_400;
              fStack_3f8 = local_400;
              fStack_3f4 = local_400;
              uStack_3ec = local_3f0;
              uStack_3e8 = local_3f0;
              uStack_3e4 = local_3f0;
              local_3e0 = local_5c0._0_8_;
              uStack_3d8 = local_5c0._8_8_;
              local_3d0 = local_680;
              vcmpps_avx(ZEXT1632(local_680),ZEXT1632(local_680),0xf);
              uStack_3bc = (local_7b0.context)->instID[0];
              local_3c0 = uStack_3bc;
              uStack_3b8 = uStack_3bc;
              uStack_3b4 = uStack_3bc;
              uStack_3b0 = (local_7b0.context)->instPrimID[0];
              uStack_3ac = uStack_3b0;
              uStack_3a8 = uStack_3b0;
              uStack_3a4 = uStack_3b0;
              local_830 = _local_5e0;
              local_7b0.valid = (int *)local_830;
              local_7b0.geometryUserPtr = *(void **)(local_780._0_8_ + 0x18);
              local_7b0.hit = local_430;
              local_7b0.N = 4;
              local_7b0.ray = (RTCRayN *)ray;
              if (*(code **)(local_780._0_8_ + 0x40) != (code *)0x0) {
                auVar253 = ZEXT1664(auVar246);
                (**(code **)(local_780._0_8_ + 0x40))(&local_7b0);
                auVar324 = ZEXT3264(_local_660);
                auVar350 = ZEXT3264(_local_820);
                auVar333 = ZEXT3264(local_800);
                ray = local_6e8;
                k = local_6f0;
                fVar367 = (float)local_740._0_4_;
                fVar370 = (float)local_740._4_4_;
                fVar371 = fStack_738;
                fVar372 = fStack_734;
                fVar214 = fStack_730;
                fVar215 = fStack_72c;
                fVar216 = fStack_728;
                fVar260 = fStack_724;
              }
              if (local_830 == (undefined1  [16])0x0) {
                auVar222 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar222 = auVar222 ^ _DAT_01f46b70;
              }
              else {
                p_Var21 = context->args->filter;
                if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    ((*(byte *)(local_780._0_8_ + 0x3e) & 0x40) != 0)))) {
                  auVar253 = ZEXT1664(auVar253._0_16_);
                  (*p_Var21)(&local_7b0);
                  auVar324 = ZEXT3264(_local_660);
                  auVar350 = ZEXT3264(_local_820);
                  auVar333 = ZEXT3264(local_800);
                  ray = local_6e8;
                  k = local_6f0;
                  fVar367 = (float)local_740._0_4_;
                  fVar370 = (float)local_740._4_4_;
                  fVar371 = fStack_738;
                  fVar372 = fStack_734;
                  fVar214 = fStack_730;
                  fVar215 = fStack_72c;
                  fVar216 = fStack_728;
                  fVar260 = fStack_724;
                }
                auVar200 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                auVar221 = vpcmpeqd_avx(auVar222,auVar222);
                auVar222 = auVar200 ^ auVar221;
                if (local_830 != (undefined1  [16])0x0) {
                  auVar200 = auVar200 ^ auVar221;
                  auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])local_7b0.hit);
                  *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar221;
                  auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x10));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar221;
                  auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x20));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar221;
                  auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x30));
                  *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar221;
                  auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x40));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar221;
                  auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x50));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar221;
                  auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x60));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar221;
                  auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x70));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar221;
                  auVar200 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x80));
                  *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar200;
                }
              }
              auVar146 = local_4c0;
              auVar174._8_8_ = 0x100000001;
              auVar174._0_8_ = 0x100000001;
              if ((auVar174 & auVar222) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = local_6e0._0_4_;
                auVar222 = local_6e0;
              }
              else {
                auVar222 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_5a0[0] + uVar130 * 4) = 0;
              local_6e0 = auVar222;
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              auVar152._16_16_ = auVar222;
              auVar152._0_16_ = auVar222;
              auVar23 = vcmpps_avx(auVar146,auVar152,2);
              auVar233 = vandps_avx(auVar23,local_5a0[0]);
              local_5a0[0] = local_5a0[0] & auVar23;
              if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                    (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                  (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_5a0[0][0x1f]) break;
              auVar185._8_4_ = 0x7f800000;
              auVar185._0_8_ = 0x7f8000007f800000;
              auVar185._12_4_ = 0x7f800000;
              auVar185._16_4_ = 0x7f800000;
              auVar185._20_4_ = 0x7f800000;
              auVar185._24_4_ = 0x7f800000;
              auVar185._28_4_ = 0x7f800000;
              auVar146 = vblendvps_avx(auVar185,auVar146,auVar233);
              auVar23 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar23 = vminps_avx(auVar146,auVar23);
              auVar24 = vshufpd_avx(auVar23,auVar23,5);
              auVar23 = vminps_avx(auVar23,auVar24);
              auVar24 = vperm2f128_avx(auVar23,auVar23,1);
              auVar23 = vminps_avx(auVar23,auVar24);
              auVar23 = vcmpps_avx(auVar146,auVar23,0);
              auVar24 = auVar233 & auVar23;
              auVar146 = auVar233;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0x7f,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0xbf,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                auVar146 = vandps_avx(auVar23,auVar233);
              }
              uVar127 = vmovmskps_avx(auVar146);
              uVar126 = 0;
              if (uVar127 != 0) {
                for (; (uVar127 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                }
              }
              uVar130 = (ulong)uVar126;
              local_5a0[0] = auVar233;
            }
          }
        }
        uVar126 = local_6c0._0_4_;
        fVar188 = (float)local_720._0_4_;
        fVar189 = (float)local_720._4_4_;
        fVar191 = fStack_718;
        fVar192 = fStack_714;
        fVar194 = fStack_710;
        fVar208 = fStack_70c;
        fVar210 = fStack_708;
        fVar212 = fStack_704;
      }
    }
    auVar186 = ZEXT3264(local_540);
    auVar299 = ZEXT3264(_local_620);
    local_6e0._0_8_ = pPVar133;
    local_680._0_8_ = pLVar134;
    if (8 < (int)uVar126) {
      auVar222 = vpshufd_avx(ZEXT416(uVar126),0);
      local_320._0_16_ = auVar222;
      auVar222 = vshufps_avx(auVar244,auVar244,0);
      register0x00001210 = auVar222;
      _local_340 = auVar222;
      auVar222 = vpermilps_avx(local_640._0_16_,0);
      register0x00001210 = auVar222;
      _local_360 = auVar222;
      auVar138._0_4_ = 1.0 / local_560;
      auVar138._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar222 = vshufps_avx(auVar138,auVar138,0);
      register0x00001210 = auVar222;
      _local_100 = auVar222;
      local_290 = vpermilps_avx(_local_480,0);
      local_2a0 = vpermilps_avx(local_4a0._0_16_,0);
      local_6c0._0_4_ = uVar126;
      local_800 = auVar333._0_32_;
      _local_660 = auVar324._0_32_;
      for (lVar132 = 8; local_540 = auVar186._0_32_, lVar132 < (int)uVar18; lVar132 = lVar132 + 8) {
        pauVar1 = (undefined1 (*) [28])(bezier_basis0 + lVar132 * 4 + lVar129);
        fVar267 = *(float *)*pauVar1;
        fVar268 = *(float *)(*pauVar1 + 4);
        fVar269 = *(float *)(*pauVar1 + 8);
        fVar270 = *(float *)(*pauVar1 + 0xc);
        fVar271 = *(float *)(*pauVar1 + 0x10);
        fVar272 = *(float *)(*pauVar1 + 0x14);
        fVar273 = *(float *)(*pauVar1 + 0x18);
        auVar122 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar129 + 0x21fb768 + lVar132 * 4);
        fVar281 = *(float *)*pauVar1;
        fVar283 = *(float *)(*pauVar1 + 4);
        fVar285 = *(float *)(*pauVar1 + 8);
        fVar287 = *(float *)(*pauVar1 + 0xc);
        fVar288 = *(float *)(*pauVar1 + 0x10);
        fVar289 = *(float *)(*pauVar1 + 0x14);
        fVar310 = *(float *)(*pauVar1 + 0x18);
        auVar121 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar129 + 0x21fbbec + lVar132 * 4);
        fVar312 = *(float *)*pauVar1;
        fVar236 = *(float *)(*pauVar1 + 4);
        fVar303 = *(float *)(*pauVar1 + 8);
        fVar313 = *(float *)(*pauVar1 + 0xc);
        fVar314 = *(float *)(*pauVar1 + 0x10);
        fVar162 = *(float *)(*pauVar1 + 0x14);
        fVar165 = *(float *)(*pauVar1 + 0x18);
        auVar120 = *pauVar1;
        pfVar2 = (float *)(lVar129 + 0x21fc070 + lVar132 * 4);
        fVar315 = *pfVar2;
        fVar316 = pfVar2[1];
        fVar237 = pfVar2[2];
        fVar304 = pfVar2[3];
        fVar317 = pfVar2[4];
        fVar327 = pfVar2[5];
        fVar238 = pfVar2[6];
        fVar193 = pfVar2[7];
        fVar167 = fVar193 + fVar193 + fStack_444;
        auVar338._0_4_ =
             fVar267 * (float)local_300._0_4_ +
             auVar324._0_4_ * fVar281 + auVar299._0_4_ * fVar312 + (float)local_460._0_4_ * fVar315;
        auVar338._4_4_ =
             fVar268 * (float)local_300._4_4_ +
             auVar324._4_4_ * fVar283 + auVar299._4_4_ * fVar236 + (float)local_460._4_4_ * fVar316;
        auVar338._8_4_ =
             fVar269 * fStack_2f8 +
             auVar324._8_4_ * fVar285 + auVar299._8_4_ * fVar303 + fStack_458 * fVar237;
        auVar338._12_4_ =
             fVar270 * fStack_2f4 +
             auVar324._12_4_ * fVar287 + auVar299._12_4_ * fVar313 + fStack_454 * fVar304;
        auVar338._16_4_ =
             fVar271 * fStack_2f0 +
             auVar324._16_4_ * fVar288 + auVar299._16_4_ * fVar314 + fStack_450 * fVar317;
        auVar338._20_4_ =
             fVar272 * fStack_2ec +
             auVar324._20_4_ * fVar289 + auVar299._20_4_ * fVar162 + fStack_44c * fVar327;
        auVar338._24_4_ =
             fVar273 * fStack_2e8 +
             auVar324._24_4_ * fVar310 + auVar299._24_4_ * fVar165 + fStack_448 * fVar238;
        auVar338._28_4_ = fVar193 + fVar212 + fVar167;
        local_640._0_4_ =
             fVar267 * fVar195 + fVar367 * fVar281 + auVar350._0_4_ * fVar312 + fVar188 * fVar315;
        local_640._4_4_ =
             fVar268 * fVar209 + fVar370 * fVar283 + auVar350._4_4_ * fVar236 + fVar189 * fVar316;
        local_640._8_4_ =
             fVar269 * fVar211 + fVar371 * fVar285 + auVar350._8_4_ * fVar303 + fVar191 * fVar237;
        local_640._12_4_ =
             fVar270 * fVar213 + fVar372 * fVar287 + auVar350._12_4_ * fVar313 + fVar192 * fVar304;
        local_640._16_4_ =
             fVar271 * fVar195 + fVar214 * fVar288 + auVar350._16_4_ * fVar314 + fVar194 * fVar317;
        local_640._20_4_ =
             fVar272 * fVar209 + fVar215 * fVar289 + auVar350._20_4_ * fVar162 + fVar208 * fVar327;
        local_640._24_4_ =
             fVar273 * fVar211 + fVar216 * fVar310 + auVar350._24_4_ * fVar165 + fVar210 * fVar238;
        local_640._28_4_ = fVar167 + fVar193 + fVar193 + auVar253._28_4_;
        fVar136 = fVar267 * (float)local_c0._0_4_ +
                  (float)local_a0._0_4_ * fVar281 +
                  fVar312 * (float)local_120._0_4_ + fVar315 * (float)local_140._0_4_;
        fVar154 = fVar268 * (float)local_c0._4_4_ +
                  (float)local_a0._4_4_ * fVar283 +
                  fVar236 * (float)local_120._4_4_ + fVar316 * (float)local_140._4_4_;
        fVar156 = fVar269 * fStack_b8 +
                  fStack_98 * fVar285 + fVar303 * fStack_118 + fVar237 * fStack_138;
        fVar158 = fVar270 * fStack_b4 +
                  fStack_94 * fVar287 + fVar313 * fStack_114 + fVar304 * fStack_134;
        fVar160 = fVar271 * fStack_b0 +
                  fStack_90 * fVar288 + fVar314 * fStack_110 + fVar317 * fStack_130;
        fVar162 = fVar272 * fStack_ac +
                  fStack_8c * fVar289 + fVar162 * fStack_10c + fVar327 * fStack_12c;
        fVar165 = fVar273 * fStack_a8 +
                  fStack_88 * fVar310 + fVar165 * fStack_108 + fVar238 * fStack_128;
        fVar167 = fVar167 + fVar193 + fVar193 + fVar212;
        pfVar2 = (float *)(bezier_basis1 + lVar132 * 4 + lVar129);
        fVar273 = *pfVar2;
        fVar281 = pfVar2[1];
        fVar283 = pfVar2[2];
        fVar285 = pfVar2[3];
        fVar287 = pfVar2[4];
        fVar288 = pfVar2[5];
        fVar289 = pfVar2[6];
        pauVar1 = (undefined1 (*) [28])(lVar129 + 0x21fdb88 + lVar132 * 4);
        auVar123 = *pauVar1;
        fVar310 = *(float *)pauVar1[1];
        pfVar3 = (float *)(lVar129 + 0x21fe00c + lVar132 * 4);
        fVar312 = *pfVar3;
        fVar236 = pfVar3[1];
        fVar303 = pfVar3[2];
        fVar313 = pfVar3[3];
        fStack_550 = pfVar3[4];
        fStack_54c = pfVar3[5];
        fStack_548 = pfVar3[6];
        fStack_544 = pfVar3[7];
        pauVar4 = (undefined1 (*) [16])(lVar129 + 0x21fe490 + lVar132 * 4);
        fVar212 = *(float *)*pauVar4;
        fVar267 = *(float *)(*pauVar4 + 4);
        fVar268 = *(float *)(*pauVar4 + 8);
        auVar311 = *(undefined1 (*) [12])*pauVar4;
        fVar314 = *(float *)(*pauVar4 + 0xc);
        fStack_470 = *(float *)pauVar4[1];
        fStack_46c = *(float *)(pauVar4[1] + 4);
        fStack_468 = *(float *)(pauVar4[1] + 8);
        fStack_464 = *(float *)(pauVar4[1] + 0xc);
        fVar269 = auVar299._28_4_;
        local_880._0_4_ = auVar123._0_4_;
        local_880._4_4_ = auVar123._4_4_;
        fStack_878 = auVar123._8_4_;
        fStack_874 = auVar123._12_4_;
        auStack_870._0_4_ = auVar123._16_4_;
        auStack_870._4_4_ = auVar123._20_4_;
        fStack_868 = auVar123._24_4_;
        fVar270 = fVar269 + fVar269 + fVar310;
        auVar279._0_4_ =
             (float)local_300._0_4_ * fVar273 +
             auVar324._0_4_ * (float)local_880._0_4_ +
             fVar312 * auVar299._0_4_ + (float)local_460._0_4_ * fVar212;
        auVar279._4_4_ =
             (float)local_300._4_4_ * fVar281 +
             auVar324._4_4_ * (float)local_880._4_4_ +
             fVar236 * auVar299._4_4_ + (float)local_460._4_4_ * fVar267;
        auVar279._8_4_ =
             fStack_2f8 * fVar283 +
             auVar324._8_4_ * fStack_878 + fVar303 * auVar299._8_4_ + fStack_458 * fVar268;
        auVar279._12_4_ =
             fStack_2f4 * fVar285 +
             auVar324._12_4_ * fStack_874 + fVar313 * auVar299._12_4_ + fStack_454 * fVar314;
        auVar279._16_4_ =
             fStack_2f0 * fVar287 +
             auVar324._16_4_ * (float)auStack_870._0_4_ +
             fStack_550 * auVar299._16_4_ + fStack_450 * fStack_470;
        auVar279._20_4_ =
             fStack_2ec * fVar288 +
             auVar324._20_4_ * (float)auStack_870._4_4_ +
             fStack_54c * auVar299._20_4_ + fStack_44c * fStack_46c;
        auVar279._24_4_ =
             fStack_2e8 * fVar289 +
             auVar324._24_4_ * fStack_868 + fStack_548 * auVar299._24_4_ + fStack_448 * fStack_468;
        auVar279._28_4_ = fVar269 + fStack_464 + fVar270;
        local_5c0._0_4_ =
             fVar188 * fVar212 + auVar350._0_4_ * fVar312 + fVar367 * (float)local_880._0_4_ +
             fVar195 * fVar273;
        local_5c0._4_4_ =
             fVar189 * fVar267 + auVar350._4_4_ * fVar236 + fVar370 * (float)local_880._4_4_ +
             fVar209 * fVar281;
        local_5c0._8_4_ =
             fVar191 * fVar268 + auVar350._8_4_ * fVar303 + fVar371 * fStack_878 + fVar211 * fVar283
        ;
        local_5c0._12_4_ =
             fVar192 * fVar314 + auVar350._12_4_ * fVar313 + fVar372 * fStack_874 +
             fVar213 * fVar285;
        local_5c0._16_4_ =
             fVar194 * fStack_470 + auVar350._16_4_ * fStack_550 +
             fVar214 * (float)auStack_870._0_4_ + fVar195 * fVar287;
        local_5c0._20_4_ =
             fVar208 * fStack_46c + auVar350._20_4_ * fStack_54c +
             fVar215 * (float)auStack_870._4_4_ + fVar209 * fVar288;
        local_5c0._24_4_ =
             fVar210 * fStack_468 + auVar350._24_4_ * fStack_548 + fVar216 * fStack_868 +
             fVar211 * fVar289;
        local_5c0._28_4_ = fVar260 + fVar269 + fVar269 + fVar270;
        local_780._0_4_ =
             (float)local_a0._0_4_ * (float)local_880._0_4_ +
             fVar312 * (float)local_120._0_4_ + fVar212 * (float)local_140._0_4_ +
             (float)local_c0._0_4_ * fVar273;
        local_780._4_4_ =
             (float)local_a0._4_4_ * (float)local_880._4_4_ +
             fVar236 * (float)local_120._4_4_ + fVar267 * (float)local_140._4_4_ +
             (float)local_c0._4_4_ * fVar281;
        local_780._8_4_ =
             fStack_98 * fStack_878 + fVar303 * fStack_118 + fVar268 * fStack_138 +
             fStack_b8 * fVar283;
        local_780._12_4_ =
             fStack_94 * fStack_874 + fVar313 * fStack_114 + fVar314 * fStack_134 +
             fStack_b4 * fVar285;
        local_780._16_4_ =
             fStack_90 * (float)auStack_870._0_4_ +
             fStack_550 * fStack_110 + fStack_470 * fStack_130 + fStack_b0 * fVar287;
        local_780._20_4_ =
             fStack_8c * (float)auStack_870._4_4_ +
             fStack_54c * fStack_10c + fStack_46c * fStack_12c + fStack_ac * fVar288;
        local_780._24_4_ =
             fStack_88 * fStack_868 + fStack_548 * fStack_108 + fStack_468 * fStack_128 +
             fStack_a8 * fVar289;
        local_780._28_4_ = fVar269 + fVar269 + fStack_464 + fVar270;
        auVar233 = vsubps_avx(auVar279,auVar338);
        auVar23 = vsubps_avx(local_5c0,local_640);
        fVar194 = auVar233._0_4_;
        fVar210 = auVar233._4_4_;
        auVar72._4_4_ = local_640._4_4_ * fVar210;
        auVar72._0_4_ = local_640._0_4_ * fVar194;
        fVar214 = auVar233._8_4_;
        auVar72._8_4_ = local_640._8_4_ * fVar214;
        fVar216 = auVar233._12_4_;
        auVar72._12_4_ = local_640._12_4_ * fVar216;
        fVar267 = auVar233._16_4_;
        auVar72._16_4_ = local_640._16_4_ * fVar267;
        fVar269 = auVar233._20_4_;
        auVar72._20_4_ = local_640._20_4_ * fVar269;
        fVar271 = auVar233._24_4_;
        auVar72._24_4_ = local_640._24_4_ * fVar271;
        auVar72._28_4_ = fVar270;
        fVar208 = auVar23._0_4_;
        fVar212 = auVar23._4_4_;
        auVar73._4_4_ = auVar338._4_4_ * fVar212;
        auVar73._0_4_ = auVar338._0_4_ * fVar208;
        fVar215 = auVar23._8_4_;
        auVar73._8_4_ = auVar338._8_4_ * fVar215;
        fVar260 = auVar23._12_4_;
        auVar73._12_4_ = auVar338._12_4_ * fVar260;
        fVar268 = auVar23._16_4_;
        auVar73._16_4_ = auVar338._16_4_ * fVar268;
        fVar270 = auVar23._20_4_;
        auVar73._20_4_ = auVar338._20_4_ * fVar270;
        fVar272 = auVar23._24_4_;
        auVar73._24_4_ = auVar338._24_4_ * fVar272;
        auVar73._28_4_ = local_5c0._28_4_;
        auVar24 = vsubps_avx(auVar72,auVar73);
        auVar116._4_4_ = fVar154;
        auVar116._0_4_ = fVar136;
        auVar116._8_4_ = fVar156;
        auVar116._12_4_ = fVar158;
        auVar116._16_4_ = fVar160;
        auVar116._20_4_ = fVar162;
        auVar116._24_4_ = fVar165;
        auVar116._28_4_ = fVar167;
        auVar146 = vmaxps_avx(auVar116,local_780);
        auVar74._4_4_ = auVar146._4_4_ * auVar146._4_4_ * (fVar210 * fVar210 + fVar212 * fVar212);
        auVar74._0_4_ = auVar146._0_4_ * auVar146._0_4_ * (fVar194 * fVar194 + fVar208 * fVar208);
        auVar74._8_4_ = auVar146._8_4_ * auVar146._8_4_ * (fVar214 * fVar214 + fVar215 * fVar215);
        auVar74._12_4_ = auVar146._12_4_ * auVar146._12_4_ * (fVar216 * fVar216 + fVar260 * fVar260)
        ;
        auVar74._16_4_ = auVar146._16_4_ * auVar146._16_4_ * (fVar267 * fVar267 + fVar268 * fVar268)
        ;
        auVar74._20_4_ = auVar146._20_4_ * auVar146._20_4_ * (fVar269 * fVar269 + fVar270 * fVar270)
        ;
        auVar74._24_4_ = auVar146._24_4_ * auVar146._24_4_ * (fVar271 * fVar271 + fVar272 * fVar272)
        ;
        auVar74._28_4_ = auVar279._28_4_ + local_5c0._28_4_;
        auVar75._4_4_ = auVar24._4_4_ * auVar24._4_4_;
        auVar75._0_4_ = auVar24._0_4_ * auVar24._0_4_;
        auVar75._8_4_ = auVar24._8_4_ * auVar24._8_4_;
        auVar75._12_4_ = auVar24._12_4_ * auVar24._12_4_;
        auVar75._16_4_ = auVar24._16_4_ * auVar24._16_4_;
        auVar75._20_4_ = auVar24._20_4_ * auVar24._20_4_;
        auVar75._24_4_ = auVar24._24_4_ * auVar24._24_4_;
        auVar75._28_4_ = auVar24._28_4_;
        auVar253 = ZEXT3264(auVar75);
        _local_4e0 = vcmpps_avx(auVar75,auVar74,2);
        local_220 = (uint)lVar132;
        auVar200 = vpshufd_avx(ZEXT416(local_220),0);
        auVar222 = vpor_avx(auVar200,_DAT_01f4ad30);
        auVar200 = vpor_avx(auVar200,_DAT_01f7afa0);
        auVar222 = vpcmpgtd_avx(local_320._0_16_,auVar222);
        auVar200 = vpcmpgtd_avx(local_320._0_16_,auVar200);
        auVar231._16_16_ = auVar200;
        auVar231._0_16_ = auVar222;
        auVar146 = auVar231 & _local_4e0;
        fVar367 = (float)local_740._0_4_;
        fVar370 = (float)local_740._4_4_;
        fVar371 = fStack_738;
        fVar372 = fStack_734;
        fVar214 = fStack_730;
        fVar215 = fStack_72c;
        fVar216 = fStack_728;
        fVar260 = fStack_724;
        if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0x7f,0) == '\0') &&
              (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar146 >> 0xbf,0) == '\0') &&
            (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar146[0x1f]) {
          auVar186 = ZEXT3264(local_540);
LAB_0098a367:
          auVar333 = ZEXT3264(local_800);
          auVar350 = ZEXT3264(_local_820);
          auVar299 = ZEXT3264(_local_620);
          fVar188 = (float)local_720._0_4_;
          fVar189 = (float)local_720._4_4_;
          fVar191 = fStack_718;
          fVar192 = fStack_714;
          fVar194 = fStack_710;
          fVar208 = fStack_70c;
          fVar210 = fStack_708;
          fVar212 = fStack_704;
        }
        else {
          local_480._0_4_ = auVar311._0_4_;
          local_480._4_4_ = auVar311._4_4_;
          fStack_478 = auVar311._8_4_;
          local_560 = fVar273 * (float)local_520._0_4_ +
                      (float)local_880._0_4_ * (float)local_2e0._0_4_ +
                      (float)local_e0._0_4_ * fVar312 +
                      (float)local_2c0._0_4_ * (float)local_480._0_4_;
          fStack_55c = fVar281 * (float)local_520._4_4_ +
                       (float)local_880._4_4_ * (float)local_2e0._4_4_ +
                       (float)local_e0._4_4_ * fVar236 +
                       (float)local_2c0._4_4_ * (float)local_480._4_4_;
          fStack_558 = fVar283 * fStack_518 +
                       fStack_878 * fStack_2d8 + fStack_d8 * fVar303 + fStack_2b8 * fStack_478;
          fStack_554 = fVar285 * fStack_514 +
                       fStack_874 * fStack_2d4 + fStack_d4 * fVar313 + fStack_2b4 * fVar314;
          fStack_550 = fVar287 * fStack_510 +
                       (float)auStack_870._0_4_ * fStack_2d0 +
                       fStack_d0 * fStack_550 + fStack_2b0 * fStack_470;
          fStack_54c = fVar288 * fStack_50c +
                       (float)auStack_870._4_4_ * fStack_2cc +
                       fStack_cc * fStack_54c + fStack_2ac * fStack_46c;
          fStack_548 = fVar289 * fStack_508 +
                       fStack_868 * fStack_2c8 + fStack_c8 * fStack_548 + fStack_2a8 * fStack_468;
          fStack_544 = auVar23._28_4_ + fVar167 + local_4e0._28_4_ + 0.0;
          local_760._0_4_ = auVar121._0_4_;
          local_760._4_4_ = auVar121._4_4_;
          fStack_758 = auVar121._8_4_;
          fStack_754 = auVar121._12_4_;
          fStack_750 = auVar121._16_4_;
          fStack_74c = auVar121._20_4_;
          fStack_748 = auVar121._24_4_;
          local_6a0._0_4_ = auVar120._0_4_;
          local_6a0._4_4_ = auVar120._4_4_;
          fStack_698 = auVar120._8_4_;
          fStack_694 = auVar120._12_4_;
          fStack_690 = auVar120._16_4_;
          fStack_68c = auVar120._20_4_;
          fStack_688 = auVar120._24_4_;
          fVar170 = (float)local_e0._0_4_ * (float)local_6a0._0_4_;
          fVar188 = (float)local_e0._4_4_ * (float)local_6a0._4_4_;
          fVar189 = fStack_d8 * fStack_698;
          fVar191 = fStack_d4 * fStack_694;
          fVar192 = fStack_d0 * fStack_690;
          fVar135 = fStack_cc * fStack_68c;
          fVar153 = fStack_c8 * fStack_688;
          pfVar3 = (float *)(lVar129 + 0x21fcdfc + lVar132 * 4);
          fVar194 = *pfVar3;
          fVar208 = pfVar3[1];
          fVar210 = pfVar3[2];
          fVar212 = pfVar3[3];
          fVar267 = pfVar3[4];
          fVar268 = pfVar3[5];
          fVar269 = pfVar3[6];
          pfVar5 = (float *)(lVar129 + 0x21fd280 + lVar132 * 4);
          fVar270 = *pfVar5;
          fVar271 = pfVar5[1];
          fVar272 = pfVar5[2];
          fVar273 = pfVar5[3];
          fVar281 = pfVar5[4];
          fVar283 = pfVar5[5];
          fVar285 = pfVar5[6];
          fVar155 = pfVar2[7] + 0.0;
          pfVar6 = (float *)(lVar129 + 0x21fc978 + lVar132 * 4);
          fVar287 = *pfVar6;
          fVar288 = pfVar6[1];
          fVar289 = pfVar6[2];
          fVar312 = pfVar6[3];
          fVar236 = pfVar6[4];
          fVar303 = pfVar6[5];
          fVar313 = pfVar6[6];
          fVar168 = pfVar3[7] + pfVar5[7];
          fStack_5e4 = pfVar5[7] + fVar155;
          fVar155 = pfVar2[7] + fVar310 + fVar155;
          pfVar2 = (float *)(lVar129 + 0x21fc4f4 + lVar132 * 4);
          fVar310 = *pfVar2;
          fVar314 = pfVar2[1];
          fVar193 = pfVar2[2];
          fVar164 = pfVar2[3];
          fVar217 = pfVar2[4];
          fVar234 = pfVar2[5];
          fVar235 = pfVar2[6];
          local_6a0._4_4_ =
               (float)local_300._4_4_ * fVar314 +
               (float)local_660._4_4_ * fVar288 +
               (float)local_620._4_4_ * fVar208 + (float)local_460._4_4_ * fVar271;
          local_6a0._0_4_ =
               (float)local_300._0_4_ * fVar310 +
               (float)local_660._0_4_ * fVar287 +
               (float)local_620._0_4_ * fVar194 + (float)local_460._0_4_ * fVar270;
          fStack_698 = fStack_2f8 * fVar193 +
                       fStack_658 * fVar289 + fStack_618 * fVar210 + fStack_458 * fVar272;
          fStack_694 = fStack_2f4 * fVar164 +
                       fStack_654 * fVar312 + fStack_614 * fVar212 + fStack_454 * fVar273;
          fStack_690 = fStack_2f0 * fVar217 +
                       fStack_650 * fVar236 + fStack_610 * fVar267 + fStack_450 * fVar281;
          fStack_68c = fStack_2ec * fVar234 +
                       fStack_64c * fVar303 + fStack_60c * fVar268 + fStack_44c * fVar283;
          fStack_688 = fStack_2e8 * fVar235 +
                       fStack_648 * fVar313 + fStack_608 * fVar269 + fStack_448 * fVar285;
          fStack_684 = fVar168 + fStack_5e4;
          local_600 = fVar310 * fVar195 +
                      (float)local_820._0_4_ * fVar194 + (float)local_720._0_4_ * fVar270 +
                      fVar287 * (float)local_740._0_4_;
          fStack_5fc = fVar314 * fVar209 +
                       (float)local_820._4_4_ * fVar208 + (float)local_720._4_4_ * fVar271 +
                       fVar288 * (float)local_740._4_4_;
          fStack_5f8 = fVar193 * fVar211 +
                       fStack_818 * fVar210 + fStack_718 * fVar272 + fVar289 * fStack_738;
          fStack_5f4 = fVar164 * fVar213 +
                       fStack_814 * fVar212 + fStack_714 * fVar273 + fVar312 * fStack_734;
          fStack_5f0 = fVar217 * fVar195 +
                       fStack_810 * fVar267 + fStack_710 * fVar281 + fVar236 * fStack_730;
          fStack_5ec = fVar234 * fVar209 +
                       fStack_80c * fVar268 + fStack_70c * fVar283 + fVar303 * fStack_72c;
          fStack_5e8 = fVar235 * fVar211 +
                       fStack_808 * fVar269 + fStack_708 * fVar285 + fVar313 * fStack_728;
          fStack_5e4 = fStack_5e4 + fVar155;
          auVar354._0_4_ =
               fVar287 * (float)local_2e0._0_4_ +
               (float)local_e0._0_4_ * fVar194 + (float)local_2c0._0_4_ * fVar270 +
               fVar310 * (float)local_520._0_4_;
          auVar354._4_4_ =
               fVar288 * (float)local_2e0._4_4_ +
               (float)local_e0._4_4_ * fVar208 + (float)local_2c0._4_4_ * fVar271 +
               fVar314 * (float)local_520._4_4_;
          auVar354._8_4_ =
               fVar289 * fStack_2d8 + fStack_d8 * fVar210 + fStack_2b8 * fVar272 +
               fVar193 * fStack_518;
          auVar354._12_4_ =
               fVar312 * fStack_2d4 + fStack_d4 * fVar212 + fStack_2b4 * fVar273 +
               fVar164 * fStack_514;
          auVar354._16_4_ =
               fVar236 * fStack_2d0 + fStack_d0 * fVar267 + fStack_2b0 * fVar281 +
               fVar217 * fStack_510;
          auVar354._20_4_ =
               fVar303 * fStack_2cc + fStack_cc * fVar268 + fStack_2ac * fVar283 +
               fVar234 * fStack_50c;
          auVar354._24_4_ =
               fVar313 * fStack_2c8 + fStack_c8 * fVar269 + fStack_2a8 * fVar285 +
               fVar235 * fStack_508;
          auVar354._28_4_ = pfVar6[7] + fVar168 + fVar155;
          pfVar2 = (float *)(lVar129 + 0x21ff21c + lVar132 * 4);
          fVar194 = *pfVar2;
          fVar208 = pfVar2[1];
          fVar210 = pfVar2[2];
          fVar212 = pfVar2[3];
          fVar267 = pfVar2[4];
          fVar268 = pfVar2[5];
          fVar269 = pfVar2[6];
          pfVar3 = (float *)(lVar129 + 0x21ff6a0 + lVar132 * 4);
          fVar270 = *pfVar3;
          fVar271 = pfVar3[1];
          fVar272 = pfVar3[2];
          fVar273 = pfVar3[3];
          fVar281 = pfVar3[4];
          fVar283 = pfVar3[5];
          fVar285 = pfVar3[6];
          pfVar5 = (float *)(lVar129 + 0x21fed98 + lVar132 * 4);
          fVar287 = *pfVar5;
          fVar288 = pfVar5[1];
          fVar289 = pfVar5[2];
          fVar310 = pfVar5[3];
          fVar312 = pfVar5[4];
          fVar236 = pfVar5[5];
          fVar303 = pfVar5[6];
          pfVar6 = (float *)(lVar129 + 0x21fe914 + lVar132 * 4);
          fVar313 = *pfVar6;
          fVar314 = pfVar6[1];
          fVar193 = pfVar6[2];
          fVar164 = pfVar6[3];
          fVar217 = pfVar6[4];
          fVar234 = pfVar6[5];
          fVar235 = pfVar6[6];
          auVar322._0_4_ =
               (float)local_300._0_4_ * fVar313 +
               (float)local_660._0_4_ * fVar287 +
               (float)local_620._0_4_ * fVar194 + (float)local_460._0_4_ * fVar270;
          auVar322._4_4_ =
               (float)local_300._4_4_ * fVar314 +
               (float)local_660._4_4_ * fVar288 +
               (float)local_620._4_4_ * fVar208 + (float)local_460._4_4_ * fVar271;
          auVar322._8_4_ =
               fStack_2f8 * fVar193 +
               fStack_658 * fVar289 + fStack_618 * fVar210 + fStack_458 * fVar272;
          auVar322._12_4_ =
               fStack_2f4 * fVar164 +
               fStack_654 * fVar310 + fStack_614 * fVar212 + fStack_454 * fVar273;
          auVar322._16_4_ =
               fStack_2f0 * fVar217 +
               fStack_650 * fVar312 + fStack_610 * fVar267 + fStack_450 * fVar281;
          auVar322._20_4_ =
               fStack_2ec * fVar234 +
               fStack_64c * fVar236 + fStack_60c * fVar268 + fStack_44c * fVar283;
          auVar322._24_4_ =
               fStack_2e8 * fVar235 +
               fStack_648 * fVar303 + fStack_608 * fVar269 + fStack_448 * fVar285;
          auVar322._28_4_ = fStack_804 + fStack_804 + fStack_444 + fStack_5e4;
          auVar348._0_4_ =
               fVar313 * fVar195 +
               fVar287 * (float)local_740._0_4_ +
               (float)local_820._0_4_ * fVar194 + (float)local_720._0_4_ * fVar270;
          auVar348._4_4_ =
               fVar314 * fVar209 +
               fVar288 * (float)local_740._4_4_ +
               (float)local_820._4_4_ * fVar208 + (float)local_720._4_4_ * fVar271;
          auVar348._8_4_ =
               fVar193 * fVar211 +
               fVar289 * fStack_738 + fStack_818 * fVar210 + fStack_718 * fVar272;
          auVar348._12_4_ =
               fVar164 * fVar213 +
               fVar310 * fStack_734 + fStack_814 * fVar212 + fStack_714 * fVar273;
          auVar348._16_4_ =
               fVar217 * fVar195 +
               fVar312 * fStack_730 + fStack_810 * fVar267 + fStack_710 * fVar281;
          auVar348._20_4_ =
               fVar234 * fVar209 +
               fVar236 * fStack_72c + fStack_80c * fVar268 + fStack_70c * fVar283;
          auVar348._24_4_ =
               fVar235 * fVar211 +
               fVar303 * fStack_728 + fStack_808 * fVar269 + fStack_708 * fVar285;
          auVar348._28_4_ = fStack_804 + fStack_804 + fStack_704 + fStack_5e4;
          auVar266._8_4_ = 0x7fffffff;
          auVar266._0_8_ = 0x7fffffff7fffffff;
          auVar266._12_4_ = 0x7fffffff;
          auVar266._16_4_ = 0x7fffffff;
          auVar266._20_4_ = 0x7fffffff;
          auVar266._24_4_ = 0x7fffffff;
          auVar266._28_4_ = 0x7fffffff;
          auVar146 = vandps_avx(_local_6a0,auVar266);
          auVar118._4_4_ = fStack_5fc;
          auVar118._0_4_ = local_600;
          auVar118._8_4_ = fStack_5f8;
          auVar118._12_4_ = fStack_5f4;
          auVar118._16_4_ = fStack_5f0;
          auVar118._20_4_ = fStack_5ec;
          auVar118._24_4_ = fStack_5e8;
          auVar118._28_4_ = fStack_5e4;
          auVar24 = vandps_avx(auVar118,auVar266);
          auVar24 = vmaxps_avx(auVar146,auVar24);
          auVar146 = vandps_avx(auVar354,auVar266);
          auVar24 = vmaxps_avx(auVar24,auVar146);
          auVar24 = vcmpps_avx(auVar24,_local_340,1);
          auVar25 = vblendvps_avx(_local_6a0,auVar233,auVar24);
          auVar148._0_4_ =
               fVar313 * (float)local_520._0_4_ +
               fVar287 * (float)local_2e0._0_4_ +
               fVar270 * (float)local_2c0._0_4_ + (float)local_e0._0_4_ * fVar194;
          auVar148._4_4_ =
               fVar314 * (float)local_520._4_4_ +
               fVar288 * (float)local_2e0._4_4_ +
               fVar271 * (float)local_2c0._4_4_ + (float)local_e0._4_4_ * fVar208;
          auVar148._8_4_ =
               fVar193 * fStack_518 +
               fVar289 * fStack_2d8 + fVar272 * fStack_2b8 + fStack_d8 * fVar210;
          auVar148._12_4_ =
               fVar164 * fStack_514 +
               fVar310 * fStack_2d4 + fVar273 * fStack_2b4 + fStack_d4 * fVar212;
          auVar148._16_4_ =
               fVar217 * fStack_510 +
               fVar312 * fStack_2d0 + fVar281 * fStack_2b0 + fStack_d0 * fVar267;
          auVar148._20_4_ =
               fVar234 * fStack_50c +
               fVar236 * fStack_2cc + fVar283 * fStack_2ac + fStack_cc * fVar268;
          auVar148._24_4_ =
               fVar235 * fStack_508 +
               fVar303 * fStack_2c8 + fVar285 * fStack_2a8 + fStack_c8 * fVar269;
          auVar148._28_4_ = auVar146._28_4_ + pfVar5[7] + pfVar3[7] + pfVar2[7];
          auVar26 = vblendvps_avx(auVar118,auVar23,auVar24);
          auVar146 = vandps_avx(auVar322,auVar266);
          auVar24 = vandps_avx(auVar348,auVar266);
          auVar27 = vmaxps_avx(auVar146,auVar24);
          auVar146 = vandps_avx(auVar148,auVar266);
          auVar146 = vmaxps_avx(auVar27,auVar146);
          local_5e0._0_4_ = auVar122._0_4_;
          local_5e0._4_4_ = auVar122._4_4_;
          fStack_5d8 = auVar122._8_4_;
          fStack_5d4 = auVar122._12_4_;
          auStack_5d0._0_4_ = auVar122._16_4_;
          auStack_5d0._4_4_ = auVar122._20_4_;
          fStack_5c8 = auVar122._24_4_;
          auVar24 = vcmpps_avx(auVar146,_local_340,1);
          auVar146 = vblendvps_avx(auVar322,auVar233,auVar24);
          auVar149._0_4_ =
               (float)local_520._0_4_ * (float)local_5e0._0_4_ +
               (float)local_2e0._0_4_ * (float)local_760._0_4_ +
               fVar170 + (float)local_2c0._0_4_ * fVar315;
          auVar149._4_4_ =
               (float)local_520._4_4_ * (float)local_5e0._4_4_ +
               (float)local_2e0._4_4_ * (float)local_760._4_4_ +
               fVar188 + (float)local_2c0._4_4_ * fVar316;
          auVar149._8_4_ =
               fStack_518 * fStack_5d8 + fStack_2d8 * fStack_758 + fVar189 + fStack_2b8 * fVar237;
          auVar149._12_4_ =
               fStack_514 * fStack_5d4 + fStack_2d4 * fStack_754 + fVar191 + fStack_2b4 * fVar304;
          auVar149._16_4_ =
               fStack_510 * (float)auStack_5d0._0_4_ +
               fStack_2d0 * fStack_750 + fVar192 + fStack_2b0 * fVar317;
          auVar149._20_4_ =
               fStack_50c * (float)auStack_5d0._4_4_ +
               fStack_2cc * fStack_74c + fVar135 + fStack_2ac * fVar327;
          auVar149._24_4_ =
               fStack_508 * fStack_5c8 + fStack_2c8 * fStack_748 + fVar153 + fStack_2a8 * fVar238;
          auVar149._28_4_ = auVar27._28_4_ + fStack_544 + local_4e0._28_4_ + 0.0;
          auVar233 = vblendvps_avx(auVar348,auVar23,auVar24);
          fVar168 = auVar25._0_4_;
          fVar170 = auVar25._4_4_;
          fVar188 = auVar25._8_4_;
          fVar189 = auVar25._12_4_;
          fVar191 = auVar25._16_4_;
          fVar192 = auVar25._20_4_;
          fVar135 = auVar25._24_4_;
          fVar153 = auVar25._28_4_;
          fVar287 = auVar146._0_4_;
          fVar289 = auVar146._4_4_;
          fVar312 = auVar146._8_4_;
          fVar303 = auVar146._12_4_;
          fVar314 = auVar146._16_4_;
          fVar316 = auVar146._20_4_;
          fVar304 = auVar146._24_4_;
          fVar194 = auVar26._0_4_;
          fVar210 = auVar26._4_4_;
          fVar267 = auVar26._8_4_;
          fVar269 = auVar26._12_4_;
          fVar271 = auVar26._16_4_;
          fVar273 = auVar26._20_4_;
          fVar283 = auVar26._24_4_;
          auVar331._0_4_ = fVar194 * fVar194 + fVar168 * fVar168;
          auVar331._4_4_ = fVar210 * fVar210 + fVar170 * fVar170;
          auVar331._8_4_ = fVar267 * fVar267 + fVar188 * fVar188;
          auVar331._12_4_ = fVar269 * fVar269 + fVar189 * fVar189;
          auVar331._16_4_ = fVar271 * fVar271 + fVar191 * fVar191;
          auVar331._20_4_ = fVar273 * fVar273 + fVar192 * fVar192;
          auVar331._24_4_ = fVar283 * fVar283 + fVar135 * fVar135;
          auVar331._28_4_ = fStack_644 + fStack_5e4;
          auVar24 = vrsqrtps_avx(auVar331);
          fVar208 = auVar24._0_4_;
          fVar212 = auVar24._4_4_;
          auVar76._4_4_ = fVar212 * 1.5;
          auVar76._0_4_ = fVar208 * 1.5;
          fVar268 = auVar24._8_4_;
          auVar76._8_4_ = fVar268 * 1.5;
          fVar270 = auVar24._12_4_;
          auVar76._12_4_ = fVar270 * 1.5;
          fVar272 = auVar24._16_4_;
          auVar76._16_4_ = fVar272 * 1.5;
          fVar281 = auVar24._20_4_;
          auVar76._20_4_ = fVar281 * 1.5;
          fVar285 = auVar24._24_4_;
          auVar76._24_4_ = fVar285 * 1.5;
          auVar76._28_4_ = auVar348._28_4_;
          auVar77._4_4_ = fVar212 * fVar212 * fVar212 * auVar331._4_4_ * 0.5;
          auVar77._0_4_ = fVar208 * fVar208 * fVar208 * auVar331._0_4_ * 0.5;
          auVar77._8_4_ = fVar268 * fVar268 * fVar268 * auVar331._8_4_ * 0.5;
          auVar77._12_4_ = fVar270 * fVar270 * fVar270 * auVar331._12_4_ * 0.5;
          auVar77._16_4_ = fVar272 * fVar272 * fVar272 * auVar331._16_4_ * 0.5;
          auVar77._20_4_ = fVar281 * fVar281 * fVar281 * auVar331._20_4_ * 0.5;
          auVar77._24_4_ = fVar285 * fVar285 * fVar285 * auVar331._24_4_ * 0.5;
          auVar77._28_4_ = auVar331._28_4_;
          auVar25 = vsubps_avx(auVar76,auVar77);
          fVar327 = auVar25._0_4_;
          fVar238 = auVar25._4_4_;
          fVar193 = auVar25._8_4_;
          fVar164 = auVar25._12_4_;
          fVar217 = auVar25._16_4_;
          fVar234 = auVar25._20_4_;
          fVar235 = auVar25._24_4_;
          fVar208 = auVar233._0_4_;
          fVar212 = auVar233._4_4_;
          fVar268 = auVar233._8_4_;
          fVar270 = auVar233._12_4_;
          fVar272 = auVar233._16_4_;
          fVar281 = auVar233._20_4_;
          fVar285 = auVar233._24_4_;
          auVar308._0_4_ = fVar208 * fVar208 + fVar287 * fVar287;
          auVar308._4_4_ = fVar212 * fVar212 + fVar289 * fVar289;
          auVar308._8_4_ = fVar268 * fVar268 + fVar312 * fVar312;
          auVar308._12_4_ = fVar270 * fVar270 + fVar303 * fVar303;
          auVar308._16_4_ = fVar272 * fVar272 + fVar314 * fVar314;
          auVar308._20_4_ = fVar281 * fVar281 + fVar316 * fVar316;
          auVar308._24_4_ = fVar285 * fVar285 + fVar304 * fVar304;
          auVar308._28_4_ = auVar24._28_4_ + auVar146._28_4_;
          auVar146 = vrsqrtps_avx(auVar308);
          fVar288 = auVar146._0_4_;
          fVar310 = auVar146._4_4_;
          auVar78._4_4_ = fVar310 * 1.5;
          auVar78._0_4_ = fVar288 * 1.5;
          fVar236 = auVar146._8_4_;
          auVar78._8_4_ = fVar236 * 1.5;
          fVar313 = auVar146._12_4_;
          auVar78._12_4_ = fVar313 * 1.5;
          fVar315 = auVar146._16_4_;
          auVar78._16_4_ = fVar315 * 1.5;
          fVar237 = auVar146._20_4_;
          auVar78._20_4_ = fVar237 * 1.5;
          fVar317 = auVar146._24_4_;
          auVar78._24_4_ = fVar317 * 1.5;
          auVar78._28_4_ = auVar348._28_4_;
          auVar79._4_4_ = fVar310 * fVar310 * fVar310 * auVar308._4_4_ * 0.5;
          auVar79._0_4_ = fVar288 * fVar288 * fVar288 * auVar308._0_4_ * 0.5;
          auVar79._8_4_ = fVar236 * fVar236 * fVar236 * auVar308._8_4_ * 0.5;
          auVar79._12_4_ = fVar313 * fVar313 * fVar313 * auVar308._12_4_ * 0.5;
          auVar79._16_4_ = fVar315 * fVar315 * fVar315 * auVar308._16_4_ * 0.5;
          auVar79._20_4_ = fVar237 * fVar237 * fVar237 * auVar308._20_4_ * 0.5;
          auVar79._24_4_ = fVar317 * fVar317 * fVar317 * auVar308._24_4_ * 0.5;
          auVar79._28_4_ = auVar308._28_4_;
          auVar233 = vsubps_avx(auVar78,auVar79);
          fVar288 = auVar233._0_4_;
          fVar310 = auVar233._4_4_;
          fVar236 = auVar233._8_4_;
          fVar313 = auVar233._12_4_;
          fVar315 = auVar233._16_4_;
          fVar237 = auVar233._20_4_;
          fVar317 = auVar233._24_4_;
          fVar194 = fVar136 * fVar327 * fVar194;
          fVar210 = fVar154 * fVar238 * fVar210;
          auVar80._4_4_ = fVar210;
          auVar80._0_4_ = fVar194;
          fVar267 = fVar156 * fVar193 * fVar267;
          auVar80._8_4_ = fVar267;
          fVar269 = fVar158 * fVar164 * fVar269;
          auVar80._12_4_ = fVar269;
          fVar271 = fVar160 * fVar217 * fVar271;
          auVar80._16_4_ = fVar271;
          fVar273 = fVar162 * fVar234 * fVar273;
          auVar80._20_4_ = fVar273;
          fVar283 = fVar165 * fVar235 * fVar283;
          auVar80._24_4_ = fVar283;
          auVar80._28_4_ = auVar146._28_4_;
          local_5e0._4_4_ = fVar210 + auVar338._4_4_;
          local_5e0._0_4_ = fVar194 + auVar338._0_4_;
          fStack_5d8 = fVar267 + auVar338._8_4_;
          fStack_5d4 = fVar269 + auVar338._12_4_;
          auStack_5d0._0_4_ = fVar271 + auVar338._16_4_;
          auStack_5d0._4_4_ = fVar273 + auVar338._20_4_;
          fStack_5c8 = fVar283 + auVar338._24_4_;
          fStack_5c4 = auVar146._28_4_ + auVar338._28_4_;
          fVar194 = fVar136 * fVar327 * -fVar168;
          fVar210 = fVar154 * fVar238 * -fVar170;
          auVar81._4_4_ = fVar210;
          auVar81._0_4_ = fVar194;
          fVar267 = fVar156 * fVar193 * -fVar188;
          auVar81._8_4_ = fVar267;
          fVar269 = fVar158 * fVar164 * -fVar189;
          auVar81._12_4_ = fVar269;
          fVar271 = fVar160 * fVar217 * -fVar191;
          auVar81._16_4_ = fVar271;
          fVar273 = fVar162 * fVar234 * -fVar192;
          auVar81._20_4_ = fVar273;
          fVar283 = fVar165 * fVar235 * -fVar135;
          auVar81._24_4_ = fVar283;
          auVar81._28_4_ = -fVar153;
          local_760._4_4_ = local_640._4_4_ + fVar210;
          local_760._0_4_ = local_640._0_4_ + fVar194;
          fStack_758 = local_640._8_4_ + fVar267;
          fStack_754 = local_640._12_4_ + fVar269;
          fStack_750 = local_640._16_4_ + fVar271;
          fStack_74c = local_640._20_4_ + fVar273;
          fStack_748 = local_640._24_4_ + fVar283;
          fStack_744 = local_640._28_4_ + -fVar153;
          fVar194 = fVar327 * 0.0 * fVar136;
          fVar210 = fVar238 * 0.0 * fVar154;
          auVar82._4_4_ = fVar210;
          auVar82._0_4_ = fVar194;
          fVar267 = fVar193 * 0.0 * fVar156;
          auVar82._8_4_ = fVar267;
          fVar269 = fVar164 * 0.0 * fVar158;
          auVar82._12_4_ = fVar269;
          fVar271 = fVar217 * 0.0 * fVar160;
          auVar82._16_4_ = fVar271;
          fVar273 = fVar234 * 0.0 * fVar162;
          auVar82._20_4_ = fVar273;
          fVar283 = fVar235 * 0.0 * fVar165;
          auVar82._24_4_ = fVar283;
          auVar82._28_4_ = fVar153;
          auVar146 = vsubps_avx(auVar338,auVar80);
          auVar369._0_4_ = fVar194 + auVar149._0_4_;
          auVar369._4_4_ = fVar210 + auVar149._4_4_;
          auVar369._8_4_ = fVar267 + auVar149._8_4_;
          auVar369._12_4_ = fVar269 + auVar149._12_4_;
          auVar369._16_4_ = fVar271 + auVar149._16_4_;
          auVar369._20_4_ = fVar273 + auVar149._20_4_;
          auVar369._24_4_ = fVar283 + auVar149._24_4_;
          auVar369._28_4_ = fVar153 + auVar149._28_4_;
          fVar194 = local_780._0_4_ * fVar288 * fVar208;
          fVar208 = local_780._4_4_ * fVar310 * fVar212;
          auVar83._4_4_ = fVar208;
          auVar83._0_4_ = fVar194;
          fVar210 = local_780._8_4_ * fVar236 * fVar268;
          auVar83._8_4_ = fVar210;
          fVar212 = local_780._12_4_ * fVar313 * fVar270;
          auVar83._12_4_ = fVar212;
          fVar267 = local_780._16_4_ * fVar315 * fVar272;
          auVar83._16_4_ = fVar267;
          fVar268 = local_780._20_4_ * fVar237 * fVar281;
          auVar83._20_4_ = fVar268;
          fVar269 = local_780._24_4_ * fVar317 * fVar285;
          auVar83._24_4_ = fVar269;
          auVar83._28_4_ = fVar167;
          auVar140 = vsubps_avx(local_640,auVar81);
          auVar355._0_4_ = auVar279._0_4_ + fVar194;
          auVar355._4_4_ = auVar279._4_4_ + fVar208;
          auVar355._8_4_ = auVar279._8_4_ + fVar210;
          auVar355._12_4_ = auVar279._12_4_ + fVar212;
          auVar355._16_4_ = auVar279._16_4_ + fVar267;
          auVar355._20_4_ = auVar279._20_4_ + fVar268;
          auVar355._24_4_ = auVar279._24_4_ + fVar269;
          auVar355._28_4_ = auVar279._28_4_ + fVar167;
          fVar194 = fVar288 * -fVar287 * local_780._0_4_;
          fVar208 = fVar310 * -fVar289 * local_780._4_4_;
          auVar84._4_4_ = fVar208;
          auVar84._0_4_ = fVar194;
          fVar210 = fVar236 * -fVar312 * local_780._8_4_;
          auVar84._8_4_ = fVar210;
          fVar212 = fVar313 * -fVar303 * local_780._12_4_;
          auVar84._12_4_ = fVar212;
          fVar267 = fVar315 * -fVar314 * local_780._16_4_;
          auVar84._16_4_ = fVar267;
          fVar268 = fVar237 * -fVar316 * local_780._20_4_;
          auVar84._20_4_ = fVar268;
          fVar269 = fVar317 * -fVar304 * local_780._24_4_;
          auVar84._24_4_ = fVar269;
          auVar84._28_4_ = auVar338._28_4_;
          auVar141 = vsubps_avx(auVar149,auVar82);
          auVar252._0_4_ = local_5c0._0_4_ + fVar194;
          auVar252._4_4_ = local_5c0._4_4_ + fVar208;
          auVar252._8_4_ = local_5c0._8_4_ + fVar210;
          auVar252._12_4_ = local_5c0._12_4_ + fVar212;
          auVar252._16_4_ = local_5c0._16_4_ + fVar267;
          auVar252._20_4_ = local_5c0._20_4_ + fVar268;
          auVar252._24_4_ = local_5c0._24_4_ + fVar269;
          auVar252._28_4_ = local_5c0._28_4_ + auVar338._28_4_;
          fVar194 = fVar288 * 0.0 * local_780._0_4_;
          fVar208 = fVar310 * 0.0 * local_780._4_4_;
          auVar85._4_4_ = fVar208;
          auVar85._0_4_ = fVar194;
          fVar210 = fVar236 * 0.0 * local_780._8_4_;
          auVar85._8_4_ = fVar210;
          fVar212 = fVar313 * 0.0 * local_780._12_4_;
          auVar85._12_4_ = fVar212;
          fVar267 = fVar315 * 0.0 * local_780._16_4_;
          auVar85._16_4_ = fVar267;
          fVar268 = fVar237 * 0.0 * local_780._20_4_;
          auVar85._20_4_ = fVar268;
          fVar269 = fVar317 * 0.0 * local_780._24_4_;
          auVar85._24_4_ = fVar269;
          auVar85._28_4_ = auVar149._28_4_;
          auVar24 = vsubps_avx(auVar279,auVar83);
          auVar119._4_4_ = fStack_55c;
          auVar119._0_4_ = local_560;
          auVar119._8_4_ = fStack_558;
          auVar119._12_4_ = fStack_554;
          auVar119._16_4_ = fStack_550;
          auVar119._20_4_ = fStack_54c;
          auVar119._24_4_ = fStack_548;
          auVar119._28_4_ = fStack_544;
          auVar323._0_4_ = local_560 + fVar194;
          auVar323._4_4_ = fStack_55c + fVar208;
          auVar323._8_4_ = fStack_558 + fVar210;
          auVar323._12_4_ = fStack_554 + fVar212;
          auVar323._16_4_ = fStack_550 + fVar267;
          auVar323._20_4_ = fStack_54c + fVar268;
          auVar323._24_4_ = fStack_548 + fVar269;
          auVar323._28_4_ = fStack_544 + auVar149._28_4_;
          auVar25 = vsubps_avx(local_5c0,auVar84);
          auVar26 = vsubps_avx(auVar119,auVar85);
          auVar27 = vsubps_avx(auVar252,auVar140);
          auVar28 = vsubps_avx(auVar323,auVar141);
          auVar86._4_4_ = auVar141._4_4_ * auVar27._4_4_;
          auVar86._0_4_ = auVar141._0_4_ * auVar27._0_4_;
          auVar86._8_4_ = auVar141._8_4_ * auVar27._8_4_;
          auVar86._12_4_ = auVar141._12_4_ * auVar27._12_4_;
          auVar86._16_4_ = auVar141._16_4_ * auVar27._16_4_;
          auVar86._20_4_ = auVar141._20_4_ * auVar27._20_4_;
          auVar86._24_4_ = auVar141._24_4_ * auVar27._24_4_;
          auVar86._28_4_ = auVar348._28_4_;
          auVar87._4_4_ = auVar140._4_4_ * auVar28._4_4_;
          auVar87._0_4_ = auVar140._0_4_ * auVar28._0_4_;
          auVar87._8_4_ = auVar140._8_4_ * auVar28._8_4_;
          auVar87._12_4_ = auVar140._12_4_ * auVar28._12_4_;
          auVar87._16_4_ = auVar140._16_4_ * auVar28._16_4_;
          auVar87._20_4_ = auVar140._20_4_ * auVar28._20_4_;
          auVar87._24_4_ = auVar140._24_4_ * auVar28._24_4_;
          auVar87._28_4_ = fStack_544;
          auVar29 = vsubps_avx(auVar87,auVar86);
          auVar88._4_4_ = auVar146._4_4_ * auVar28._4_4_;
          auVar88._0_4_ = auVar146._0_4_ * auVar28._0_4_;
          auVar88._8_4_ = auVar146._8_4_ * auVar28._8_4_;
          auVar88._12_4_ = auVar146._12_4_ * auVar28._12_4_;
          auVar88._16_4_ = auVar146._16_4_ * auVar28._16_4_;
          auVar88._20_4_ = auVar146._20_4_ * auVar28._20_4_;
          auVar88._24_4_ = auVar146._24_4_ * auVar28._24_4_;
          auVar88._28_4_ = auVar28._28_4_;
          auVar28 = vsubps_avx(auVar355,auVar146);
          auVar89._4_4_ = auVar141._4_4_ * auVar28._4_4_;
          auVar89._0_4_ = auVar141._0_4_ * auVar28._0_4_;
          auVar89._8_4_ = auVar141._8_4_ * auVar28._8_4_;
          auVar89._12_4_ = auVar141._12_4_ * auVar28._12_4_;
          auVar89._16_4_ = auVar141._16_4_ * auVar28._16_4_;
          auVar89._20_4_ = auVar141._20_4_ * auVar28._20_4_;
          auVar89._24_4_ = auVar141._24_4_ * auVar28._24_4_;
          auVar89._28_4_ = auVar233._28_4_;
          auVar30 = vsubps_avx(auVar89,auVar88);
          auVar90._4_4_ = auVar140._4_4_ * auVar28._4_4_;
          auVar90._0_4_ = auVar140._0_4_ * auVar28._0_4_;
          auVar90._8_4_ = auVar140._8_4_ * auVar28._8_4_;
          auVar90._12_4_ = auVar140._12_4_ * auVar28._12_4_;
          auVar90._16_4_ = auVar140._16_4_ * auVar28._16_4_;
          auVar90._20_4_ = auVar140._20_4_ * auVar28._20_4_;
          auVar90._24_4_ = auVar140._24_4_ * auVar28._24_4_;
          auVar90._28_4_ = auVar233._28_4_;
          auVar91._4_4_ = auVar146._4_4_ * auVar27._4_4_;
          auVar91._0_4_ = auVar146._0_4_ * auVar27._0_4_;
          auVar91._8_4_ = auVar146._8_4_ * auVar27._8_4_;
          auVar91._12_4_ = auVar146._12_4_ * auVar27._12_4_;
          auVar91._16_4_ = auVar146._16_4_ * auVar27._16_4_;
          auVar91._20_4_ = auVar146._20_4_ * auVar27._20_4_;
          auVar91._24_4_ = auVar146._24_4_ * auVar27._24_4_;
          auVar91._28_4_ = auVar27._28_4_;
          auVar233 = vsubps_avx(auVar91,auVar90);
          auVar182._0_4_ = auVar29._0_4_ * 0.0 + auVar233._0_4_ + auVar30._0_4_ * 0.0;
          auVar182._4_4_ = auVar29._4_4_ * 0.0 + auVar233._4_4_ + auVar30._4_4_ * 0.0;
          auVar182._8_4_ = auVar29._8_4_ * 0.0 + auVar233._8_4_ + auVar30._8_4_ * 0.0;
          auVar182._12_4_ = auVar29._12_4_ * 0.0 + auVar233._12_4_ + auVar30._12_4_ * 0.0;
          auVar182._16_4_ = auVar29._16_4_ * 0.0 + auVar233._16_4_ + auVar30._16_4_ * 0.0;
          auVar182._20_4_ = auVar29._20_4_ * 0.0 + auVar233._20_4_ + auVar30._20_4_ * 0.0;
          auVar182._24_4_ = auVar29._24_4_ * 0.0 + auVar233._24_4_ + auVar30._24_4_ * 0.0;
          auVar182._28_4_ = auVar29._28_4_ + auVar233._28_4_ + auVar30._28_4_;
          auVar139 = vcmpps_avx(auVar182,ZEXT832(0) << 0x20,2);
          auVar233 = vblendvps_avx(auVar24,_local_5e0,auVar139);
          auVar24 = vblendvps_avx(auVar25,_local_760,auVar139);
          auVar25 = vblendvps_avx(auVar26,auVar369,auVar139);
          auVar26 = vblendvps_avx(auVar146,auVar355,auVar139);
          auVar27 = vblendvps_avx(auVar140,auVar252,auVar139);
          auVar28 = vblendvps_avx(auVar141,auVar323,auVar139);
          auVar29 = vblendvps_avx(auVar355,auVar146,auVar139);
          auVar30 = vblendvps_avx(auVar252,auVar140,auVar139);
          auVar22 = vblendvps_avx(auVar323,auVar141,auVar139);
          auVar146 = vandps_avx(_local_4e0,auVar231);
          auVar29 = vsubps_avx(auVar29,auVar233);
          auVar175 = vsubps_avx(auVar30,auVar24);
          auVar22 = vsubps_avx(auVar22,auVar25);
          auVar309 = vsubps_avx(auVar24,auVar27);
          fVar194 = auVar175._0_4_;
          fVar169 = auVar25._0_4_;
          fVar270 = auVar175._4_4_;
          fVar187 = auVar25._4_4_;
          auVar92._4_4_ = fVar187 * fVar270;
          auVar92._0_4_ = fVar169 * fVar194;
          fVar287 = auVar175._8_4_;
          fVar305 = auVar25._8_4_;
          auVar92._8_4_ = fVar305 * fVar287;
          fVar313 = auVar175._12_4_;
          fVar190 = auVar25._12_4_;
          auVar92._12_4_ = fVar190 * fVar313;
          fVar327 = auVar175._16_4_;
          fVar239 = auVar25._16_4_;
          auVar92._16_4_ = fVar239 * fVar327;
          fVar168 = auVar175._20_4_;
          fVar254 = auVar25._20_4_;
          auVar92._20_4_ = fVar254 * fVar168;
          fVar153 = auVar175._24_4_;
          fVar256 = auVar25._24_4_;
          auVar92._24_4_ = fVar256 * fVar153;
          auVar92._28_4_ = auVar30._28_4_;
          fVar208 = auVar24._0_4_;
          fVar258 = auVar22._0_4_;
          fVar271 = auVar24._4_4_;
          fVar240 = auVar22._4_4_;
          auVar93._4_4_ = fVar240 * fVar271;
          auVar93._0_4_ = fVar258 * fVar208;
          fVar288 = auVar24._8_4_;
          fVar255 = auVar22._8_4_;
          auVar93._8_4_ = fVar255 * fVar288;
          fVar314 = auVar24._12_4_;
          fVar257 = auVar22._12_4_;
          auVar93._12_4_ = fVar257 * fVar314;
          fVar238 = auVar24._16_4_;
          fVar274 = auVar22._16_4_;
          auVar93._16_4_ = fVar274 * fVar238;
          fVar170 = auVar24._20_4_;
          fVar282 = auVar22._20_4_;
          auVar93._20_4_ = fVar282 * fVar170;
          fVar155 = auVar24._24_4_;
          fVar284 = auVar22._24_4_;
          uVar7 = auVar140._28_4_;
          auVar93._24_4_ = fVar284 * fVar155;
          auVar93._28_4_ = uVar7;
          auVar30 = vsubps_avx(auVar93,auVar92);
          fVar210 = auVar233._0_4_;
          fVar272 = auVar233._4_4_;
          auVar94._4_4_ = fVar240 * fVar272;
          auVar94._0_4_ = fVar258 * fVar210;
          fVar289 = auVar233._8_4_;
          auVar94._8_4_ = fVar255 * fVar289;
          fVar315 = auVar233._12_4_;
          auVar94._12_4_ = fVar257 * fVar315;
          fVar193 = auVar233._16_4_;
          auVar94._16_4_ = fVar274 * fVar193;
          fVar188 = auVar233._20_4_;
          auVar94._20_4_ = fVar282 * fVar188;
          fVar157 = auVar233._24_4_;
          auVar94._24_4_ = fVar284 * fVar157;
          auVar94._28_4_ = uVar7;
          fVar212 = auVar29._0_4_;
          fVar273 = auVar29._4_4_;
          auVar95._4_4_ = fVar187 * fVar273;
          auVar95._0_4_ = fVar169 * fVar212;
          fVar310 = auVar29._8_4_;
          auVar95._8_4_ = fVar305 * fVar310;
          fVar316 = auVar29._12_4_;
          auVar95._12_4_ = fVar190 * fVar316;
          fVar164 = auVar29._16_4_;
          auVar95._16_4_ = fVar239 * fVar164;
          fVar189 = auVar29._20_4_;
          auVar95._20_4_ = fVar254 * fVar189;
          fVar159 = auVar29._24_4_;
          auVar95._24_4_ = fVar256 * fVar159;
          auVar95._28_4_ = auVar355._28_4_;
          auVar140 = vsubps_avx(auVar95,auVar94);
          auVar96._4_4_ = fVar271 * fVar273;
          auVar96._0_4_ = fVar208 * fVar212;
          auVar96._8_4_ = fVar288 * fVar310;
          auVar96._12_4_ = fVar314 * fVar316;
          auVar96._16_4_ = fVar238 * fVar164;
          auVar96._20_4_ = fVar170 * fVar189;
          auVar96._24_4_ = fVar155 * fVar159;
          auVar96._28_4_ = uVar7;
          auVar97._4_4_ = fVar272 * fVar270;
          auVar97._0_4_ = fVar210 * fVar194;
          auVar97._8_4_ = fVar289 * fVar287;
          auVar97._12_4_ = fVar315 * fVar313;
          auVar97._16_4_ = fVar193 * fVar327;
          auVar97._20_4_ = fVar188 * fVar168;
          auVar97._24_4_ = fVar157 * fVar153;
          auVar97._28_4_ = auVar141._28_4_;
          auVar141 = vsubps_avx(auVar97,auVar96);
          auVar25 = vsubps_avx(auVar25,auVar28);
          fVar268 = auVar141._28_4_ + auVar140._28_4_;
          auVar332._0_4_ = auVar141._0_4_ + auVar140._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
          auVar332._4_4_ = auVar141._4_4_ + auVar140._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
          auVar332._8_4_ = auVar141._8_4_ + auVar140._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
          auVar332._12_4_ = auVar141._12_4_ + auVar140._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
          auVar332._16_4_ = auVar141._16_4_ + auVar140._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
          auVar332._20_4_ = auVar141._20_4_ + auVar140._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
          auVar332._24_4_ = auVar141._24_4_ + auVar140._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
          auVar332._28_4_ = fVar268 + auVar30._28_4_;
          fVar267 = auVar309._0_4_;
          fVar281 = auVar309._4_4_;
          auVar98._4_4_ = auVar28._4_4_ * fVar281;
          auVar98._0_4_ = auVar28._0_4_ * fVar267;
          fVar312 = auVar309._8_4_;
          auVar98._8_4_ = auVar28._8_4_ * fVar312;
          fVar237 = auVar309._12_4_;
          auVar98._12_4_ = auVar28._12_4_ * fVar237;
          fVar217 = auVar309._16_4_;
          auVar98._16_4_ = auVar28._16_4_ * fVar217;
          fVar191 = auVar309._20_4_;
          auVar98._20_4_ = auVar28._20_4_ * fVar191;
          fVar161 = auVar309._24_4_;
          auVar98._24_4_ = auVar28._24_4_ * fVar161;
          auVar98._28_4_ = fVar268;
          fVar268 = auVar25._0_4_;
          fVar283 = auVar25._4_4_;
          auVar99._4_4_ = auVar27._4_4_ * fVar283;
          auVar99._0_4_ = auVar27._0_4_ * fVar268;
          fVar236 = auVar25._8_4_;
          auVar99._8_4_ = auVar27._8_4_ * fVar236;
          fVar304 = auVar25._12_4_;
          auVar99._12_4_ = auVar27._12_4_ * fVar304;
          fVar234 = auVar25._16_4_;
          auVar99._16_4_ = auVar27._16_4_ * fVar234;
          fVar192 = auVar25._20_4_;
          auVar99._20_4_ = auVar27._20_4_ * fVar192;
          fVar163 = auVar25._24_4_;
          auVar99._24_4_ = auVar27._24_4_ * fVar163;
          auVar99._28_4_ = auVar141._28_4_;
          auVar140 = vsubps_avx(auVar99,auVar98);
          auVar233 = vsubps_avx(auVar233,auVar26);
          fVar269 = auVar233._0_4_;
          fVar285 = auVar233._4_4_;
          auVar100._4_4_ = auVar28._4_4_ * fVar285;
          auVar100._0_4_ = auVar28._0_4_ * fVar269;
          fVar303 = auVar233._8_4_;
          auVar100._8_4_ = auVar28._8_4_ * fVar303;
          fVar317 = auVar233._12_4_;
          auVar100._12_4_ = auVar28._12_4_ * fVar317;
          fVar235 = auVar233._16_4_;
          auVar100._16_4_ = auVar28._16_4_ * fVar235;
          fVar135 = auVar233._20_4_;
          auVar100._20_4_ = auVar28._20_4_ * fVar135;
          fVar166 = auVar233._24_4_;
          auVar100._24_4_ = auVar28._24_4_ * fVar166;
          auVar100._28_4_ = auVar28._28_4_;
          auVar101._4_4_ = fVar283 * auVar26._4_4_;
          auVar101._0_4_ = fVar268 * auVar26._0_4_;
          auVar101._8_4_ = fVar236 * auVar26._8_4_;
          auVar101._12_4_ = fVar304 * auVar26._12_4_;
          auVar101._16_4_ = fVar234 * auVar26._16_4_;
          auVar101._20_4_ = fVar192 * auVar26._20_4_;
          auVar101._24_4_ = fVar163 * auVar26._24_4_;
          auVar101._28_4_ = auVar30._28_4_;
          auVar233 = vsubps_avx(auVar100,auVar101);
          auVar102._4_4_ = auVar27._4_4_ * fVar285;
          auVar102._0_4_ = auVar27._0_4_ * fVar269;
          auVar102._8_4_ = auVar27._8_4_ * fVar303;
          auVar102._12_4_ = auVar27._12_4_ * fVar317;
          auVar102._16_4_ = auVar27._16_4_ * fVar235;
          auVar102._20_4_ = auVar27._20_4_ * fVar135;
          auVar102._24_4_ = auVar27._24_4_ * fVar166;
          auVar102._28_4_ = auVar27._28_4_;
          auVar103._4_4_ = fVar281 * auVar26._4_4_;
          auVar103._0_4_ = fVar267 * auVar26._0_4_;
          auVar103._8_4_ = fVar312 * auVar26._8_4_;
          auVar103._12_4_ = fVar237 * auVar26._12_4_;
          auVar103._16_4_ = fVar217 * auVar26._16_4_;
          auVar103._20_4_ = fVar191 * auVar26._20_4_;
          auVar103._24_4_ = fVar161 * auVar26._24_4_;
          auVar103._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar103,auVar102);
          auVar150._0_4_ = auVar140._0_4_ * 0.0 + auVar26._0_4_ + auVar233._0_4_ * 0.0;
          auVar150._4_4_ = auVar140._4_4_ * 0.0 + auVar26._4_4_ + auVar233._4_4_ * 0.0;
          auVar150._8_4_ = auVar140._8_4_ * 0.0 + auVar26._8_4_ + auVar233._8_4_ * 0.0;
          auVar150._12_4_ = auVar140._12_4_ * 0.0 + auVar26._12_4_ + auVar233._12_4_ * 0.0;
          auVar150._16_4_ = auVar140._16_4_ * 0.0 + auVar26._16_4_ + auVar233._16_4_ * 0.0;
          auVar150._20_4_ = auVar140._20_4_ * 0.0 + auVar26._20_4_ + auVar233._20_4_ * 0.0;
          auVar150._24_4_ = auVar140._24_4_ * 0.0 + auVar26._24_4_ + auVar233._24_4_ * 0.0;
          auVar150._28_4_ = auVar233._28_4_ + auVar26._28_4_ + auVar233._28_4_;
          auVar233 = vmaxps_avx(auVar332,auVar150);
          auVar233 = vcmpps_avx(auVar233,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar253 = ZEXT3264(auVar146);
          auVar26 = auVar146 & auVar233;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
LAB_0098a69f:
            auVar311 = auVar309._4_12_;
            auVar186 = ZEXT3264(CONCAT824(local_5a0[1]._24_8_,
                                          CONCAT816(local_5a0[1]._16_8_,
                                                    CONCAT88(local_5a0[1]._8_8_,local_5a0[1]._0_8_))
                                         ));
            auVar339._4_4_ = fVar154;
            auVar339._0_4_ = fVar136;
            auVar339._8_4_ = fVar156;
            auVar339._12_4_ = fVar158;
            auVar339._16_4_ = fVar160;
            auVar339._20_4_ = fVar162;
            auVar339._24_4_ = fVar165;
            auVar339._28_4_ = fVar167;
          }
          else {
            auVar26 = vandps_avx(auVar233,auVar146);
            auVar104._4_4_ = fVar283 * fVar270;
            auVar104._0_4_ = fVar268 * fVar194;
            auVar104._8_4_ = fVar236 * fVar287;
            auVar104._12_4_ = fVar304 * fVar313;
            auVar104._16_4_ = fVar234 * fVar327;
            auVar104._20_4_ = fVar192 * fVar168;
            auVar104._24_4_ = fVar163 * fVar153;
            auVar104._28_4_ = auVar146._28_4_;
            auVar105._4_4_ = fVar281 * fVar240;
            auVar105._0_4_ = fVar267 * fVar258;
            auVar105._8_4_ = fVar312 * fVar255;
            auVar105._12_4_ = fVar237 * fVar257;
            auVar105._16_4_ = fVar217 * fVar274;
            auVar105._20_4_ = fVar191 * fVar282;
            auVar105._24_4_ = fVar161 * fVar284;
            auVar105._28_4_ = auVar233._28_4_;
            auVar27 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = fVar285 * fVar240;
            auVar106._0_4_ = fVar269 * fVar258;
            auVar106._8_4_ = fVar303 * fVar255;
            auVar106._12_4_ = fVar317 * fVar257;
            auVar106._16_4_ = fVar235 * fVar274;
            auVar106._20_4_ = fVar135 * fVar282;
            auVar106._24_4_ = fVar166 * fVar284;
            auVar106._28_4_ = auVar22._28_4_;
            auVar107._4_4_ = fVar283 * fVar273;
            auVar107._0_4_ = fVar268 * fVar212;
            auVar107._8_4_ = fVar236 * fVar310;
            auVar107._12_4_ = fVar304 * fVar316;
            auVar107._16_4_ = fVar234 * fVar164;
            auVar107._20_4_ = fVar192 * fVar189;
            auVar107._24_4_ = fVar163 * fVar159;
            auVar107._28_4_ = auVar25._28_4_;
            auVar28 = vsubps_avx(auVar107,auVar106);
            auVar108._4_4_ = fVar281 * fVar273;
            auVar108._0_4_ = fVar267 * fVar212;
            auVar108._8_4_ = fVar312 * fVar310;
            auVar108._12_4_ = fVar237 * fVar316;
            auVar108._16_4_ = fVar217 * fVar164;
            auVar108._20_4_ = fVar191 * fVar189;
            auVar108._24_4_ = fVar161 * fVar159;
            auVar108._28_4_ = auVar29._28_4_;
            auVar109._4_4_ = fVar285 * fVar270;
            auVar109._0_4_ = fVar269 * fVar194;
            auVar109._8_4_ = fVar303 * fVar287;
            auVar109._12_4_ = fVar317 * fVar313;
            auVar109._16_4_ = fVar235 * fVar327;
            auVar109._20_4_ = fVar135 * fVar168;
            auVar109._24_4_ = fVar166 * fVar153;
            auVar109._28_4_ = auVar175._28_4_;
            auVar30 = vsubps_avx(auVar109,auVar108);
            fVar194 = auVar309._28_4_;
            auVar306._0_4_ = auVar27._0_4_ * 0.0 + auVar30._0_4_ + auVar28._0_4_ * 0.0;
            auVar306._4_4_ = auVar27._4_4_ * 0.0 + auVar30._4_4_ + auVar28._4_4_ * 0.0;
            auVar306._8_4_ = auVar27._8_4_ * 0.0 + auVar30._8_4_ + auVar28._8_4_ * 0.0;
            auVar306._12_4_ = auVar27._12_4_ * 0.0 + auVar30._12_4_ + auVar28._12_4_ * 0.0;
            auVar309._16_4_ = auVar27._16_4_ * 0.0 + auVar30._16_4_ + auVar28._16_4_ * 0.0;
            auVar309._0_16_ = auVar306;
            auVar309._20_4_ = auVar27._20_4_ * 0.0 + auVar30._20_4_ + auVar28._20_4_ * 0.0;
            auVar309._24_4_ = auVar27._24_4_ * 0.0 + auVar30._24_4_ + auVar28._24_4_ * 0.0;
            auVar309._28_4_ = fVar194 + auVar30._28_4_ + auVar29._28_4_;
            auVar311 = auVar306._4_12_;
            auVar233 = vrcpps_avx(auVar309);
            fVar194 = auVar233._0_4_;
            fVar212 = auVar233._4_4_;
            auVar110._4_4_ = auVar306._4_4_ * fVar212;
            auVar110._0_4_ = auVar306._0_4_ * fVar194;
            fVar267 = auVar233._8_4_;
            auVar110._8_4_ = auVar306._8_4_ * fVar267;
            fVar268 = auVar233._12_4_;
            auVar110._12_4_ = auVar306._12_4_ * fVar268;
            fVar269 = auVar233._16_4_;
            auVar110._16_4_ = auVar309._16_4_ * fVar269;
            fVar270 = auVar233._20_4_;
            auVar110._20_4_ = auVar309._20_4_ * fVar270;
            fVar273 = auVar233._24_4_;
            auVar110._24_4_ = auVar309._24_4_ * fVar273;
            auVar110._28_4_ = auVar25._28_4_;
            auVar349._8_4_ = 0x3f800000;
            auVar349._0_8_ = 0x3f8000003f800000;
            auVar349._12_4_ = 0x3f800000;
            auVar349._16_4_ = 0x3f800000;
            auVar349._20_4_ = 0x3f800000;
            auVar349._24_4_ = 0x3f800000;
            auVar349._28_4_ = 0x3f800000;
            auVar233 = vsubps_avx(auVar349,auVar110);
            fVar194 = auVar233._0_4_ * fVar194 + fVar194;
            fVar212 = auVar233._4_4_ * fVar212 + fVar212;
            fVar267 = auVar233._8_4_ * fVar267 + fVar267;
            fVar268 = auVar233._12_4_ * fVar268 + fVar268;
            fVar269 = auVar233._16_4_ * fVar269 + fVar269;
            fVar270 = auVar233._20_4_ * fVar270 + fVar270;
            fVar273 = auVar233._24_4_ * fVar273 + fVar273;
            auVar111._4_4_ =
                 (fVar272 * auVar27._4_4_ + auVar28._4_4_ * fVar271 + fVar187 * auVar30._4_4_) *
                 fVar212;
            auVar111._0_4_ =
                 (fVar210 * auVar27._0_4_ + auVar28._0_4_ * fVar208 + fVar169 * auVar30._0_4_) *
                 fVar194;
            auVar111._8_4_ =
                 (fVar289 * auVar27._8_4_ + auVar28._8_4_ * fVar288 + fVar305 * auVar30._8_4_) *
                 fVar267;
            auVar111._12_4_ =
                 (fVar315 * auVar27._12_4_ + auVar28._12_4_ * fVar314 + fVar190 * auVar30._12_4_) *
                 fVar268;
            auVar111._16_4_ =
                 (fVar193 * auVar27._16_4_ + auVar28._16_4_ * fVar238 + fVar239 * auVar30._16_4_) *
                 fVar269;
            auVar111._20_4_ =
                 (fVar188 * auVar27._20_4_ + auVar28._20_4_ * fVar170 + fVar254 * auVar30._20_4_) *
                 fVar270;
            auVar111._24_4_ =
                 (fVar157 * auVar27._24_4_ + auVar28._24_4_ * fVar155 + fVar256 * auVar30._24_4_) *
                 fVar273;
            auVar111._28_4_ = auVar24._28_4_ + auVar30._28_4_;
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar232._4_4_ = uVar7;
            auVar232._0_4_ = uVar7;
            auVar232._8_4_ = uVar7;
            auVar232._12_4_ = uVar7;
            auVar232._16_4_ = uVar7;
            auVar232._20_4_ = uVar7;
            auVar232._24_4_ = uVar7;
            auVar232._28_4_ = uVar7;
            auVar24 = vcmpps_avx(_local_360,auVar111,2);
            auVar253 = ZEXT3264(auVar24);
            auVar233 = vcmpps_avx(auVar111,auVar232,2);
            auVar233 = vandps_avx(auVar24,auVar233);
            auVar25 = auVar26 & auVar233;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0x7f,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0xbf,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar25[0x1f]) goto LAB_0098a69f;
            auVar233 = vandps_avx(auVar26,auVar233);
            auVar25 = vcmpps_avx(auVar309,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar26 = auVar233 & auVar25;
            auVar186 = ZEXT3264(CONCAT824(local_5a0[1]._24_8_,
                                          CONCAT816(local_5a0[1]._16_8_,
                                                    CONCAT88(local_5a0[1]._8_8_,local_5a0[1]._0_8_))
                                         ));
            auVar339._4_4_ = fVar154;
            auVar339._0_4_ = fVar136;
            auVar339._8_4_ = fVar156;
            auVar339._12_4_ = fVar158;
            auVar339._16_4_ = fVar160;
            auVar339._20_4_ = fVar162;
            auVar339._24_4_ = fVar165;
            auVar339._28_4_ = fVar167;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar233 = vandps_avx(auVar25,auVar233);
              auVar186 = ZEXT3264(auVar233);
              auVar112._4_4_ = auVar332._4_4_ * fVar212;
              auVar112._0_4_ = auVar332._0_4_ * fVar194;
              auVar112._8_4_ = auVar332._8_4_ * fVar267;
              auVar112._12_4_ = auVar332._12_4_ * fVar268;
              auVar112._16_4_ = auVar332._16_4_ * fVar269;
              auVar112._20_4_ = auVar332._20_4_ * fVar270;
              auVar112._24_4_ = auVar332._24_4_ * fVar273;
              auVar112._28_4_ = auVar24._28_4_;
              auVar253 = ZEXT3264(auVar112);
              auVar113._4_4_ = auVar150._4_4_ * fVar212;
              auVar113._0_4_ = auVar150._0_4_ * fVar194;
              auVar113._8_4_ = auVar150._8_4_ * fVar267;
              auVar113._12_4_ = auVar150._12_4_ * fVar268;
              auVar113._16_4_ = auVar150._16_4_ * fVar269;
              auVar113._20_4_ = auVar150._20_4_ * fVar270;
              auVar113._24_4_ = auVar150._24_4_ * fVar273;
              auVar113._28_4_ = auVar150._28_4_;
              auVar280._8_4_ = 0x3f800000;
              auVar280._0_8_ = 0x3f8000003f800000;
              auVar280._12_4_ = 0x3f800000;
              auVar280._16_4_ = 0x3f800000;
              auVar280._20_4_ = 0x3f800000;
              auVar280._24_4_ = 0x3f800000;
              auVar280._28_4_ = 0x3f800000;
              auVar233 = vsubps_avx(auVar280,auVar112);
              local_540 = vblendvps_avx(auVar233,auVar112,auVar139);
              auVar233 = vsubps_avx(auVar280,auVar113);
              _local_3a0 = vblendvps_avx(auVar233,auVar113,auVar139);
              local_500 = auVar111;
            }
          }
          auVar333 = ZEXT3264(local_800);
          auVar350 = ZEXT3264(_local_820);
          auVar233 = auVar186._0_32_;
          local_4a0 = auVar23;
          if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar233 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar233 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar233 >> 0x7f,0) == '\0') &&
                (auVar186 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar233 >> 0xbf,0) == '\0') &&
              (auVar186 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar186[0x1f]) {
            auVar186 = ZEXT3264(local_540);
            goto LAB_0098a367;
          }
          auVar23 = vsubps_avx(local_780,auVar339);
          auVar253 = ZEXT3264(local_540);
          fVar208 = auVar339._0_4_ + auVar23._0_4_ * local_540._0_4_;
          fVar210 = auVar339._4_4_ + auVar23._4_4_ * local_540._4_4_;
          fVar212 = auVar339._8_4_ + auVar23._8_4_ * local_540._8_4_;
          fVar267 = auVar339._12_4_ + auVar23._12_4_ * local_540._12_4_;
          fVar268 = auVar339._16_4_ + auVar23._16_4_ * local_540._16_4_;
          fVar269 = auVar339._20_4_ + auVar23._20_4_ * local_540._20_4_;
          fVar270 = auVar339._24_4_ + auVar23._24_4_ * local_540._24_4_;
          fVar271 = auVar339._28_4_ + auVar23._28_4_;
          fVar194 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar114._4_4_ = (fVar210 + fVar210) * fVar194;
          auVar114._0_4_ = (fVar208 + fVar208) * fVar194;
          auVar114._8_4_ = (fVar212 + fVar212) * fVar194;
          auVar114._12_4_ = (fVar267 + fVar267) * fVar194;
          auVar114._16_4_ = (fVar268 + fVar268) * fVar194;
          auVar114._20_4_ = (fVar269 + fVar269) * fVar194;
          auVar114._24_4_ = (fVar270 + fVar270) * fVar194;
          auVar114._28_4_ = fVar271 + fVar271;
          auVar23 = vcmpps_avx(local_500,auVar114,6);
          auVar24 = auVar233 & auVar23;
          auVar299 = ZEXT3264(_local_620);
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0x7f,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0xbf,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar24[0x1f]) {
            auVar186 = ZEXT3264(local_540);
            goto LAB_0098a367;
          }
          local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
          local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
          uStack_398._0_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
          uStack_398._4_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
          uStack_390._0_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
          uStack_390._4_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
          uStack_388._0_4_ = (float)uStack_388 + (float)uStack_388 + -1.0;
          uStack_388._4_4_ = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
          local_280 = local_540;
          auVar124 = _local_3a0;
          auVar24 = _local_3a0;
          local_260 = (float)local_3a0._0_4_;
          fStack_25c = (float)local_3a0._4_4_;
          fStack_258 = (float)uStack_398;
          fStack_254 = uStack_398._4_4_;
          fStack_250 = (float)uStack_390;
          fStack_24c = uStack_390._4_4_;
          fStack_248 = (float)uStack_388;
          fStack_244 = uStack_388._4_4_;
          local_240 = local_500;
          local_21c = local_6c0._0_4_;
          local_210 = local_8d0;
          fStack_20c = fStack_8cc;
          fStack_208 = fStack_8c8;
          fStack_204 = fStack_8c4;
          local_200 = local_7c0;
          uStack_1f8 = uStack_7b8;
          local_1f0 = local_7d0;
          uStack_1e8 = uStack_7c8;
          local_1e0 = local_7e0;
          uStack_1d8 = uStack_7d8;
          pGVar20 = (context->scene->geometries).items[uVar17].ptr;
          if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_5a0[0] = vandps_avx(auVar23,auVar233);
            auVar199._0_4_ = (float)(int)local_220;
            auVar199._4_12_ = auVar311;
            auVar222 = vshufps_avx(auVar199,auVar199,0);
            local_1a0[0] = (auVar222._0_4_ + local_540._0_4_ + 0.0) * (float)local_100._0_4_;
            local_1a0[1] = (auVar222._4_4_ + local_540._4_4_ + 1.0) * (float)local_100._4_4_;
            local_1a0[2] = (auVar222._8_4_ + local_540._8_4_ + 2.0) * fStack_f8;
            local_1a0[3] = (auVar222._12_4_ + local_540._12_4_ + 3.0) * fStack_f4;
            fStack_190 = (auVar222._0_4_ + local_540._16_4_ + 4.0) * fStack_f0;
            fStack_18c = (auVar222._4_4_ + local_540._20_4_ + 5.0) * fStack_ec;
            fStack_188 = (auVar222._8_4_ + local_540._24_4_ + 6.0) * fStack_e8;
            fStack_184 = auVar222._12_4_ + local_540._28_4_ + 7.0;
            uStack_390 = auVar124._16_8_;
            uStack_388 = auVar24._24_8_;
            local_180 = local_3a0;
            uStack_178 = uStack_398;
            uStack_170 = uStack_390;
            uStack_168 = uStack_388;
            local_160 = local_500;
            auVar183._8_4_ = 0x7f800000;
            auVar183._0_8_ = 0x7f8000007f800000;
            auVar183._12_4_ = 0x7f800000;
            auVar183._16_4_ = 0x7f800000;
            auVar183._20_4_ = 0x7f800000;
            auVar183._24_4_ = 0x7f800000;
            auVar183._28_4_ = 0x7f800000;
            auVar233 = vblendvps_avx(auVar183,local_500,local_5a0[0]);
            auVar23 = vshufps_avx(auVar233,auVar233,0xb1);
            auVar23 = vminps_avx(auVar233,auVar23);
            auVar25 = vshufpd_avx(auVar23,auVar23,5);
            auVar23 = vminps_avx(auVar23,auVar25);
            auVar25 = vperm2f128_avx(auVar23,auVar23,1);
            auVar23 = vminps_avx(auVar23,auVar25);
            auVar23 = vcmpps_avx(auVar233,auVar23,0);
            auVar25 = local_5a0[0] & auVar23;
            auVar233 = local_5a0[0];
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar233 = vandps_avx(auVar23,local_5a0[0]);
            }
            local_640._0_8_ = lVar132;
            uVar127 = vmovmskps_avx(auVar233);
            uVar126 = 0;
            if (uVar127 != 0) {
              for (; (uVar127 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
              }
            }
            uVar130 = (ulong)uVar126;
            _local_3a0 = auVar24;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar194 = local_1a0[uVar130];
              uVar7 = *(undefined4 *)((long)&local_180 + uVar130 * 4);
              fVar210 = 1.0 - fVar194;
              fVar208 = fVar194 * fVar210 + fVar194 * fVar210;
              auVar222 = ZEXT416((uint)(fVar194 * fVar194 * 3.0));
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              auVar200 = ZEXT416((uint)((fVar208 - fVar194 * fVar194) * 3.0));
              auVar200 = vshufps_avx(auVar200,auVar200,0);
              auVar221 = ZEXT416((uint)((fVar210 * fVar210 - fVar208) * 3.0));
              auVar221 = vshufps_avx(auVar221,auVar221,0);
              fVar208 = auVar221._0_4_ * (float)local_7c0._0_4_;
              fVar212 = auVar221._4_4_ * (float)local_7c0._4_4_;
              fVar267 = auVar221._8_4_ * (float)uStack_7b8;
              fVar268 = auVar221._12_4_ * uStack_7b8._4_4_;
              auVar253 = ZEXT1664(CONCAT412(fVar268,CONCAT48(fVar267,CONCAT44(fVar212,fVar208))));
              auVar221 = ZEXT416((uint)(fVar210 * fVar210 * -3.0));
              auVar221 = vshufps_avx(auVar221,auVar221,0);
              auVar201._0_4_ =
                   local_8d0 * auVar221._0_4_ +
                   fVar208 + auVar222._0_4_ * (float)local_7e0._0_4_ +
                             auVar200._0_4_ * (float)local_7d0._0_4_;
              auVar201._4_4_ =
                   fStack_8cc * auVar221._4_4_ +
                   fVar212 + auVar222._4_4_ * (float)local_7e0._4_4_ +
                             auVar200._4_4_ * (float)local_7d0._4_4_;
              auVar201._8_4_ =
                   fStack_8c8 * auVar221._8_4_ +
                   fVar267 + auVar222._8_4_ * (float)uStack_7d8 + auVar200._8_4_ * (float)uStack_7c8
              ;
              auVar201._12_4_ =
                   fStack_8c4 * auVar221._12_4_ +
                   fVar268 + auVar222._12_4_ * uStack_7d8._4_4_ + auVar200._12_4_ * uStack_7c8._4_4_
              ;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar130 * 4);
              *(float *)(ray + k * 4 + 0xc0) = auVar201._0_4_;
              uVar19 = vextractps_avx(auVar201,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar19;
              uVar19 = vextractps_avx(auVar201,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
              *(float *)(ray + k * 4 + 0xf0) = fVar194;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
              *(uint *)(ray + k * 4 + 0x110) = uVar125;
              *(uint *)(ray + k * 4 + 0x120) = uVar17;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              stack0xfffffffffffff988 = auVar279._8_24_;
              stack0xfffffffffffff928 = auVar338._8_24_;
              local_780._0_16_ = *local_6f8;
              _auStack_870 = auVar146._16_16_;
              _local_880 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              _local_480 = *pauVar4;
              while( true ) {
                local_400 = local_1a0[uVar130];
                local_3f0 = *(undefined4 *)((long)&local_180 + uVar130 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar130 * 4);
                fVar208 = 1.0 - local_400;
                fVar194 = local_400 * fVar208 + local_400 * fVar208;
                auVar222 = ZEXT416((uint)(local_400 * local_400 * 3.0));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar200 = ZEXT416((uint)((fVar194 - local_400 * local_400) * 3.0));
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar245._0_4_ =
                     auVar222._0_4_ * (float)local_7e0._0_4_ +
                     auVar200._0_4_ * (float)local_7d0._0_4_;
                auVar245._4_4_ =
                     auVar222._4_4_ * (float)local_7e0._4_4_ +
                     auVar200._4_4_ * (float)local_7d0._4_4_;
                auVar245._8_4_ =
                     auVar222._8_4_ * (float)uStack_7d8 + auVar200._8_4_ * (float)uStack_7c8;
                auVar245._12_4_ =
                     auVar222._12_4_ * uStack_7d8._4_4_ + auVar200._12_4_ * uStack_7c8._4_4_;
                auVar253 = ZEXT1664(auVar245);
                auVar222 = ZEXT416((uint)((fVar208 * fVar208 - fVar194) * 3.0));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                local_7b0.context = context->user;
                auVar200 = ZEXT416((uint)(fVar208 * fVar208 * -3.0));
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar202._0_4_ =
                     local_8d0 * auVar200._0_4_ +
                     auVar222._0_4_ * (float)local_7c0._0_4_ + auVar245._0_4_;
                auVar202._4_4_ =
                     fStack_8cc * auVar200._4_4_ +
                     auVar222._4_4_ * (float)local_7c0._4_4_ + auVar245._4_4_;
                auVar202._8_4_ =
                     fStack_8c8 * auVar200._8_4_ +
                     auVar222._8_4_ * (float)uStack_7b8 + auVar245._8_4_;
                auVar202._12_4_ =
                     fStack_8c4 * auVar200._12_4_ +
                     auVar222._12_4_ * uStack_7b8._4_4_ + auVar245._12_4_;
                auVar222 = vshufps_avx(auVar202,auVar202,0);
                local_430[0] = (RTCHitN)auVar222[0];
                local_430[1] = (RTCHitN)auVar222[1];
                local_430[2] = (RTCHitN)auVar222[2];
                local_430[3] = (RTCHitN)auVar222[3];
                local_430[4] = (RTCHitN)auVar222[4];
                local_430[5] = (RTCHitN)auVar222[5];
                local_430[6] = (RTCHitN)auVar222[6];
                local_430[7] = (RTCHitN)auVar222[7];
                local_430[8] = (RTCHitN)auVar222[8];
                local_430[9] = (RTCHitN)auVar222[9];
                local_430[10] = (RTCHitN)auVar222[10];
                local_430[0xb] = (RTCHitN)auVar222[0xb];
                local_430[0xc] = (RTCHitN)auVar222[0xc];
                local_430[0xd] = (RTCHitN)auVar222[0xd];
                local_430[0xe] = (RTCHitN)auVar222[0xe];
                local_430[0xf] = (RTCHitN)auVar222[0xf];
                auVar222 = vshufps_avx(auVar202,auVar202,0x55);
                local_420 = auVar222;
                local_410 = vshufps_avx(auVar202,auVar202,0xaa);
                fStack_3fc = local_400;
                fStack_3f8 = local_400;
                fStack_3f4 = local_400;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                local_3e0 = local_2a0._0_8_;
                uStack_3d8 = local_2a0._8_8_;
                local_3d0 = local_290;
                vcmpps_avx(ZEXT1632(local_290),ZEXT1632(local_290),0xf);
                uStack_3bc = (local_7b0.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_7b0.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_830 = local_780._0_16_;
                local_7b0.valid = (int *)local_830;
                local_7b0.geometryUserPtr = pGVar20->userPtr;
                local_7b0.hit = local_430;
                local_7b0.N = 4;
                local_7b0.ray = (RTCRayN *)ray;
                if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar253 = ZEXT1664(auVar245);
                  (*pGVar20->intersectionFilterN)(&local_7b0);
                }
                if (local_830 == (undefined1  [16])0x0) {
                  auVar222 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar222 = auVar222 ^ _DAT_01f46b70;
                }
                else {
                  p_Var21 = context->args->filter;
                  if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar253 = ZEXT1664(auVar253._0_16_);
                    (*p_Var21)(&local_7b0);
                  }
                  auVar200 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                  auVar221 = vpcmpeqd_avx(auVar222,auVar222);
                  auVar222 = auVar200 ^ auVar221;
                  if (local_830 != (undefined1  [16])0x0) {
                    auVar200 = auVar200 ^ auVar221;
                    auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])local_7b0.hit);
                    *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar221;
                    auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar221;
                    auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar221;
                    auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar221;
                    auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar221;
                    auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar221;
                    auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar221;
                    auVar221 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar221;
                    auVar200 = vmaskmovps_avx(auVar200,*(undefined1 (*) [16])(local_7b0.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar200;
                  }
                }
                auVar146 = local_500;
                auVar173._8_8_ = 0x100000001;
                auVar173._0_8_ = 0x100000001;
                if ((auVar173 & auVar222) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = local_880._0_4_;
                  auVar222 = _local_880;
                }
                else {
                  auVar222 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_5a0[0] + uVar130 * 4) = 0;
                _local_880 = auVar222;
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar151._16_16_ = auVar222;
                auVar151._0_16_ = auVar222;
                auVar23 = vcmpps_avx(auVar146,auVar151,2);
                auVar233 = vandps_avx(auVar23,local_5a0[0]);
                local_5a0[0] = local_5a0[0] & auVar23;
                if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                      (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                    (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_5a0[0][0x1f]) break;
                auVar184._8_4_ = 0x7f800000;
                auVar184._0_8_ = 0x7f8000007f800000;
                auVar184._12_4_ = 0x7f800000;
                auVar184._16_4_ = 0x7f800000;
                auVar184._20_4_ = 0x7f800000;
                auVar184._24_4_ = 0x7f800000;
                auVar184._28_4_ = 0x7f800000;
                auVar146 = vblendvps_avx(auVar184,auVar146,auVar233);
                auVar23 = vshufps_avx(auVar146,auVar146,0xb1);
                auVar23 = vminps_avx(auVar146,auVar23);
                auVar24 = vshufpd_avx(auVar23,auVar23,5);
                auVar23 = vminps_avx(auVar23,auVar24);
                auVar24 = vperm2f128_avx(auVar23,auVar23,1);
                auVar23 = vminps_avx(auVar23,auVar24);
                auVar23 = vcmpps_avx(auVar146,auVar23,0);
                auVar24 = auVar233 & auVar23;
                auVar146 = auVar233;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0x7f,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0xbf,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar24[0x1f] < '\0') {
                  auVar146 = vandps_avx(auVar23,auVar233);
                }
                uVar127 = vmovmskps_avx(auVar146);
                uVar126 = 0;
                if (uVar127 != 0) {
                  for (; (uVar127 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                  }
                }
                uVar130 = (ulong)uVar126;
                local_5a0[0] = auVar233;
              }
              auVar333 = ZEXT3264(local_800);
              auVar299 = ZEXT3264(_local_620);
              auVar350 = ZEXT3264(_local_820);
              fVar367 = (float)local_740._0_4_;
              fVar370 = (float)local_740._4_4_;
              fVar371 = fStack_738;
              fVar372 = fStack_734;
              fVar214 = fStack_730;
              fVar215 = fStack_72c;
              fVar216 = fStack_728;
              fVar260 = fStack_724;
            }
            lVar132 = local_640._0_8_;
          }
          auVar186 = ZEXT3264(local_540);
          fVar188 = (float)local_720._0_4_;
          fVar189 = (float)local_720._4_4_;
          fVar191 = fStack_718;
          fVar192 = fStack_714;
          fVar194 = fStack_710;
          fVar208 = fStack_70c;
          fVar210 = fStack_708;
          fVar212 = fStack_704;
        }
        auVar324 = ZEXT3264(_local_660);
      }
    }
    uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar147._4_4_ = uVar7;
    auVar147._0_4_ = uVar7;
    auVar147._8_4_ = uVar7;
    auVar147._12_4_ = uVar7;
    auVar147._16_4_ = uVar7;
    auVar147._20_4_ = uVar7;
    auVar147._24_4_ = uVar7;
    auVar147._28_4_ = uVar7;
    auVar146 = vcmpps_avx(local_80,auVar147,2);
    uVar125 = vmovmskps_avx(auVar146);
    uVar125 = (uint)uVar131 & uVar125;
    pPVar133 = (Primitive *)local_6e0._0_8_;
    pLVar134 = (LinearSpace3fa *)local_680._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }